

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O2

void testBox(void)

{
  double *pdVar1;
  int *piVar2;
  undefined8 *puVar3;
  float *pfVar4;
  ulong *puVar5;
  undefined4 *puVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  double dVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ushort uVar16;
  undefined6 uVar17;
  undefined2 uVar18;
  undefined4 uVar19;
  undefined6 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  char cVar34;
  char cVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  float fVar48;
  bool bVar49;
  uint i;
  int iVar50;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  undefined4 extraout_EAX_06;
  undefined4 extraout_EAX_07;
  undefined4 extraout_EAX_08;
  ostream *poVar51;
  long lVar52;
  short sVar53;
  uint i_1;
  uint uVar54;
  ulong uVar55;
  unsigned_long uVar56;
  long lVar57;
  char *pcVar58;
  short sVar59;
  Vec2<short> VVar60;
  float fVar61;
  unsigned_long uVar62;
  long lVar63;
  uint i_8;
  long lVar64;
  int iVar65;
  int iVar66;
  uint uVar67;
  double *pdVar68;
  ulong *puVar69;
  long *plVar70;
  uint uVar71;
  char *__assertion;
  ulong in_R8;
  ulong uVar73;
  uint uVar74;
  ulong uVar75;
  uint k_10;
  uint k_14;
  long lVar76;
  long lVar77;
  short sVar78;
  short sVar79;
  uint k_30;
  long lVar80;
  short sVar81;
  short sVar82;
  uint j;
  int iVar83;
  int iVar84;
  int iVar85;
  long lVar86;
  long lVar87;
  int iVar88;
  int iVar89;
  float fVar90;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  Vec2<short> VVar91;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  double dVar119;
  short sVar148;
  short sVar149;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  ushort uVar150;
  undefined1 auVar128 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  double dVar120;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar151;
  double dVar152;
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  double dVar167;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  Vec3<float> p;
  char acStack_1ac [4];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198 [4];
  undefined1 local_188 [12];
  undefined4 uStack_17c;
  Vec2<short> min;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  Rand32 rand_2;
  short sStack_130;
  short sStack_12e;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  Vec2<short> max;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Rand32 rand_8;
  undefined1 local_88 [16];
  Rand32 rand_23;
  undefined1 local_68 [16];
  Vec3<float> p1;
  Vec3<float> *pVVar72;
  float fVar118;
  undefined1 auVar132 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar154 [16];
  undefined1 auVar159 [16];
  undefined1 auVar171 [16];
  
  pVVar72 = &p;
  poVar51 = std::operator<<((ostream *)&std::cout,"Testing box methods");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V2s");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V2i");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V2i64");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V2f");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V2d");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V3s");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V3i");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V3i64");
  std::endl<char,std::char_traits<char>>(poVar51);
  poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar51 = std::operator<<(poVar51,"V3f");
  std::endl<char,std::char_traits<char>>(poVar51);
  for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
    (&p.x)[lVar52] = (float)(int)lVar52;
  }
  if (((NAN((float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))))) ||
      (NAN((float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))))) ||
     (NAN((float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))) {
    pcVar58 = 
    "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec3<float>]";
LAB_00114658:
    __assertion = "b.min == p && b.max == p";
    uVar54 = 100;
  }
  else {
    iVar50 = 0x1d;
    for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
      (&p.x)[lVar52] = (float)(int)lVar52;
      (&min)[lVar52] = (Vec2<short>)(float)iVar50;
      iVar50 = iVar50 + -1;
    }
    fVar90 = (float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)));
    auVar93._4_4_ = -(uint)NAN(fVar90);
    auVar93._0_4_ =
         -(uint)NAN((float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))));
    auVar93._8_4_ =
         -(uint)NAN((float)(CONCAT17(p.z._3_1_,
                                     CONCAT16(p.z._2_1_,
                                              CONCAT15(p.z._1_1_,CONCAT14(p.z._0_1_,fVar90)))) >>
                           0x20));
    auVar93._12_4_ = -(uint)NAN((float)CONCAT22(min.y,min.x));
    iVar50 = movmskps(iVar50,auVar93);
    if (((iVar50 != 0) || (NAN((float)CONCAT22(sStack_172,sStack_174)))) ||
       (NAN((float)CONCAT22(sStack_16e,sStack_170)))) {
      pcVar58 = 
      "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec3<float>]";
    }
    else {
      poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
      poVar51 = std::operator<<(poVar51,"V3d");
      std::endl<char,std::char_traits<char>>(poVar51);
      for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
        *(double *)(&p.x + lVar52 * 2) = (double)(int)lVar52;
      }
      if (((NAN((double)CONCAT17(p.y._3_1_,
                                 CONCAT16(p.y._2_1_,
                                          CONCAT15(p.y._1_1_,
                                                   CONCAT14(p.y._0_1_,
                                                            CONCAT13(p.x._3_1_,
                                                                     CONCAT12(p.x._2_1_,
                                                                              CONCAT11(p.x._1_1_,
                                                                                       p.x._0_1_))))
                                                  ))))) ||
          (NAN((double)CONCAT17(acStack_1ac[3],
                                CONCAT16(acStack_1ac[2],
                                         CONCAT15(acStack_1ac[1],
                                                  CONCAT14(acStack_1ac[0],
                                                           CONCAT13(p.z._3_1_,
                                                                    CONCAT12(p.z._2_1_,
                                                                             CONCAT11(p.z._1_1_,
                                                                                      p.z._0_1_)))))
                                        ))))) ||
         (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)))) {
        pcVar58 = 
        "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec3<double>]";
        goto LAB_00114658;
      }
      iVar50 = 0x1d;
      for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
        *(double *)(&p.x + lVar52 * 2) = (double)(int)lVar52;
        *(double *)(&min + lVar52 * 2) = (double)iVar50;
        iVar50 = iVar50 + -1;
      }
      auVar169._4_4_ =
           -(uint)NAN((double)CONCAT17(acStack_1ac[3],
                                       CONCAT16(acStack_1ac[2],
                                                CONCAT15(acStack_1ac[1],
                                                         CONCAT14(acStack_1ac[0],
                                                                  CONCAT13(p.z._3_1_,
                                                                           CONCAT12(p.z._2_1_,
                                                                                    CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))));
      auVar169._0_4_ =
           -(uint)NAN((double)CONCAT17(p.y._3_1_,
                                       CONCAT16(p.y._2_1_,
                                                CONCAT15(p.y._1_1_,
                                                         CONCAT14(p.y._0_1_,
                                                                  CONCAT13(p.x._3_1_,
                                                                           CONCAT12(p.x._2_1_,
                                                                                    CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_))))))));
      auVar169._8_4_ = -(uint)NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8));
      auVar169._12_4_ =
           -(uint)NAN((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))));
      iVar50 = movmskps(iVar50,auVar169);
      if (((iVar50 != 0) ||
          (NAN((double)CONCAT26(sStack_16a,CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))))
         || (NAN((double)CONCAT44(fStack_164,local_168)))) {
        pcVar58 = 
        "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec3<double>]";
      }
      else {
        poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
        poVar51 = std::operator<<(poVar51,"V4s");
        std::endl<char,std::char_traits<char>>(poVar51);
        poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
        poVar51 = std::operator<<(poVar51,"V4i");
        std::endl<char,std::char_traits<char>>(poVar51);
        poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
        poVar51 = std::operator<<(poVar51,"V4i64");
        std::endl<char,std::char_traits<char>>(poVar51);
        poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
        poVar51 = std::operator<<(poVar51,"V4f");
        std::endl<char,std::char_traits<char>>(poVar51);
        for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
          (&p.x)[lVar52] = (float)(int)lVar52;
        }
        auVar96._4_4_ =
             -(uint)NAN((float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))
                       );
        auVar96._0_4_ =
             -(uint)NAN((float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))
                       );
        auVar96._8_4_ =
             -(uint)NAN((float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                       );
        auVar96._12_4_ =
             -(uint)NAN((float)CONCAT13(acStack_1ac[3],
                                        CONCAT12(acStack_1ac[2],
                                                 CONCAT11(acStack_1ac[1],acStack_1ac[0]))));
        iVar50 = movmskps((int)lVar52,auVar96);
        if (iVar50 != 0) {
          pcVar58 = 
          "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec4<float>]";
          goto LAB_00114658;
        }
        iVar50 = 0x27;
        for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
          (&p.x)[lVar52] = (float)(int)lVar52;
          (&min)[lVar52] = (Vec2<short>)(float)iVar50;
          iVar50 = iVar50 + -1;
        }
        auVar121._4_4_ = -(uint)NAN((float)CONCAT22(sStack_172,sStack_174));
        auVar121._0_4_ = -(uint)NAN((float)CONCAT22(min.y,min.x));
        auVar121._8_4_ = -(uint)NAN((float)CONCAT22(sStack_16e,sStack_170));
        auVar121._12_4_ = -(uint)NAN((float)CONCAT22(sStack_16a,sStack_16c));
        auVar92._4_4_ =
             -(uint)NAN((float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))
                       );
        auVar92._0_4_ =
             -(uint)NAN((float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))
                       );
        auVar92._8_4_ =
             -(uint)NAN((float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                       );
        auVar92._12_4_ =
             -(uint)NAN((float)CONCAT13(acStack_1ac[3],
                                        CONCAT12(acStack_1ac[2],
                                                 CONCAT11(acStack_1ac[1],acStack_1ac[0]))));
        auVar93 = packssdw(auVar92,auVar121);
        if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar93 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar93 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar93 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar93 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar93 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar93 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar93 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar93 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar93 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar93 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar93[0xf]
           ) {
          poVar51 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
          poVar51 = std::operator<<(poVar51,"V4d");
          std::endl<char,std::char_traits<char>>(poVar51);
          for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
            *(double *)(&p.x + lVar52 * 2) = (double)(int)lVar52;
          }
          auVar122._4_4_ =
               -(uint)NAN((double)CONCAT17(acStack_1ac[3],
                                           CONCAT16(acStack_1ac[2],
                                                    CONCAT15(acStack_1ac[1],
                                                             CONCAT14(acStack_1ac[0],
                                                                      CONCAT13(p.z._3_1_,
                                                                               CONCAT12(p.z._2_1_,
                                                                                        CONCAT11(p.z
                                                  ._1_1_,p.z._0_1_))))))));
          auVar122._0_4_ =
               -(uint)NAN((double)CONCAT17(p.y._3_1_,
                                           CONCAT16(p.y._2_1_,
                                                    CONCAT15(p.y._1_1_,
                                                             CONCAT14(p.y._0_1_,
                                                                      CONCAT13(p.x._3_1_,
                                                                               CONCAT12(p.x._2_1_,
                                                                                        CONCAT11(p.x
                                                  ._1_1_,p.x._0_1_))))))));
          auVar122._8_4_ = -(uint)NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8));
          auVar122._12_4_ = -(uint)NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0));
          iVar50 = movmskps((int)lVar52,auVar122);
          if (iVar50 != 0) {
            pcVar58 = 
            "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec4<double>]"
            ;
            goto LAB_00114658;
          }
          iVar50 = 0x27;
          for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
            *(double *)(&p.x + lVar52 * 2) = (double)(int)lVar52;
            *(double *)(&min + lVar52 * 2) = (double)iVar50;
            iVar50 = iVar50 + -1;
          }
          auVar123._8_8_ = -(ulong)NAN((double)CONCAT44(fStack_15c,fStack_160));
          auVar123._0_8_ = -(ulong)NAN((double)CONCAT44(fStack_164,local_168));
          auVar168._8_8_ =
               -(ulong)NAN((double)CONCAT26(sStack_16a,
                                            CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))));
          auVar168._0_8_ =
               -(ulong)NAN((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))));
          auVar169 = packssdw(auVar168,auVar123);
          auVar94._8_8_ = -(ulong)NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0));
          auVar94._0_8_ = -(ulong)NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8));
          auVar153._8_8_ =
               -(ulong)NAN((double)CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))));
          auVar153._0_8_ =
               -(ulong)NAN((double)CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_))))))));
          auVar93 = packssdw(auVar153,auVar94);
          auVar93 = packssdw(auVar93,auVar169);
          if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar93 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar93 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar93 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar93 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar93 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar93 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar93 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar93 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar93 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar93 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar93[0xf]) {
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V2s");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V2i");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V2i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V2f");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V2d");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V3s");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V3i");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V3i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V3f");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V3d");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V4s");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V4i");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V4i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V4f");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeEmpty() for type ");
            poVar51 = std::operator<<(poVar51,"V4d");
            std::endl<char,std::char_traits<char>>(poVar51);
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V2s");
            std::endl<char,std::char_traits<char>>(poVar51);
            uVar55 = 0x7fff7fff80008000;
            for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
              p.y._0_1_ = -1;
              p.y._1_1_ = 0x7f;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              *(undefined2 *)((long)&p.y + lVar52 * 2) = 0;
              if ((CONCAT11(p.y._1_1_,p.y._0_1_) == 0x7fff) &&
                 (CONCAT11(p.y._3_1_,p.y._2_1_) == 0x7fff)) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0x80;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0x7f;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              *(undefined2 *)((long)&p.x + lVar52 * 2) = 0;
              if (CONCAT17(0x7f,CONCAT16(0xff,CONCAT15(0x7f,CONCAT14(0xff,CONCAT13(p.x._3_1_,
                                                                                   CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))))))) ==
                  0x7fff7fff80008000) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<short>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V2i");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              (&p.z)[lVar52] = 0.0;
              if ((CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))) ==
                   0x7fffffff) &&
                 (CONCAT13(acStack_1ac[3],
                           CONCAT12(acStack_1ac[2],CONCAT11(acStack_1ac[1],acStack_1ac[0]))) ==
                  0x7fffffff)) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<int>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              (&p.x)[lVar52] = 0.0;
              auVar124._0_4_ =
                   -(uint)(CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))) ==
                          -0x80000000);
              auVar124._4_4_ =
                   -(uint)(CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))) ==
                          -0x80000000);
              auVar124._8_4_ = 0xffffffff;
              auVar124._12_4_ = 0xffffffff;
              uVar54 = movmskps((int)uVar55,auVar124);
              uVar55 = (ulong)(uVar54 ^ 0xf);
              if ((uVar54 ^ 0xf) == 0) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<int>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V2i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              (&local_1a8)[lVar52] = 0;
              if ((CONCAT44(local_1a8._4_4_,(float)local_1a8) == 0x7fffffffffffffff) &&
                 (CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) == 0x7fffffffffffffff)) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<long>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0;
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = 0;
              acStack_1ac[2] = 0;
              acStack_1ac[3] = 0x80;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              if ((CONCAT17(p.y._3_1_,
                            CONCAT16(p.y._2_1_,
                                     CONCAT15(p.y._1_1_,
                                              CONCAT14(p.y._0_1_,
                                                       CONCAT13(p.x._3_1_,
                                                                CONCAT12(p.x._2_1_,
                                                                         CONCAT11(p.x._1_1_,
                                                                                  p.x._0_1_)))))))
                   == -0x8000000000000000) &&
                 (CONCAT17(acStack_1ac[3],
                           CONCAT16(acStack_1ac[2],
                                    CONCAT15(acStack_1ac[1],
                                             CONCAT14(acStack_1ac[0],
                                                      CONCAT13(p.z._3_1_,
                                                               CONCAT12(p.z._2_1_,
                                                                        CONCAT11(p.z._1_1_,p.z._0_1_
                                                                                ))))))) ==
                  -0x8000000000000000)) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<long>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V2f");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0x7f;
              (&p.z)[lVar52] = 0.0;
              fVar90 = (float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
              if ((((fVar90 == 3.4028235e+38) && (!NAN(fVar90))) &&
                  (fVar90 = (float)CONCAT13(acStack_1ac[3],
                                            CONCAT12(acStack_1ac[2],
                                                     CONCAT11(acStack_1ac[1],acStack_1ac[0]))),
                  fVar90 == 3.4028235e+38)) && (!NAN(fVar90))) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<float>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0x7f;
              (&p.x)[lVar52] = 0.0;
              auVar125._4_4_ =
                   -(uint)((float)CONCAT13(p.y._3_1_,
                                           CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))) !=
                          -3.4028235e+38);
              auVar125._0_4_ =
                   -(uint)((float)CONCAT13(p.x._3_1_,
                                           CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))) !=
                          -3.4028235e+38);
              auVar125._8_8_ = 0;
              uVar54 = movmskps((int)uVar55,auVar125);
              uVar55 = (ulong)uVar54;
              if (uVar54 == 0) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<float>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V2d");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
              local_1a8._0_4_ = (float)DAT_00153230;
              fVar90 = (float)local_1a8;
              local_1a8._4_4_ = DAT_00153230._4_4_;
              fVar118 = local_1a8._4_4_;
              uStack_1a0._0_4_ = DAT_00153230._8_4_;
              fVar151 = (float)uStack_1a0;
              uStack_1a0._4_4_ = DAT_00153230._12_4_;
              fVar61 = uStack_1a0._4_4_;
              (&local_1a8)[lVar52] = 0;
              if ((((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) == 1.79769313486232e+308) &&
                  (!NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)))) &&
                 (((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) == 1.79769313486232e+308 &&
                  (!NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)))))) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<double>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = DAT_00153240;
              p.x._1_1_ = DAT_00153240._1_1_;
              p.x._2_1_ = DAT_00153240._2_1_;
              p.x._3_1_ = DAT_00153240._3_1_;
              p.y._0_1_ = DAT_00153240._4_1_;
              p.y._1_1_ = DAT_00153240._5_1_;
              p.y._2_1_ = DAT_00153240._6_1_;
              p.y._3_1_ = DAT_00153240._7_1_;
              p.z._0_1_ = DAT_00153240._8_1_;
              p.z._1_1_ = DAT_00153240._9_1_;
              p.z._2_1_ = DAT_00153240._10_1_;
              p.z._3_1_ = DAT_00153240._11_1_;
              acStack_1ac[0] = DAT_00153240._12_1_;
              acStack_1ac[1] = DAT_00153240._13_1_;
              acStack_1ac[2] = DAT_00153240._14_1_;
              acStack_1ac[3] = DAT_00153240._15_1_;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              auVar126._4_4_ =
                   -(uint)((double)CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) != DAT_00153240._8_8_);
              auVar126._0_4_ =
                   -(uint)((double)CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_))))))) != (double)DAT_00153240);
              auVar126._8_8_ = 0;
              uVar54 = movmskps((int)uVar55,auVar126);
              uVar55 = (ulong)uVar54;
              local_1a8._0_4_ = fVar90;
              local_1a8._4_4_ = fVar118;
              uStack_1a0._0_4_ = fVar151;
              uStack_1a0._4_4_ = fVar61;
              if (uVar54 == 0) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec2<double>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V3s");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0;
              p.x._1_1_ = 0x80;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0x80;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0x7f;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              *(undefined2 *)((long)&p.y + lVar52 * 2 + 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<short>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<short>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0x80;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0x80;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0x7f;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              *(undefined2 *)((long)&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<short>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<short>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V3i");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = NAN;
              local_1a8._4_4_ = NAN;
              pcVar58 = acStack_1ac + lVar52 * 4;
              pcVar58[0] = '\0';
              pcVar58[1] = '\0';
              pcVar58[2] = '\0';
              pcVar58[3] = '\0';
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<int>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = NAN;
              local_1a8._4_4_ = NAN;
              (&p.x)[lVar52] = 0.0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<int>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<int>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V3i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            lVar52 = 0;
            while( true ) {
              fVar151 = local_1a8._4_4_;
              fVar90 = (float)local_1a8;
              uVar40 = p.y._3_1_;
              uVar38 = p.y._2_1_;
              uVar36 = p.y._1_1_;
              cVar34 = p.y._0_1_;
              uVar32 = p.x._3_1_;
              uVar30 = p.x._2_1_;
              uVar28 = p.x._0_1_;
              p.x._0_1_ = 0;
              uVar29 = p.x._0_1_;
              local_1a8._0_4_ = 0.0;
              fVar118 = (float)local_1a8;
              local_1a8._4_4_ = -0.0;
              fVar61 = local_1a8._4_4_;
              p.x._2_1_ = 0;
              uVar31 = p.x._2_1_;
              p.x._3_1_ = 0;
              uVar33 = p.x._3_1_;
              p.y._0_1_ = '\0';
              cVar35 = p.y._0_1_;
              p.y._1_1_ = 0;
              uVar37 = p.y._1_1_;
              p.y._2_1_ = 0;
              uVar39 = p.y._2_1_;
              p.y._3_1_ = 0x80;
              uVar41 = p.y._3_1_;
              if (lVar52 == 3) break;
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              uVar28 = p.x._1_1_;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              (&uStack_1a0)[lVar52] = 0;
              p.z._0_1_ = p.x._0_1_;
              p.z._1_1_ = p.x._1_1_;
              p.z._2_1_ = p.x._2_1_;
              p.z._3_1_ = p.x._3_1_;
              acStack_1ac[0] = p.y._0_1_;
              acStack_1ac[1] = p.y._1_1_;
              acStack_1ac[2] = p.y._2_1_;
              acStack_1ac[3] = p.y._3_1_;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<long>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<long>]"
                ;
                goto LAB_001143c1;
              }
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              p.x._0_1_ = uVar29;
              p.x._1_1_ = uVar28;
              p.x._2_1_ = uVar31;
              p.x._3_1_ = uVar33;
              p.y._0_1_ = cVar35;
              p.y._1_1_ = uVar37;
              p.y._2_1_ = uVar39;
              p.y._3_1_ = uVar41;
              p.z._0_1_ = uVar29;
              p.z._1_1_ = uVar28;
              p.z._2_1_ = uVar31;
              p.z._3_1_ = uVar33;
              acStack_1ac[0] = cVar35;
              acStack_1ac[1] = uVar37;
              acStack_1ac[2] = uVar39;
              acStack_1ac[3] = uVar41;
              local_1a8._0_4_ = fVar118;
              local_1a8._4_4_ = fVar61;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<long>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<long>]"
                ;
                goto LAB_001143e0;
              }
              lVar52 = lVar52 + 1;
            }
            p.x._0_1_ = uVar28;
            p.x._2_1_ = uVar30;
            p.x._3_1_ = uVar32;
            p.y._0_1_ = cVar34;
            p.y._1_1_ = uVar36;
            p.y._2_1_ = uVar38;
            p.y._3_1_ = uVar40;
            local_1a8._0_4_ = fVar90;
            local_1a8._4_4_ = fVar151;
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V3f");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = 3.4028235e+38;
              local_1a8._4_4_ = 3.4028235e+38;
              pcVar58 = acStack_1ac + lVar52 * 4;
              pcVar58[0] = '\0';
              pcVar58[1] = '\0';
              pcVar58[2] = '\0';
              pcVar58[3] = '\0';
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<float>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<float>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = 3.4028235e+38;
              local_1a8._4_4_ = 3.4028235e+38;
              (&p.x)[lVar52] = 0.0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<float>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<float>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V3d");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
              p.x._0_1_ = DAT_00153240;
              p.x._1_1_ = DAT_00153240._1_1_;
              p.x._2_1_ = DAT_00153240._2_1_;
              p.x._3_1_ = DAT_00153240._3_1_;
              p.y._0_1_ = DAT_00153240._4_1_;
              p.y._1_1_ = DAT_00153240._5_1_;
              p.y._2_1_ = DAT_00153240._6_1_;
              p.y._3_1_ = DAT_00153240._7_1_;
              p.z._0_1_ = DAT_00153240._8_1_;
              p.z._1_1_ = DAT_00153240._9_1_;
              p.z._2_1_ = DAT_00153240._10_1_;
              p.z._3_1_ = DAT_00153240._11_1_;
              acStack_1ac[0] = DAT_00153240._12_1_;
              acStack_1ac[1] = DAT_00153240._13_1_;
              acStack_1ac[2] = DAT_00153240._14_1_;
              acStack_1ac[3] = DAT_00153240._15_1_;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = -NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              (&uStack_1a0)[lVar52] = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<double>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = -NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::isInfinite
                                 ((Box<Imath_3_2::Vec3<double>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec3<double>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V4s");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0;
              p.x._1_1_ = 0x80;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0x80;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0x7f;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0x7f;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              *(undefined2 *)((long)&p.z + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<short>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<short>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0x80;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0x80;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0x7f;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0x7f;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              *(undefined2 *)((long)&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<short>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<short>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V4i");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = 0;
              acStack_1ac[2] = 0;
              acStack_1ac[3] = 0x80;
              local_1a8._0_4_ = NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = NAN;
              uStack_1a0._4_4_ = NAN;
              *(undefined4 *)((long)&local_1a8 + lVar52 * 4) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<int>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0;
              p.x._1_1_ = 0;
              p.x._2_1_ = 0;
              p.x._3_1_ = 0x80;
              p.y._0_1_ = '\0';
              p.y._1_1_ = 0;
              p.y._2_1_ = 0;
              p.y._3_1_ = 0x80;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = 0;
              acStack_1ac[2] = 0;
              acStack_1ac[3] = 0x80;
              local_1a8._0_4_ = NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = NAN;
              uStack_1a0._4_4_ = NAN;
              (&p.x)[lVar52] = 0.0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<int>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<int>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V4i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
              p.x._1_1_ = 0;
              uVar28 = p.x._1_1_;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              stack0xfffffffffffffe80 = NAN;
              local_188._0_8_ = 0x7fffffffffffffff;
              (local_198 + lVar52 * 2)[0] = 0.0;
              (local_198 + lVar52 * 2)[1] = 0.0;
              p.x._0_1_ = uVar29;
              p.x._2_1_ = uVar31;
              p.x._3_1_ = uVar33;
              p.y._0_1_ = cVar35;
              p.y._1_1_ = uVar37;
              p.y._2_1_ = uVar39;
              p.y._3_1_ = uVar41;
              p.z._0_1_ = uVar29;
              p.z._1_1_ = p.x._1_1_;
              p.z._2_1_ = uVar31;
              p.z._3_1_ = uVar33;
              acStack_1ac[0] = cVar35;
              acStack_1ac[1] = uVar37;
              acStack_1ac[2] = uVar39;
              acStack_1ac[3] = uVar41;
              local_1a8._0_4_ = fVar118;
              local_1a8._4_4_ = fVar61;
              uStack_1a0._0_4_ = fVar118;
              uStack_1a0._4_4_ = fVar61;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<long>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<long>]"
                ;
                goto LAB_001143c1;
              }
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              stack0xfffffffffffffe80 = NAN;
              local_188._0_8_ = 0x7fffffffffffffff;
              p.x._0_1_ = uVar29;
              p.x._1_1_ = uVar28;
              p.x._2_1_ = uVar31;
              p.x._3_1_ = uVar33;
              p.y._0_1_ = cVar35;
              p.y._1_1_ = uVar37;
              p.y._2_1_ = uVar39;
              p.y._3_1_ = uVar41;
              p.z._0_1_ = uVar29;
              p.z._1_1_ = uVar28;
              p.z._2_1_ = uVar31;
              p.z._3_1_ = uVar33;
              acStack_1ac[0] = cVar35;
              acStack_1ac[1] = uVar37;
              acStack_1ac[2] = uVar39;
              acStack_1ac[3] = uVar41;
              local_1a8._0_4_ = fVar118;
              local_1a8._4_4_ = fVar61;
              uStack_1a0._0_4_ = fVar118;
              uStack_1a0._4_4_ = fVar61;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<long>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<long>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V4f");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = (float)DAT_001532c0;
              local_1a8._4_4_ = DAT_001532c0._4_4_;
              uStack_1a0._0_4_ = DAT_001532c0._8_4_;
              uStack_1a0._4_4_ = DAT_001532c0._12_4_;
              *(undefined4 *)((long)&local_1a8 + lVar52 * 4) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<float>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<float>]"
                ;
                goto LAB_001143c1;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = 3.4028235e+38;
              local_1a8._4_4_ = 3.4028235e+38;
              uStack_1a0._0_4_ = 3.4028235e+38;
              uStack_1a0._4_4_ = 3.4028235e+38;
              (&p.x)[lVar52] = 0.0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<float>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<float>]"
                ;
                goto LAB_001143e0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    makeInfinite() for type ");
            poVar51 = std::operator<<(poVar51,"V4d");
            std::endl<char,std::char_traits<char>>(poVar51);
            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
              p.x._0_1_ = DAT_00153240;
              p.x._1_1_ = DAT_00153240._1_1_;
              p.x._2_1_ = DAT_00153240._2_1_;
              p.x._3_1_ = DAT_00153240._3_1_;
              p.y._0_1_ = DAT_00153240._4_1_;
              p.y._1_1_ = DAT_00153240._5_1_;
              p.y._2_1_ = DAT_00153240._6_1_;
              p.y._3_1_ = DAT_00153240._7_1_;
              p.z._0_1_ = DAT_00153240._8_1_;
              p.z._1_1_ = DAT_00153240._9_1_;
              p.z._2_1_ = DAT_00153240._10_1_;
              p.z._3_1_ = DAT_00153240._11_1_;
              acStack_1ac[0] = DAT_00153240._12_1_;
              acStack_1ac[1] = DAT_00153240._13_1_;
              acStack_1ac[2] = DAT_00153240._14_1_;
              acStack_1ac[3] = DAT_00153240._15_1_;
              local_1a8._0_4_ = (float)DAT_00153240;
              local_1a8._4_4_ = DAT_00153240._4_4_;
              uStack_1a0._0_4_ = DAT_00153240._8_4_;
              uStack_1a0._4_4_ = DAT_00153240._12_4_;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              stack0xfffffffffffffe80 = 1.79769313486232e+308;
              local_188._0_8_ = 0x7fefffffffffffff;
              (local_198 + lVar52 * 2)[0] = 0.0;
              (local_198 + lVar52 * 2)[1] = 0.0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<double>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<double>]"
                ;
LAB_001143c1:
                __assert_fail("!c.isInfinite()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                              ,0xbc,pcVar58);
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = -1;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0xff;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = -NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = -NAN;
              local_198[0] = -NAN;
              local_198[1] = NAN;
              local_198[2] = -NAN;
              local_198[3] = NAN;
              stack0xfffffffffffffe80 = 1.79769313486232e+308;
              local_188._0_8_ = 0x7fefffffffffffff;
              *(undefined8 *)(&p.x + lVar52 * 2) = 0;
              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::isInfinite
                                 ((Box<Imath_3_2::Vec4<double>_> *)&p);
              if (bVar49) {
                pcVar58 = 
                "void (anonymous namespace)::testMakeInfinite(const char *) [T = Imath_3_2::Vec4<double>]"
                ;
LAB_001143e0:
                __assert_fail("!c.isInfinite()",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                              ,0xc0,pcVar58);
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V2s");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0x5a;
            p.x._1_1_ = 0x5a;
            p.x._2_1_ = 0x5a;
            p.x._3_1_ = 0x5a;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 2;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
              }
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              sVar79 = 0x7fff;
              sVar82 = -0x8000;
              sVar78 = -0x8000;
              sVar81 = 0x7fff;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                local_c8._0_4_ = iVar83;
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
                  *(short *)((long)&rand_2._state + lVar52 * 2) = (short)(int)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  max.x = (short)rand_2._state;
                  max.y = rand_2._state._2_2_;
                }
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  sVar53 = *(short *)((long)&rand_2._state + lVar52 * 2);
                  sVar148 = (&min.x)[lVar52];
                  if (sVar53 < (&min.x)[lVar52]) {
                    sVar148 = sVar53;
                  }
                  (&min.x)[lVar52] = sVar148;
                  if (sVar53 < (&max.x)[lVar52]) {
                    sVar53 = (&max.x)[lVar52];
                  }
                  (&max.x)[lVar52] = sVar53;
                }
                if ((short)rand_2._state < sVar81) {
                  sVar81 = (short)rand_2._state;
                }
                if (sVar78 <= (short)rand_2._state) {
                  sVar78 = (short)rand_2._state;
                }
                if (rand_2._state._2_2_ < sVar79) {
                  sVar79 = rand_2._state._2_2_;
                }
                if (sVar82 <= rand_2._state._2_2_) {
                  sVar82 = rand_2._state._2_2_;
                }
                if (((sVar81 != min.x) || (sVar79 != min.y)) ||
                   ((sVar78 != max.x || (sVar82 != max.y)))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<short>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V2i");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0x5a;
            p.x._1_1_ = 0x5a;
            p.x._2_1_ = 0x5a;
            p.x._3_1_ = 0x5a;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 2;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
              }
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 0x7fffffff;
              iVar84 = -0x80000000;
              iVar89 = -0x80000000;
              iVar88 = 0x7fffffff;
              for (iVar65 = 0; iVar65 != iVar50; iVar65 = iVar65 + 1) {
                local_c8._0_4_ = iVar65;
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
                  *(int *)((long)&rand_2._state + lVar52 * 4) = (int)fVar90;
                }
                if (iVar65 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  max.x = (short)rand_2._state;
                  max.y = rand_2._state._2_2_;
                  sStack_114 = rand_2._state._4_2_;
                  sStack_112 = rand_2._state._6_2_;
                }
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                  VVar60 = (&min)[lVar52];
                  if ((int)VVar91 < (int)(&min)[lVar52]) {
                    VVar60 = VVar91;
                  }
                  (&min)[lVar52] = VVar60;
                  if ((int)VVar91 < (int)(&max)[lVar52]) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                }
                iVar85 = CONCAT22(rand_2._state._2_2_,(short)rand_2._state);
                if (iVar85 < iVar88) {
                  iVar88 = iVar85;
                }
                iVar66 = CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_);
                if (iVar89 <= iVar85) {
                  iVar89 = iVar85;
                }
                if (iVar66 < iVar83) {
                  iVar83 = iVar66;
                }
                if (iVar84 <= iVar66) {
                  iVar84 = iVar66;
                }
                if ((((iVar88 != CONCAT22(min.y,min.x)) ||
                     (iVar83 != CONCAT22(sStack_172,sStack_174))) ||
                    (iVar89 != CONCAT22(max.y,max.x))) ||
                   (iVar84 != CONCAT22(sStack_112,sStack_114))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<int>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V2i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_2._state._0_2_ = 0x5a5a;
            rand_2._state._2_2_ = 0x5a5a;
            rand_2._state._4_2_ = 0;
            rand_2._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 2;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
              }
            }
            iVar50 = 0;
            while( true ) {
              cVar46 = acStack_1ac[3];
              cVar44 = acStack_1ac[2];
              cVar42 = acStack_1ac[1];
              cVar34 = acStack_1ac[0];
              uVar36 = p.z._3_1_;
              uVar32 = p.z._2_1_;
              uVar30 = p.z._1_1_;
              uVar28 = p.z._0_1_;
              lVar52 = -0x8000000000000000;
              lVar86 = 0x7fffffffffffffff;
              acStack_1ac[2] = (char)sStack_10a;
              cVar45 = acStack_1ac[2];
              acStack_1ac[3] = (char)((ushort)sStack_10a >> 8);
              cVar47 = acStack_1ac[3];
              acStack_1ac[0] = (char)sStack_10c;
              cVar35 = acStack_1ac[0];
              acStack_1ac[1] = (char)((ushort)sStack_10c >> 8);
              cVar43 = acStack_1ac[1];
              p.z._0_1_ = (char)sStack_110;
              uVar29 = p.z._0_1_;
              p.z._1_1_ = (char)((ushort)sStack_110 >> 8);
              uVar31 = p.z._1_1_;
              p.z._2_1_ = (char)sStack_10e;
              uVar33 = p.z._2_1_;
              p.z._3_1_ = (char)((ushort)sStack_10e >> 8);
              uVar37 = p.z._3_1_;
              p.z._0_1_ = uVar28;
              p.z._1_1_ = uVar30;
              p.z._2_1_ = uVar32;
              p.z._3_1_ = uVar36;
              acStack_1ac[0] = cVar34;
              acStack_1ac[1] = cVar42;
              acStack_1ac[2] = cVar44;
              acStack_1ac[3] = cVar46;
              if (iVar50 == 10) break;
              lVar76 = 0x7fffffffffffffff;
              lVar80 = lVar52;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                local_c8._0_4_ = iVar83;
                for (lVar64 = 0; lVar64 != 2; lVar64 = lVar64 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
                  *(long *)(&max + lVar64 * 2) = (long)fVar90;
                }
                if (iVar83 == 0) {
                  p.x._0_1_ = (char)max.x;
                  p.x._1_1_ = (char)((ushort)max.x >> 8);
                  p.x._2_1_ = (char)max.y;
                  p.x._3_1_ = (char)((ushort)max.y >> 8);
                  p.y._0_1_ = (char)sStack_114;
                  p.y._1_1_ = (char)((ushort)sStack_114 >> 8);
                  p.y._2_1_ = (char)sStack_112;
                  p.y._3_1_ = (char)((ushort)sStack_112 >> 8);
                  min.x = max.x;
                  min.y = max.y;
                  sStack_174 = sStack_114;
                  sStack_172 = sStack_112;
                  sStack_170 = sStack_110;
                  sStack_16e = sStack_10e;
                  sStack_16c = sStack_10c;
                  sStack_16a = sStack_10a;
                  p.z._0_1_ = uVar29;
                  p.z._1_1_ = uVar31;
                  p.z._2_1_ = uVar33;
                  p.z._3_1_ = uVar37;
                  acStack_1ac[0] = cVar35;
                  acStack_1ac[1] = cVar43;
                  acStack_1ac[2] = cVar45;
                  acStack_1ac[3] = cVar47;
                }
                for (lVar64 = 0; lVar64 != 2; lVar64 = lVar64 + 1) {
                  lVar77 = *(long *)(&max + lVar64 * 2);
                  lVar87 = *(long *)(&p.x + lVar64 * 2);
                  if (lVar77 < *(long *)(&p.x + lVar64 * 2)) {
                    lVar87 = lVar77;
                  }
                  *(long *)(&p.x + lVar64 * 2) = lVar87;
                  if (lVar77 < *(long *)(&min + lVar64 * 2)) {
                    lVar77 = *(long *)(&min + lVar64 * 2);
                  }
                  *(long *)(&min + lVar64 * 2) = lVar77;
                }
                lVar64 = CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)));
                if (lVar64 < lVar86) {
                  lVar86 = lVar64;
                }
                lVar77 = CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)));
                if (lVar52 <= lVar64) {
                  lVar52 = lVar64;
                }
                if (lVar77 < lVar76) {
                  lVar76 = lVar77;
                }
                if (lVar80 <= lVar77) {
                  lVar80 = lVar77;
                }
                if (((lVar86 != CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))))) ||
                    (lVar76 != CONCAT17(acStack_1ac[3],
                                        CONCAT16(acStack_1ac[2],
                                                 CONCAT15(acStack_1ac[1],
                                                          CONCAT14(acStack_1ac[0],
                                                                   CONCAT13(p.z._3_1_,
                                                                            CONCAT12(p.z._2_1_,
                                                                                     CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))))) ||
                   ((lVar52 != CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))) ||
                    (lVar80 != CONCAT26(sStack_16a,
                                        CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<long>]"
                  ;
LAB_00113118:
                  __assert_fail("b.min == min && b.max == max",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                ,0x119,pcVar58);
                }
              }
              iVar50 = iVar50 + 1;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V2f");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0x5a;
            p.x._1_1_ = 0x5a;
            p.x._2_1_ = 0x5a;
            p.x._3_1_ = 0x5a;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                VVar91 = (Vec2<short>)Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
                (&min)[lVar52] = VVar91;
              }
              fVar90 = (float)CONCAT22(min.y,min.x);
              fVar118 = fVar90;
              if (3.4028235e+38 <= fVar90) {
                fVar118 = 3.4028235e+38;
              }
              if ((fVar118 != fVar90) || (NAN(fVar118) || NAN(fVar90))) {
LAB_00114028:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<float>]"
                ;
                goto LAB_00114054;
              }
              fVar118 = (float)CONCAT22(sStack_172,sStack_174);
              fVar151 = fVar118;
              if (3.4028235e+38 <= fVar118) {
                fVar151 = 3.4028235e+38;
              }
              if ((fVar151 != fVar118) || (NAN(fVar151) || NAN(fVar118))) goto LAB_00114028;
              fVar151 = fVar90;
              if (fVar90 <= -3.4028235e+38) {
                fVar151 = -3.4028235e+38;
              }
              if ((fVar151 != fVar90) || (NAN(fVar151) || NAN(fVar90))) goto LAB_00114028;
              fVar90 = fVar118;
              if (fVar118 <= -3.4028235e+38) {
                fVar90 = -3.4028235e+38;
              }
              if ((fVar90 != fVar118) || (NAN(fVar90) || NAN(fVar118))) goto LAB_00114028;
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              auVar93 = _DAT_00153210;
              auVar169 = _DAT_001532d0;
              for (iVar83 = 0; auVar96 = auVar93, iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
                  *(float *)((long)&rand_2._state + lVar52 * 4) = fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_112 = rand_2._state._6_2_;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                }
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                  VVar60 = VVar91;
                  if ((float)(&min)[lVar52] <= (float)VVar91) {
                    VVar60 = (&min)[lVar52];
                  }
                  (&min)[lVar52] = VVar60;
                  if ((float)VVar91 <= (float)(&max)[lVar52]) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                }
                uVar55 = CONCAT26(rand_2._state._6_2_,
                                  CONCAT24(rand_2._state._4_2_,
                                           CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
                auVar127._8_8_ = 0;
                auVar127._0_8_ = uVar55;
                auVar95._8_8_ = 0;
                auVar95._0_8_ = uVar55;
                auVar93 = minps(auVar95,auVar96);
                if ((((auVar93._0_4_ != (float)CONCAT22(min.y,min.x)) ||
                     (NAN(auVar93._0_4_) || NAN((float)CONCAT22(min.y,min.x)))) ||
                    (auVar93._4_4_ != (float)CONCAT22(sStack_172,sStack_174))) ||
                   (NAN(auVar93._4_4_) || NAN((float)CONCAT22(sStack_172,sStack_174)))) {
LAB_00113005:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<float>]"
                  ;
                  goto LAB_00113118;
                }
                auVar169 = maxps(auVar127,auVar169);
                iVar88 = -(uint)((float)CONCAT22(max.y,max.x) == auVar169._0_4_);
                iVar89 = -(uint)((float)(CONCAT26(sStack_112,
                                                  CONCAT24(sStack_114,CONCAT22(max.y,max.x))) >>
                                        0x20) == auVar169._4_4_);
                auVar155._4_4_ = iVar89;
                auVar155._0_4_ = iVar88;
                auVar155._8_4_ = iVar89;
                auVar155._12_4_ = iVar89;
                auVar154._8_8_ = auVar155._8_8_;
                auVar154._4_4_ = iVar88;
                auVar154._0_4_ = iVar88;
                iVar88 = movmskpd(2,auVar154);
                if (iVar88 != 3) goto LAB_00113005;
                local_c8 = auVar96;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V2d");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_2._state._0_2_ = 0x5a5a;
            rand_2._state._2_2_ = 0x5a5a;
            rand_2._state._4_2_ = 0;
            rand_2._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
                *(double *)(&p.x + lVar52 * 2) = (double)fVar90;
              }
              dVar120 = (double)CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))));
              dVar119 = dVar120;
              if (1.79769313486232e+308 <= dVar120) {
                dVar119 = 1.79769313486232e+308;
              }
              if ((dVar119 != dVar120) || (NAN(dVar119) || NAN(dVar120))) {
LAB_0011403f:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<double>]"
                ;
                goto LAB_00114054;
              }
              dVar119 = (double)CONCAT17(acStack_1ac[3],
                                         CONCAT16(acStack_1ac[2],
                                                  CONCAT15(acStack_1ac[1],
                                                           CONCAT14(acStack_1ac[0],
                                                                    CONCAT13(p.z._3_1_,
                                                                             CONCAT12(p.z._2_1_,
                                                                                      CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_)))))));
              dVar152 = dVar119;
              if (1.79769313486232e+308 <= dVar119) {
                dVar152 = 1.79769313486232e+308;
              }
              if ((dVar152 != dVar119) || (NAN(dVar152) || NAN(dVar119))) goto LAB_0011403f;
              dVar152 = dVar120;
              if (dVar120 <= -1.79769313486232e+308) {
                dVar152 = -1.79769313486232e+308;
              }
              if ((dVar152 != dVar120) || (NAN(dVar152) || NAN(dVar120))) goto LAB_0011403f;
              dVar120 = dVar119;
              if (dVar119 <= -1.79769313486232e+308) {
                dVar120 = -1.79769313486232e+308;
              }
              if ((dVar120 != dVar119) || (NAN(dVar120) || NAN(dVar119))) goto LAB_0011403f;
            }
            iVar50 = 0;
            auVar93 = _DAT_00153230;
            while( true ) {
              uVar32 = p.y._3_1_;
              uVar28 = p.y._2_1_;
              p.y._2_1_ = (char)sStack_112;
              uVar30 = p.y._2_1_;
              p.y._3_1_ = (char)((ushort)sStack_112 >> 8);
              uVar36 = p.y._3_1_;
              p.y._2_1_ = uVar28;
              p.y._3_1_ = uVar32;
              if (iVar50 == 10) break;
              auVar169 = auVar93;
              auVar96 = _DAT_00153240;
              for (iVar83 = 0; auVar92 = auVar169, iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
                  *(double *)(&max + lVar52 * 2) = (double)fVar90;
                }
                if (iVar83 == 0) {
                  p.x._0_1_ = (char)max.x;
                  p.x._1_1_ = (char)((ushort)max.x >> 8);
                  p.x._2_1_ = (char)max.y;
                  p.x._3_1_ = (char)((ushort)max.y >> 8);
                  p.y._0_1_ = (char)sStack_114;
                  p.y._1_1_ = (char)((ushort)sStack_114 >> 8);
                  min.x = max.x;
                  min.y = max.y;
                  sStack_174 = sStack_114;
                  sStack_172 = sStack_112;
                  sStack_170 = sStack_110;
                  sStack_16e = sStack_10e;
                  sStack_16c = sStack_10c;
                  sStack_16a = sStack_10a;
                  p.y._2_1_ = uVar30;
                  p.y._3_1_ = uVar36;
                  p.z._0_1_ = uVar29;
                  p.z._1_1_ = uVar31;
                  p.z._2_1_ = uVar33;
                  p.z._3_1_ = uVar37;
                  acStack_1ac[0] = cVar35;
                  acStack_1ac[1] = cVar43;
                  acStack_1ac[2] = cVar45;
                  acStack_1ac[3] = cVar47;
                }
                for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                  dVar119 = *(double *)(&max + lVar52 * 2);
                  dVar120 = dVar119;
                  if (*(double *)(&p.x + lVar52 * 2) <= dVar119) {
                    dVar120 = *(double *)(&p.x + lVar52 * 2);
                  }
                  *(double *)(&p.x + lVar52 * 2) = dVar120;
                  if (dVar119 <= *(double *)(&min + lVar52 * 2)) {
                    dVar119 = *(double *)(&min + lVar52 * 2);
                  }
                  *(double *)(&min + lVar52 * 2) = dVar119;
                }
                auVar24._2_2_ = max.y;
                auVar24._0_2_ = max.x;
                auVar24._4_2_ = sStack_114;
                auVar24._6_2_ = sStack_112;
                auVar24._8_2_ = sStack_110;
                auVar24._10_2_ = sStack_10e;
                auVar24._12_2_ = sStack_10c;
                auVar24._14_2_ = sStack_10a;
                auVar169 = minpd(auVar24,auVar92);
                auVar156._8_8_ =
                     -(ulong)((double)CONCAT17(acStack_1ac[3],
                                               CONCAT16(acStack_1ac[2],
                                                        CONCAT15(acStack_1ac[1],
                                                                 CONCAT14(acStack_1ac[0],
                                                                          CONCAT13(p.z._3_1_,
                                                                                   CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))))))) ==
                             auVar169._8_8_);
                auVar156._0_8_ =
                     -(ulong)((double)CONCAT17(p.y._3_1_,
                                               CONCAT16(p.y._2_1_,
                                                        CONCAT15(p.y._1_1_,
                                                                 CONCAT14(p.y._0_1_,
                                                                          CONCAT13(p.x._3_1_,
                                                                                   CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))))))) ==
                             auVar169._0_8_);
                iVar88 = movmskpd(2,auVar156);
                if (iVar88 != 3) {
LAB_0011301f:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec2<double>]"
                  ;
                  goto LAB_00113118;
                }
                auVar96 = maxpd(auVar24,auVar96);
                auVar157._8_8_ =
                     -(ulong)((double)CONCAT26(sStack_16a,
                                               CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170)))
                             == auVar96._8_8_);
                auVar157._0_8_ =
                     -(ulong)((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))
                                              ) == auVar96._0_8_);
                iVar88 = movmskpd(3,auVar157);
                if (iVar88 != 3) goto LAB_0011301f;
                auVar93 = _DAT_00153230;
                local_c8 = auVar92;
              }
              iVar50 = iVar50 + 1;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V3s");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0x5a;
            p.x._1_1_ = 0x5a;
            p.x._2_1_ = 0x5a;
            p.x._3_1_ = 0x5a;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 3;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
              }
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              sVar78 = 0x7fff;
              sVar81 = -0x8000;
              sVar148 = -0x8000;
              sVar79 = -0x8000;
              sVar53 = 0x7fff;
              sVar82 = 0x7fff;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                local_c8._0_4_ = iVar83;
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,-12345.0,12345.0);
                  *(short *)((long)&rand_2._state + lVar52 * 2) = (short)(int)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  max.x = (short)rand_2._state;
                  max.y = rand_2._state._2_2_;
                  sStack_114 = rand_2._state._4_2_;
                }
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  sVar149 = *(short *)((long)&rand_2._state + lVar52 * 2);
                  sVar59 = (&min.x)[lVar52];
                  if (sVar149 < (&min.x)[lVar52]) {
                    sVar59 = sVar149;
                  }
                  (&min.x)[lVar52] = sVar59;
                  if (sVar149 < (&max.x)[lVar52]) {
                    sVar149 = (&max.x)[lVar52];
                  }
                  (&max.x)[lVar52] = sVar149;
                }
                if ((short)rand_2._state < sVar82) {
                  sVar82 = (short)rand_2._state;
                }
                if (rand_2._state._2_2_ < sVar53) {
                  sVar53 = rand_2._state._2_2_;
                }
                if (rand_2._state._4_2_ < sVar78) {
                  sVar78 = rand_2._state._4_2_;
                }
                if (sVar79 <= (short)rand_2._state) {
                  sVar79 = (short)rand_2._state;
                }
                if (sVar148 <= rand_2._state._2_2_) {
                  sVar148 = rand_2._state._2_2_;
                }
                if (sVar81 <= rand_2._state._4_2_) {
                  sVar81 = rand_2._state._4_2_;
                }
                if (((((sVar82 != min.x) || (sVar53 != min.y)) || (sVar78 != sStack_174)) ||
                    ((sVar79 != max.x || (sVar148 != max.y)))) || (sVar81 != sStack_114)) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<short>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V3i");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_2._state._0_2_ = 0x5a5a;
            rand_2._state._2_2_ = 0x5a5a;
            rand_2._state._4_2_ = 0;
            rand_2._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 3;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
              }
            }
            iVar50 = 0;
            while( true ) {
              uVar38 = p.y._1_1_;
              uVar28 = p.y._0_1_;
              p.y._0_1_ = (char)sStack_114;
              uVar32 = p.y._0_1_;
              p.y._1_1_ = (char)((ushort)sStack_114 >> 8);
              uVar39 = p.y._1_1_;
              p.y._0_1_ = uVar28;
              p.y._1_1_ = uVar38;
              if (iVar50 == 10) break;
              iVar89 = 0x7fffffff;
              iVar83 = -0x80000000;
              iVar85 = -0x80000000;
              iVar65 = -0x80000000;
              iVar88 = 0x7fffffff;
              iVar84 = 0x7fffffff;
              for (iVar66 = 0; iVar66 != iVar50; iVar66 = iVar66 + 1) {
                local_c8._0_4_ = iVar66;
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
                  (&max)[lVar52] = (Vec2<short>)(int)fVar90;
                }
                if (iVar66 == 0) {
                  p.x._0_1_ = (char)max.x;
                  p.x._1_1_ = (char)((ushort)max.x >> 8);
                  p.x._2_1_ = (char)max.y;
                  p.x._3_1_ = (char)((ushort)max.y >> 8);
                  min.x = max.x;
                  min.y = max.y;
                  sStack_174 = sStack_114;
                  sStack_172 = sStack_112;
                  sStack_170 = sStack_110;
                  sStack_16e = sStack_10e;
                  p.y._0_1_ = uVar32;
                  p.y._1_1_ = uVar39;
                  p.y._2_1_ = uVar30;
                  p.y._3_1_ = uVar36;
                  p.z._0_1_ = uVar29;
                  p.z._1_1_ = uVar31;
                  p.z._2_1_ = uVar33;
                  p.z._3_1_ = uVar37;
                }
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  VVar91 = (&max)[lVar52];
                  VVar60 = *(Vec2<short> *)(&p.x + lVar52);
                  if ((int)VVar91 < (int)*(Vec2<short> *)(&p.x + lVar52)) {
                    VVar60 = VVar91;
                  }
                  *(Vec2<short> *)(&p.x + lVar52) = VVar60;
                  if ((int)VVar91 < (int)(&min)[lVar52]) {
                    VVar91 = (&min)[lVar52];
                  }
                  (&min)[lVar52] = VVar91;
                }
                iVar23 = CONCAT22(max.y,max.x);
                if (iVar23 < iVar84) {
                  iVar84 = iVar23;
                }
                iVar26 = CONCAT22(sStack_112,sStack_114);
                if (iVar26 < iVar88) {
                  iVar88 = iVar26;
                }
                iVar27 = CONCAT22(sStack_10e,sStack_110);
                if (iVar27 < iVar89) {
                  iVar89 = iVar27;
                }
                if (iVar65 <= iVar23) {
                  iVar65 = iVar23;
                }
                if (iVar85 <= iVar26) {
                  iVar85 = iVar26;
                }
                if (iVar83 <= iVar27) {
                  iVar83 = iVar27;
                }
                if ((((iVar84 != CONCAT13(p.x._3_1_,
                                          CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))) ||
                     (iVar88 != CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))
                                        ))) ||
                    (iVar89 != CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                    )) || (((iVar65 != CONCAT22(min.y,min.x) ||
                            (iVar85 != CONCAT22(sStack_172,sStack_174))) ||
                           (iVar83 != CONCAT22(sStack_16e,sStack_170))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<int>]"
                  ;
                  goto LAB_00113118;
                }
              }
              iVar50 = iVar50 + 1;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V3i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_2._state._0_2_ = 0x5a5a;
            rand_2._state._2_2_ = 0x5a5a;
            rand_2._state._4_2_ = 0;
            rand_2._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              iVar83 = 3;
              while (bVar49 = iVar83 != 0, iVar83 = iVar83 + -1, bVar49) {
                Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
              }
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              local_68._0_8_ = -0x8000000000000000;
              lVar76 = 0x7fffffffffffffff;
              lVar80 = 0x7fffffffffffffff;
              lVar52 = 0x7fffffffffffffff;
              lVar86 = local_68._0_8_;
              lVar64 = local_68._0_8_;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                local_c8._0_4_ = iVar83;
                for (lVar77 = 0; lVar77 != 3; lVar77 = lVar77 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_2,-12345.0,12345.0);
                  *(long *)(&max + lVar77 * 2) = (long)fVar90;
                }
                if (iVar83 == 0) {
                  p.x._0_1_ = (char)max.x;
                  p.x._1_1_ = (char)((ushort)max.x >> 8);
                  p.x._2_1_ = (char)max.y;
                  p.x._3_1_ = (char)((ushort)max.y >> 8);
                  local_1a8._0_4_ = local_108;
                  local_1a8._4_4_ = fStack_104;
                  min.x = max.x;
                  min.y = max.y;
                  sStack_174 = sStack_114;
                  sStack_172 = sStack_112;
                  sStack_170 = sStack_110;
                  sStack_16e = sStack_10e;
                  sStack_16c = sStack_10c;
                  sStack_16a = sStack_10a;
                  local_168 = local_108;
                  fStack_164 = fStack_104;
                  p.y._0_1_ = uVar32;
                  p.y._1_1_ = uVar39;
                  p.y._2_1_ = uVar30;
                  p.y._3_1_ = uVar36;
                  p.z._0_1_ = uVar29;
                  p.z._1_1_ = uVar31;
                  p.z._2_1_ = uVar33;
                  p.z._3_1_ = uVar37;
                  acStack_1ac[0] = cVar35;
                  acStack_1ac[1] = cVar43;
                  acStack_1ac[2] = cVar45;
                  acStack_1ac[3] = cVar47;
                }
                for (lVar77 = 0; lVar77 != 3; lVar77 = lVar77 + 1) {
                  lVar87 = *(long *)(&max + lVar77 * 2);
                  lVar63 = *(long *)(&p.x + lVar77 * 2);
                  if (lVar87 < *(long *)(&p.x + lVar77 * 2)) {
                    lVar63 = lVar87;
                  }
                  *(long *)(&p.x + lVar77 * 2) = lVar63;
                  if (lVar87 < *(long *)(&min + lVar77 * 2)) {
                    lVar87 = *(long *)(&min + lVar77 * 2);
                  }
                  *(long *)(&min + lVar77 * 2) = lVar87;
                }
                lVar77 = CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)));
                if (lVar77 < lVar76) {
                  lVar76 = lVar77;
                }
                lVar87 = CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)));
                if (lVar87 < lVar52) {
                  lVar52 = lVar87;
                }
                lVar63 = CONCAT44(fStack_104,local_108);
                if (lVar63 < lVar80) {
                  lVar80 = lVar63;
                }
                if (lVar64 <= lVar77) {
                  lVar64 = lVar77;
                }
                if (lVar86 <= lVar87) {
                  lVar86 = lVar87;
                }
                if ((long)local_68._0_8_ <= lVar63) {
                  local_68._0_8_ = lVar63;
                }
                if (((lVar76 != CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))))) ||
                    (lVar52 != CONCAT17(acStack_1ac[3],
                                        CONCAT16(acStack_1ac[2],
                                                 CONCAT15(acStack_1ac[1],
                                                          CONCAT14(acStack_1ac[0],
                                                                   CONCAT13(p.z._3_1_,
                                                                            CONCAT12(p.z._2_1_,
                                                                                     CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))))) ||
                   ((lVar80 != CONCAT44(local_1a8._4_4_,(float)local_1a8) ||
                    (((lVar64 != CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))) ||
                      (lVar86 != CONCAT26(sStack_16a,
                                          CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))) ||
                     (local_68._0_8_ != CONCAT44(fStack_164,local_168))))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<long>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V3f");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                VVar91 = (Vec2<short>)Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                (&min)[lVar52] = VVar91;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = -3.4028235e+38;
              local_1a8._4_4_ = -3.4028235e+38;
              Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                        ((Box<Imath_3_2::Vec3<float>_> *)&p,(Vec3<float> *)&min);
              fVar90 = (float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
              fVar118 = (float)CONCAT22(min.y,min.x);
              if ((fVar90 != fVar118) || (NAN(fVar90) || NAN(fVar118))) {
LAB_00113ffa:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<float>]"
                ;
                goto LAB_00114054;
              }
              fVar90 = (float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)));
              fVar151 = (float)CONCAT22(sStack_172,sStack_174);
              if ((fVar90 != fVar151) ||
                 ((NAN(fVar90) || NAN(fVar151) ||
                  (fVar90 = (float)CONCAT13(p.z._3_1_,
                                            CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))),
                  auVar158._4_4_ =
                       -(uint)(fVar118 ==
                              (float)(CONCAT17(acStack_1ac[3],
                                               CONCAT16(acStack_1ac[2],
                                                        CONCAT15(acStack_1ac[1],
                                                                 CONCAT14(acStack_1ac[0],fVar90))))
                                     >> 0x20)),
                  auVar158._0_4_ = -(uint)((float)CONCAT22(sStack_16e,sStack_170) == fVar90),
                  auVar158._8_4_ = -(uint)(fVar151 == (float)local_1a8),
                  auVar158._12_4_ =
                       -(uint)((float)CONCAT22(sStack_16e,sStack_170) == local_1a8._4_4_),
                  iVar83 = movmskps(extraout_EAX,auVar158), iVar83 != 0xf)))) goto LAB_00113ffa;
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0x7f;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0x7f;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0x7f;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0x7f;
              acStack_1ac[3] = 0xff;
              local_1a8._0_4_ = -3.4028235e+38;
              local_1a8._4_4_ = -3.4028235e+38;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  *(float *)((long)&rand_2._state + lVar52 * 4) = fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  sStack_112 = rand_2._state._6_2_;
                  sStack_110 = sStack_130;
                  sStack_10e = sStack_12e;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                }
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                  VVar60 = VVar91;
                  if ((float)(&min)[lVar52] <= (float)VVar91) {
                    VVar60 = (&min)[lVar52];
                  }
                  (&min)[lVar52] = VVar60;
                  if ((float)VVar91 <= (float)(&max)[lVar52]) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                }
                Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                          ((Box<Imath_3_2::Vec3<float>_> *)&p,(Vec3<float> *)&rand_2);
                fVar90 = (float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                        );
                if ((((fVar90 != (float)CONCAT22(min.y,min.x)) ||
                     (NAN(fVar90) || NAN((float)CONCAT22(min.y,min.x)))) ||
                    (fVar90 = (float)CONCAT13(p.y._3_1_,
                                              CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))),
                    fVar90 != (float)CONCAT22(sStack_172,sStack_174))) ||
                   (((((NAN(fVar90) || NAN((float)CONCAT22(sStack_172,sStack_174)) ||
                       (fVar90 = (float)CONCAT13(p.z._3_1_,
                                                 CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))),
                       fVar90 != (float)CONCAT22(sStack_16e,sStack_170))) ||
                      ((NAN(fVar90) || NAN((float)CONCAT22(sStack_16e,sStack_170)) ||
                       ((fVar90 = (float)CONCAT13(acStack_1ac[3],
                                                  CONCAT12(acStack_1ac[2],
                                                           CONCAT11(acStack_1ac[1],acStack_1ac[0])))
                        , fVar90 != (float)CONCAT22(max.y,max.x) ||
                        (NAN(fVar90) || NAN((float)CONCAT22(max.y,max.x)))))))) ||
                     ((float)local_1a8 != (float)CONCAT22(sStack_112,sStack_114))) ||
                    (((NAN((float)local_1a8) || NAN((float)CONCAT22(sStack_112,sStack_114)) ||
                      (local_1a8._4_4_ != (float)CONCAT22(sStack_10e,sStack_110))) ||
                     (NAN(local_1a8._4_4_) || NAN((float)CONCAT22(sStack_10e,sStack_110)))))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<float>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V3d");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            local_88._8_8_ = 0x7fefffffffffffff;
            local_88._0_8_ = 0x7fefffffffffffff;
            local_68._8_8_ = 0xffefffffffffffff;
            local_68._0_8_ = 0xffefffffffffffff;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                *(double *)(&min + lVar52 * 2) = (double)fVar90;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = -NAN;
              local_198[0] = -NAN;
              local_198[1] = -NAN;
              local_198[2] = -NAN;
              local_198[3] = -NAN;
              Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                        ((Box<Imath_3_2::Vec3<double>_> *)&p,(Vec3<double> *)&min);
              dVar120 = (double)CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))));
              dVar119 = (double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)));
              if ((dVar120 != dVar119) || (NAN(dVar120) || NAN(dVar119))) {
LAB_00114011:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<double>]"
                ;
                goto LAB_00114054;
              }
              dVar120 = (double)CONCAT17(acStack_1ac[3],
                                         CONCAT16(acStack_1ac[2],
                                                  CONCAT15(acStack_1ac[1],
                                                           CONCAT14(acStack_1ac[0],
                                                                    CONCAT13(p.z._3_1_,
                                                                             CONCAT12(p.z._2_1_,
                                                                                      CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_)))))));
              dVar152 = (double)CONCAT26(sStack_16a,
                                         CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170)));
              if ((dVar120 != dVar152) || (NAN(dVar120) || NAN(dVar152))) goto LAB_00114011;
              dVar120 = (double)CONCAT44(fStack_164,local_168);
              if (((((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) != dVar120) ||
                   (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) || NAN(dVar120))) ||
                  ((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) != dVar119)) ||
                 ((((NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)) || NAN(dVar119) ||
                    ((double)CONCAT44(local_198[1],local_198[0]) != dVar152)) ||
                   (NAN((double)CONCAT44(local_198[1],local_198[0])) || NAN(dVar152))) ||
                  (((double)CONCAT44(local_198[3],local_198[2]) != dVar120 ||
                   (NAN((double)CONCAT44(local_198[3],local_198[2])) || NAN(dVar120)))))))
              goto LAB_00114011;
            }
            iVar50 = 0;
            while( true ) {
              sVar79 = sStack_16a;
              sVar78 = sStack_16c;
              sStack_16c = SUB42(fStack_12c,0);
              sVar81 = sStack_16c;
              sStack_16a = (short)((uint)fStack_12c >> 0x10);
              sVar82 = sStack_16a;
              sStack_16c = sVar78;
              sStack_16a = sVar79;
              if (iVar50 == 10) break;
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = -NAN;
              local_198[0] = -NAN;
              local_198[1] = -NAN;
              local_198[2] = -NAN;
              local_198[3] = -NAN;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  (&rand_2)[lVar52]._state = (unsigned_long)(double)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  local_168 = local_128;
                  fStack_164 = fStack_124;
                  sStack_112 = rand_2._state._6_2_;
                  local_108 = local_128;
                  fStack_104 = fStack_124;
                  sStack_16c = sVar81;
                  sStack_16a = sVar82;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                  sStack_110 = sStack_170;
                  sStack_10e = sStack_16e;
                  sStack_10c = sVar81;
                  sStack_10a = sVar82;
                }
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  dVar119 = (double)(&rand_2)[lVar52]._state;
                  dVar120 = dVar119;
                  if (*(double *)(&min + lVar52 * 2) <= dVar119) {
                    dVar120 = *(double *)(&min + lVar52 * 2);
                  }
                  *(double *)(&min + lVar52 * 2) = dVar120;
                  if (dVar119 <= *(double *)(&max + lVar52 * 2)) {
                    dVar119 = *(double *)(&max + lVar52 * 2);
                  }
                  *(double *)(&max + lVar52 * 2) = dVar119;
                }
                Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                          ((Box<Imath_3_2::Vec3<double>_> *)&p,(Vec3<double> *)&rand_2);
                dVar120 = (double)CONCAT17(p.y._3_1_,
                                           CONCAT16(p.y._2_1_,
                                                    CONCAT15(p.y._1_1_,
                                                             CONCAT14(p.y._0_1_,
                                                                      CONCAT13(p.x._3_1_,
                                                                               CONCAT12(p.x._2_1_,
                                                                                        CONCAT11(p.x
                                                  ._1_1_,p.x._0_1_)))))));
                if ((((dVar120 !=
                       (double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)))) ||
                     (NAN(dVar120) ||
                      NAN((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))))))
                    || (((dVar120 = (double)CONCAT17(acStack_1ac[3],
                                                     CONCAT16(acStack_1ac[2],
                                                              CONCAT15(acStack_1ac[1],
                                                                       CONCAT14(acStack_1ac[0],
                                                                                CONCAT13(p.z._3_1_,
                                                                                         CONCAT12(p.
                                                  z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))))))),
                         dVar120 !=
                         (double)CONCAT26(sStack_16a,
                                          CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))) ||
                         (((((NAN(dVar120) ||
                              NAN((double)CONCAT26(sStack_16a,
                                                   CONCAT24(sStack_16c,
                                                            CONCAT22(sStack_16e,sStack_170)))) ||
                             ((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                              (double)CONCAT44(fStack_164,local_168))) ||
                            (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) ||
                             NAN((double)CONCAT44(fStack_164,local_168)))) ||
                           (((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                             (double)CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)))
                            || (NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)) ||
                                NAN((double)CONCAT26(sStack_112,
                                                     CONCAT24(sStack_114,CONCAT22(max.y,max.x)))))))
                           ) || ((double)CONCAT44(local_198[1],local_198[0]) !=
                                 (double)CONCAT26(sStack_10a,
                                                  CONCAT24(sStack_10c,
                                                           CONCAT22(sStack_10e,sStack_110))))))) ||
                        ((NAN((double)CONCAT44(local_198[1],local_198[0])) ||
                          NAN((double)CONCAT26(sStack_10a,
                                               CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)))
                             ) || ((double)CONCAT44(local_198[3],local_198[2]) !=
                                   (double)CONCAT44(fStack_104,local_108))))))) ||
                   (NAN((double)CONCAT44(local_198[3],local_198[2])) ||
                    NAN((double)CONCAT44(fStack_104,local_108)))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec3<double>]"
                  ;
                  goto LAB_00113118;
                }
              }
              iVar50 = iVar50 + 1;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V4s");
            std::endl<char,std::char_traits<char>>(poVar51);
            min.x = 0x5a5a;
            min.y = 0x5a5a;
            sStack_174 = 0;
            sStack_172 = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&min,-12345.0,12345.0);
                (&max.x)[lVar52] = (short)(int)fVar90;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0x7f;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0x7f;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0x80;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = 0x80;
              acStack_1ac[2] = 0;
              acStack_1ac[3] = 0x80;
              Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                        ((Box<Imath_3_2::Vec4<short>_> *)&p,(Vec4<short> *)&max);
              uVar16 = CONCAT11(p.x._1_1_,p.x._0_1_);
              if (((uVar16 != max.x) || (CONCAT11(p.x._3_1_,p.x._2_1_) != max.y)) ||
                 (CONCAT11(p.y._1_1_,p.y._0_1_) != sStack_114)) {
LAB_00113f7e:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<short>]"
                ;
                goto LAB_00114054;
              }
              sVar53 = CONCAT11(p.y._3_1_,p.y._2_1_);
              uVar11 = CONCAT13(p.z._1_1_,CONCAT12(p.z._0_1_,sVar53));
              uVar17 = CONCAT15(p.z._3_1_,CONCAT14(p.z._2_1_,uVar11));
              auVar128._0_2_ = -(ushort)(sStack_112 == sVar53);
              sVar148 = -(ushort)(uVar16 == (ushort)((uint)uVar11 >> 0x10));
              sVar149 = -(ushort)(CONCAT11(p.x._3_1_,p.x._2_1_) == (short)((uint6)uVar17 >> 0x20));
              uVar150 = -(ushort)(CONCAT11(p.y._1_1_,p.y._0_1_) ==
                                 (short)(CONCAT17(acStack_1ac[1],CONCAT16(acStack_1ac[0],uVar17)) >>
                                        0x30));
              auVar129._0_10_ = CONCAT28(0xffff,(ulong)uVar150 << 0x30);
              auVar130._10_2_ = 0xffff;
              auVar130._0_10_ = auVar129._0_10_;
              auVar130._12_2_ = uVar150;
              auVar130._14_2_ = uVar150;
              auVar129._12_4_ = auVar130._12_4_;
              auVar129._10_2_ = sVar149;
              auVar128._8_8_ =
                   (undefined8)(CONCAT64(auVar129._10_6_,CONCAT22(sVar149,uVar150)) >> 0x10);
              auVar128._6_2_ = sVar148;
              auVar128._4_2_ = sVar148;
              auVar128._2_2_ = auVar128._0_2_;
              iVar83 = movmskps((uint)uVar16,auVar128);
              if ((iVar83 != 0xf) || (CONCAT11(acStack_1ac[3],acStack_1ac[2]) != sVar53))
              goto LAB_00113f7e;
            }
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0x7f;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0x7f;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0;
              p.z._1_1_ = 0x80;
              p.z._2_1_ = 0;
              p.z._3_1_ = 0x80;
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = 0x80;
              acStack_1ac[2] = 0;
              acStack_1ac[3] = 0x80;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&min,-12345.0,12345.0);
                  *(short *)((long)&rand_8._state + lVar52 * 2) = (short)(int)fVar90;
                }
                if (iVar83 == 0) {
                  max.x = (short)rand_8._state;
                  max.y = rand_8._state._2_2_;
                  sStack_114 = rand_8._state._4_2_;
                  sStack_112 = rand_8._state._6_2_;
                  rand_2._state._6_2_ = rand_8._state._6_2_;
                  rand_2._state._0_2_ = max.x;
                  rand_2._state._2_2_ = max.y;
                  rand_2._state._4_2_ = sStack_114;
                }
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  sVar53 = *(short *)((long)&rand_8._state + lVar52 * 2);
                  sVar148 = (&max.x)[lVar52];
                  if (sVar53 < (&max.x)[lVar52]) {
                    sVar148 = sVar53;
                  }
                  (&max.x)[lVar52] = sVar148;
                  sVar148 = *(short *)((long)&rand_2._state + lVar52 * 2);
                  if (sVar53 < sVar148) {
                    sVar53 = sVar148;
                  }
                  *(short *)((long)&rand_2._state + lVar52 * 2) = sVar53;
                }
                Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                          ((Box<Imath_3_2::Vec4<short>_> *)&p,(Vec4<short> *)&rand_8);
                if ((((CONCAT11(p.x._1_1_,p.x._0_1_) != max.x) ||
                     (CONCAT11(p.x._3_1_,p.x._2_1_) != max.y)) ||
                    (CONCAT11(p.y._1_1_,p.y._0_1_) != sStack_114)) ||
                   (((CONCAT11(p.y._3_1_,p.y._2_1_) != sStack_112 ||
                     (CONCAT11(p.z._1_1_,p.z._0_1_) != (short)rand_2._state)) ||
                    ((CONCAT11(p.z._3_1_,p.z._2_1_) != rand_2._state._2_2_ ||
                     ((CONCAT11(acStack_1ac[1],acStack_1ac[0]) != rand_2._state._4_2_ ||
                      (CONCAT11(acStack_1ac[3],acStack_1ac[2]) != rand_2._state._6_2_)))))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<short>]"
                  ;
                  goto LAB_00113118;
                }
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V4i");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                (&min)[lVar52] = (Vec2<short>)(int)fVar90;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = (float)DAT_00153290;
              local_1a8._4_4_ = DAT_00153290._4_4_;
              uStack_1a0._0_4_ = DAT_00153290._8_4_;
              uStack_1a0._4_4_ = DAT_00153290._12_4_;
              Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                        ((Box<Imath_3_2::Vec4<int>_> *)&p,(Vec4<int> *)&min);
              fVar90 = (float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
              if ((((fVar90 != (float)CONCAT22(min.y,min.x)) ||
                   (CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))) != 0)) ||
                  (fVar118 = (float)CONCAT13(p.z._3_1_,
                                             CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))),
                  fVar118 != (float)CONCAT22(sStack_16e,sStack_170))) ||
                 (((fVar151 = (float)CONCAT13(acStack_1ac[3],
                                              CONCAT12(acStack_1ac[2],
                                                       CONCAT11(acStack_1ac[1],acStack_1ac[0]))),
                   fVar151 != (float)CONCAT22(sVar79,sVar78) || ((float)local_1a8 != fVar90)) ||
                  ((local_1a8._4_4_ != 0.0 ||
                   (((float)uStack_1a0 != fVar118 || (uStack_1a0._4_4_ != fVar151)))))))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<int>]"
                ;
                goto LAB_00114054;
              }
            }
            auVar93 = _DAT_00153290;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0x7f;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0x7f;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = auVar93._0_4_;
              local_1a8._4_4_ = auVar93._4_4_;
              uStack_1a0._0_4_ = auVar93._8_4_;
              uStack_1a0._4_4_ = auVar93._12_4_;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  *(int *)((long)&rand_2._state + lVar52 * 4) = (int)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  max.x = (short)rand_2._state;
                  max.y = rand_2._state._2_2_;
                  sStack_114 = rand_2._state._4_2_;
                  sStack_112 = rand_2._state._6_2_;
                  sStack_110 = sStack_130;
                  sStack_10e = sStack_12e;
                  sStack_16c = sVar81;
                  sStack_16a = sVar82;
                  sStack_10c = sVar81;
                  sStack_10a = sVar82;
                }
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                  VVar60 = (&min)[lVar52];
                  if ((int)VVar91 < (int)(&min)[lVar52]) {
                    VVar60 = VVar91;
                  }
                  (&min)[lVar52] = VVar60;
                  if ((int)VVar91 < (int)(&max)[lVar52]) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                }
                Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                          ((Box<Imath_3_2::Vec4<int>_> *)&p,(Vec4<int> *)&rand_2);
                if (((((CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))) !=
                        CONCAT22(min.y,min.x)) ||
                      (CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))) !=
                       CONCAT22(sStack_172,sStack_174))) ||
                     (CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))) !=
                      CONCAT22(sStack_16e,sStack_170))) ||
                    ((CONCAT13(acStack_1ac[3],
                               CONCAT12(acStack_1ac[2],CONCAT11(acStack_1ac[1],acStack_1ac[0]))) !=
                      CONCAT22(sStack_16a,sStack_16c) ||
                     ((float)local_1a8 != (float)CONCAT22(max.y,max.x))))) ||
                   ((local_1a8._4_4_ != (float)CONCAT22(sStack_112,sStack_114) ||
                    (((float)uStack_1a0 != (float)CONCAT22(sStack_10e,sStack_110) ||
                     (uStack_1a0._4_4_ != (float)CONCAT22(sStack_10a,sStack_10c))))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<int>]"
                  ;
                  goto LAB_00113118;
                }
                auVar93 = _DAT_00153290;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V4i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            local_c8._0_8_ = 0x8000000000000000;
            auVar93 = local_c8;
            for (iVar50 = 0; uVar55 = 0, iVar50 != 10; iVar50 = iVar50 + 1) {
              for (; uVar55 != 4; uVar55 = uVar55 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                *(long *)(&min + uVar55 * 2) = (long)fVar90;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = 0.0;
              local_198[1] = -0.0;
              stack0xfffffffffffffe80 = -0.0;
              local_188._0_8_ = 0x8000000000000000;
              local_198[2] = local_198[0];
              local_198[3] = local_198[1];
              Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                        ((Box<Imath_3_2::Vec4<long>_> *)&p,(Vec4<long> *)&min);
              lVar52 = CONCAT17(p.y._3_1_,
                                CONCAT16(p.y._2_1_,
                                         CONCAT15(p.y._1_1_,
                                                  CONCAT14(p.y._0_1_,
                                                           CONCAT13(p.x._3_1_,
                                                                    CONCAT12(p.x._2_1_,
                                                                             CONCAT11(p.x._1_1_,
                                                                                      p.x._0_1_)))))
                                        ));
              if ((((lVar52 != CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)))) ||
                   (lVar86 = CONCAT17(acStack_1ac[3],
                                      CONCAT16(acStack_1ac[2],
                                               CONCAT15(acStack_1ac[1],
                                                        CONCAT14(acStack_1ac[0],
                                                                 CONCAT13(p.z._3_1_,
                                                                          CONCAT12(p.z._2_1_,
                                                                                   CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))),
                   lVar86 != CONCAT26(sStack_16a,
                                      CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))) ||
                  (CONCAT44(local_1a8._4_4_,(float)local_1a8) != CONCAT44(fStack_164,local_168))) ||
                 (((CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) != CONCAT44(fStack_15c,fStack_160)
                   || (CONCAT44(local_198[1],local_198[0]) != lVar52)) ||
                  ((CONCAT44(local_198[3],local_198[2]) != lVar86 ||
                   ((local_188._0_8_ != CONCAT44(local_1a8._4_4_,(float)local_1a8) ||
                    (stack0xfffffffffffffe80 != (double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)
                    )))))))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<long>]"
                ;
                goto LAB_00114054;
              }
            }
            while (iVar50 = (int)uVar55, iVar50 != 10) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xff;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xff;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = 0.0;
              local_198[1] = -0.0;
              stack0xfffffffffffffe80 = -0.0;
              local_188._0_8_ = 0x8000000000000000;
              local_198[2] = local_198[0];
              local_198[3] = local_198[1];
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  (&rand_2)[lVar52]._state = (long)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  local_168 = local_128;
                  fStack_164 = fStack_124;
                  fStack_160 = fStack_120;
                  fStack_15c = fStack_11c;
                  sStack_112 = rand_2._state._6_2_;
                  local_108 = local_128;
                  fStack_104 = fStack_124;
                  fStack_100 = fStack_120;
                  fStack_fc = fStack_11c;
                  sStack_16c = sVar81;
                  sStack_16a = sVar82;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                  sStack_110 = sStack_170;
                  sStack_10e = sStack_16e;
                  sStack_10c = sVar81;
                  sStack_10a = sVar82;
                }
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  uVar56 = (&rand_2)[lVar52]._state;
                  uVar62 = *(unsigned_long *)(&min + lVar52 * 2);
                  if ((long)uVar56 < (long)*(unsigned_long *)(&min + lVar52 * 2)) {
                    uVar62 = uVar56;
                  }
                  *(unsigned_long *)(&min + lVar52 * 2) = uVar62;
                  if ((long)uVar56 < (long)*(unsigned_long *)(&max + lVar52 * 2)) {
                    uVar56 = *(unsigned_long *)(&max + lVar52 * 2);
                  }
                  *(unsigned_long *)(&max + lVar52 * 2) = uVar56;
                }
                Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                          ((Box<Imath_3_2::Vec4<long>_> *)&p,(Vec4<long> *)&rand_2);
                if ((((CONCAT17(p.y._3_1_,
                                CONCAT16(p.y._2_1_,
                                         CONCAT15(p.y._1_1_,
                                                  CONCAT14(p.y._0_1_,
                                                           CONCAT13(p.x._3_1_,
                                                                    CONCAT12(p.x._2_1_,
                                                                             CONCAT11(p.x._1_1_,
                                                                                      p.x._0_1_)))))
                                        )) !=
                       CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)))) ||
                     (CONCAT17(acStack_1ac[3],
                               CONCAT16(acStack_1ac[2],
                                        CONCAT15(acStack_1ac[1],
                                                 CONCAT14(acStack_1ac[0],
                                                          CONCAT13(p.z._3_1_,
                                                                   CONCAT12(p.z._2_1_,
                                                                            CONCAT11(p.z._1_1_,
                                                                                     p.z._0_1_))))))
                              ) !=
                      CONCAT26(sStack_16a,CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))) ||
                    (CONCAT44(local_1a8._4_4_,(float)local_1a8) != CONCAT44(fStack_164,local_168)))
                   || (((CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                         CONCAT44(fStack_15c,fStack_160) ||
                        (CONCAT44(local_198[1],local_198[0]) !=
                         CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x))))) ||
                       ((CONCAT44(local_198[3],local_198[2]) !=
                         CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)))
                        || ((local_188._0_8_ != CONCAT44(fStack_104,local_108) ||
                            (stack0xfffffffffffffe80 != (double)CONCAT44(fStack_fc,fStack_100)))))))
                      )) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<long>]"
                  ;
                  goto LAB_00113118;
                }
              }
              uVar55 = (ulong)(iVar50 + 1);
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V4f");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                VVar91 = (Vec2<short>)Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                (&min)[lVar52] = VVar91;
              }
              p.x._0_1_ = DAT_001532c0;
              p.x._1_1_ = DAT_001532c0._1_1_;
              p.x._2_1_ = DAT_001532c0._2_1_;
              p.x._3_1_ = DAT_001532c0._3_1_;
              p.y._0_1_ = DAT_001532c0._4_1_;
              p.y._1_1_ = DAT_001532c0._5_1_;
              p.y._2_1_ = DAT_001532c0._6_1_;
              p.y._3_1_ = DAT_001532c0._7_1_;
              p.z._0_1_ = DAT_001532c0._8_1_;
              p.z._1_1_ = DAT_001532c0._9_1_;
              p.z._2_1_ = DAT_001532c0._10_1_;
              p.z._3_1_ = DAT_001532c0._11_1_;
              acStack_1ac[0] = DAT_001532c0._12_1_;
              acStack_1ac[1] = DAT_001532c0._13_1_;
              acStack_1ac[2] = DAT_001532c0._14_1_;
              acStack_1ac[3] = DAT_001532c0._15_1_;
              local_1a8._0_4_ = -3.4028235e+38;
              local_1a8._4_4_ = -3.4028235e+38;
              uStack_1a0._0_4_ = -3.4028235e+38;
              uStack_1a0._4_4_ = -3.4028235e+38;
              Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                        ((Box<Imath_3_2::Vec4<float>_> *)&p,(Vec4<float> *)&min);
              fVar90 = (float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
              fVar118 = (float)CONCAT22(min.y,min.x);
              if ((fVar90 != fVar118) || (NAN(fVar90) || NAN(fVar118))) {
LAB_00113fcc:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<float>]"
                ;
                goto LAB_00114054;
              }
              fVar90 = (float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)));
              fVar151 = (float)CONCAT22(sStack_172,sStack_174);
              if ((fVar90 != fVar151) || (NAN(fVar90) || NAN(fVar151))) goto LAB_00113fcc;
              fVar90 = (float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
              fVar61 = (float)CONCAT22(sStack_16e,sStack_170);
              if ((fVar90 != fVar61) || (NAN(fVar90) || NAN(fVar61))) goto LAB_00113fcc;
              fVar90 = (float)CONCAT22(sStack_16a,sStack_16c);
              auVar170._4_4_ = -(uint)(fVar118 == (float)local_1a8);
              auVar170._0_4_ =
                   -(uint)(fVar90 ==
                          (float)CONCAT13(acStack_1ac[3],
                                          CONCAT12(acStack_1ac[2],
                                                   CONCAT11(acStack_1ac[1],acStack_1ac[0]))));
              auVar170._8_4_ = -(uint)(fVar151 == local_1a8._4_4_);
              auVar170._12_4_ = -(uint)(fVar61 == (float)uStack_1a0);
              iVar83 = movmskps(extraout_EAX_00,auVar170);
              if ((iVar83 != 0xf) ||
                 ((uStack_1a0._4_4_ != fVar90 || (NAN(uStack_1a0._4_4_) || NAN(fVar90)))))
              goto LAB_00113fcc;
            }
            auVar169 = _DAT_001532c0;
            for (iVar50 = 0; iVar50 != 10; iVar50 = iVar50 + 1) {
              p.x._0_1_ = auVar169[0];
              p.x._1_1_ = auVar169[1];
              p.x._2_1_ = auVar169[2];
              p.x._3_1_ = auVar169[3];
              p.y._0_1_ = auVar169[4];
              p.y._1_1_ = auVar169[5];
              p.y._2_1_ = auVar169[6];
              p.y._3_1_ = auVar169[7];
              p.z._0_1_ = auVar169[8];
              p.z._1_1_ = auVar169[9];
              p.z._2_1_ = auVar169[10];
              p.z._3_1_ = auVar169[0xb];
              acStack_1ac[0] = auVar169[0xc];
              acStack_1ac[1] = auVar169[0xd];
              acStack_1ac[2] = auVar169[0xe];
              acStack_1ac[3] = auVar169[0xf];
              local_1a8._0_4_ = -3.4028235e+38;
              local_1a8._4_4_ = -3.4028235e+38;
              uStack_1a0._0_4_ = -3.4028235e+38;
              uStack_1a0._4_4_ = -3.4028235e+38;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  *(float *)((long)&rand_2._state + lVar52 * 4) = fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  sStack_112 = rand_2._state._6_2_;
                  sStack_16c = sVar81;
                  sStack_16a = sVar82;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                  sStack_110 = sStack_170;
                  sStack_10e = sStack_16e;
                  sStack_10c = sVar81;
                  sStack_10a = sVar82;
                }
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                  VVar60 = VVar91;
                  if ((float)(&min)[lVar52] <= (float)VVar91) {
                    VVar60 = (&min)[lVar52];
                  }
                  (&min)[lVar52] = VVar60;
                  if ((float)VVar91 <= (float)(&max)[lVar52]) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                }
                Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                          ((Box<Imath_3_2::Vec4<float>_> *)&p,(Vec4<float> *)&rand_2);
                fVar90 = (float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                        );
                if ((((((((fVar90 != (float)CONCAT22(min.y,min.x)) ||
                         (NAN(fVar90) || NAN((float)CONCAT22(min.y,min.x)))) ||
                        (fVar90 = (float)CONCAT13(p.y._3_1_,
                                                  CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))
                        , fVar90 != (float)CONCAT22(sStack_172,sStack_174))) ||
                       ((NAN(fVar90) || NAN((float)CONCAT22(sStack_172,sStack_174)) ||
                        (fVar90 = (float)CONCAT13(p.z._3_1_,
                                                  CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                        , fVar90 != (float)CONCAT22(sStack_16e,sStack_170))))) ||
                      (NAN(fVar90) || NAN((float)CONCAT22(sStack_16e,sStack_170)))) ||
                     (((fVar90 = (float)CONCAT13(acStack_1ac[3],
                                                 CONCAT12(acStack_1ac[2],
                                                          CONCAT11(acStack_1ac[1],acStack_1ac[0]))),
                       fVar90 != (float)CONCAT22(sStack_16a,sStack_16c) ||
                       (NAN(fVar90) || NAN((float)CONCAT22(sStack_16a,sStack_16c)))) ||
                      (((float)local_1a8 != (float)CONCAT22(max.y,max.x) ||
                       (((NAN((float)local_1a8) || NAN((float)CONCAT22(max.y,max.x)) ||
                         (local_1a8._4_4_ != (float)CONCAT22(sStack_112,sStack_114))) ||
                        (NAN(local_1a8._4_4_) || NAN((float)CONCAT22(sStack_112,sStack_114))))))))))
                    || (((float)uStack_1a0 != (float)CONCAT22(sStack_10e,sStack_110) ||
                        (NAN((float)uStack_1a0) || NAN((float)CONCAT22(sStack_10e,sStack_110))))))
                   || ((uStack_1a0._4_4_ != (float)CONCAT22(sStack_10a,sStack_10c) ||
                       (NAN(uStack_1a0._4_4_) || NAN((float)CONCAT22(sStack_10a,sStack_10c)))))) {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<float>]"
                  ;
                  goto LAB_00113118;
                }
                auVar169 = _DAT_001532c0;
              }
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() point for type ");
            poVar51 = std::operator<<(poVar51,"V4d");
            std::endl<char,std::char_traits<char>>(poVar51);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            for (iVar50 = 0; uVar55 = 0, iVar50 != 10; iVar50 = iVar50 + 1) {
              for (; uVar55 != 4; uVar55 = uVar55 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                *(double *)(&min + uVar55 * 2) = (double)fVar90;
              }
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = -NAN;
              local_198[2] = -NAN;
              local_198[3] = -NAN;
              stack0xfffffffffffffe80 = -1.79769313486232e+308;
              local_188._0_8_ = 0xffefffffffffffff;
              Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                        ((Box<Imath_3_2::Vec4<double>_> *)&p,(Vec4<double> *)&min);
              dVar120 = (double)CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))));
              dVar119 = (double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)));
              if ((dVar120 != dVar119) || (NAN(dVar120) || NAN(dVar119))) {
LAB_00113fe3:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<double>]"
                ;
LAB_00114054:
                __assert_fail("b.min == p && b.max == p",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                              ,0xf8,pcVar58);
              }
              dVar120 = (double)CONCAT17(acStack_1ac[3],
                                         CONCAT16(acStack_1ac[2],
                                                  CONCAT15(acStack_1ac[1],
                                                           CONCAT14(acStack_1ac[0],
                                                                    CONCAT13(p.z._3_1_,
                                                                             CONCAT12(p.z._2_1_,
                                                                                      CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_)))))));
              dVar152 = (double)CONCAT26(sStack_16a,
                                         CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170)));
              if ((dVar120 != dVar152) || (NAN(dVar120) || NAN(dVar152))) goto LAB_00113fe3;
              dVar120 = (double)CONCAT44(fStack_164,local_168);
              if (((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) != dVar120) ||
                 (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) || NAN(dVar120)))
              goto LAB_00113fe3;
              dVar10 = (double)CONCAT44(fStack_15c,fStack_160);
              auVar21._8_4_ = local_198[0];
              auVar21._0_8_ = CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0);
              auVar21._12_4_ = local_198[1];
              auVar174._4_4_ = -(uint)(dVar119 == auVar21._8_8_);
              auVar174._0_4_ =
                   -(uint)(dVar10 == (double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0));
              auVar174._8_4_ = -(uint)(dVar152 == (double)CONCAT44(local_198[3],local_198[2]));
              auVar174._12_4_ = -(uint)(dVar120 == (double)local_188._0_8_);
              iVar83 = movmskps(extraout_EAX_01,auVar174);
              if (iVar83 != 0xf) goto LAB_00113fe3;
              if ((stack0xfffffffffffffe80 != dVar10) ||
                 (NAN(stack0xfffffffffffffe80) || NAN(dVar10))) goto LAB_00113fe3;
            }
            while (iVar50 = (int)uVar55, iVar50 != 10) {
              p.x._0_1_ = 0xff;
              p.x._1_1_ = 0xff;
              p.x._2_1_ = 0xff;
              p.x._3_1_ = 0xff;
              p.y._0_1_ = 0xff;
              p.y._1_1_ = 0xff;
              p.y._2_1_ = 0xef;
              p.y._3_1_ = 0x7f;
              p.z._0_1_ = 0xff;
              p.z._1_1_ = 0xff;
              p.z._2_1_ = 0xff;
              p.z._3_1_ = 0xff;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = 0xff;
              acStack_1ac[2] = 0xef;
              acStack_1ac[3] = 0x7f;
              local_1a8._0_4_ = -NAN;
              local_1a8._4_4_ = NAN;
              uStack_1a0._0_4_ = -NAN;
              uStack_1a0._4_4_ = NAN;
              local_198[0] = -NAN;
              local_198[1] = -NAN;
              local_198[2] = -NAN;
              local_198[3] = -NAN;
              stack0xfffffffffffffe80 = -1.79769313486232e+308;
              local_188._0_8_ = 0xffefffffffffffff;
              for (iVar83 = 0; iVar83 != iVar50; iVar83 = iVar83 + 1) {
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_8,-12345.0,12345.0);
                  (&rand_2)[lVar52]._state = (unsigned_long)(double)fVar90;
                }
                if (iVar83 == 0) {
                  min.x = (short)rand_2._state;
                  min.y = rand_2._state._2_2_;
                  sStack_174 = rand_2._state._4_2_;
                  sStack_172 = rand_2._state._6_2_;
                  sStack_170 = sStack_130;
                  sStack_16e = sStack_12e;
                  local_168 = local_128;
                  fStack_164 = fStack_124;
                  fStack_160 = fStack_120;
                  fStack_15c = fStack_11c;
                  sStack_112 = rand_2._state._6_2_;
                  fStack_fc = fStack_11c;
                  sStack_16c = sVar81;
                  sStack_16a = sVar82;
                  max.x = min.x;
                  max.y = min.y;
                  sStack_114 = sStack_174;
                  sStack_110 = sStack_170;
                  sStack_10e = sStack_16e;
                  sStack_10c = sVar81;
                  sStack_10a = sVar82;
                  local_108 = local_168;
                  fStack_104 = fStack_164;
                  fStack_100 = fStack_160;
                }
                for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                  dVar119 = (double)(&rand_2)[lVar52]._state;
                  dVar120 = dVar119;
                  if (*(double *)(&min + lVar52 * 2) <= dVar119) {
                    dVar120 = *(double *)(&min + lVar52 * 2);
                  }
                  *(double *)(&min + lVar52 * 2) = dVar120;
                  if (dVar119 <= *(double *)(&max + lVar52 * 2)) {
                    dVar119 = *(double *)(&max + lVar52 * 2);
                  }
                  *(double *)(&max + lVar52 * 2) = dVar119;
                }
                Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                          ((Box<Imath_3_2::Vec4<double>_> *)&p,(Vec4<double> *)&rand_2);
                dVar120 = (double)CONCAT17(p.y._3_1_,
                                           CONCAT16(p.y._2_1_,
                                                    CONCAT15(p.y._1_1_,
                                                             CONCAT14(p.y._0_1_,
                                                                      CONCAT13(p.x._3_1_,
                                                                               CONCAT12(p.x._2_1_,
                                                                                        CONCAT11(p.x
                                                  ._1_1_,p.x._0_1_)))))));
                if ((((((dVar120 !=
                         (double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)))) ||
                       (NAN(dVar120) ||
                        NAN((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))))
                       )) || (dVar120 = (double)CONCAT17(acStack_1ac[3],
                                                         CONCAT16(acStack_1ac[2],
                                                                  CONCAT15(acStack_1ac[1],
                                                                           CONCAT14(acStack_1ac[0],
                                                                                    CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                             , dVar120 !=
                               (double)CONCAT26(sStack_16a,
                                                CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))
                                               ))) ||
                     (((NAN(dVar120) ||
                        NAN((double)CONCAT26(sStack_16a,
                                             CONCAT24(sStack_16c,CONCAT22(sStack_16e,sStack_170))))
                       || ((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                           (double)CONCAT44(fStack_164,local_168))) ||
                      ((NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) ||
                        NAN((double)CONCAT44(fStack_164,local_168)) ||
                       (((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                         (double)CONCAT44(fStack_15c,fStack_160) ||
                        (NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)) ||
                         NAN((double)CONCAT44(fStack_15c,fStack_160)))))))))) ||
                    ((double)CONCAT44(local_198[1],local_198[0]) !=
                     (double)CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x))))) ||
                   (((NAN((double)CONCAT44(local_198[1],local_198[0])) ||
                      NAN((double)CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x))))
                     || ((double)CONCAT44(local_198[3],local_198[2]) !=
                         (double)CONCAT26(sStack_10a,
                                          CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110))))) ||
                    (NAN((double)CONCAT44(local_198[3],local_198[2])) ||
                     NAN((double)CONCAT26(sStack_10a,
                                          CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110))))))))
                {
LAB_00112f69:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByPoint(const char *) [T = Imath_3_2::Vec4<double>]"
                  ;
                  goto LAB_00113118;
                }
                if (((double)local_188._0_8_ != (double)CONCAT44(fStack_104,local_108)) ||
                   (NAN((double)local_188._0_8_) || NAN((double)CONCAT44(fStack_104,local_108))))
                goto LAB_00112f69;
                if ((stack0xfffffffffffffe80 != (double)CONCAT44(fStack_fc,fStack_100)) ||
                   (NAN(stack0xfffffffffffffe80) || NAN((double)CONCAT44(fStack_fc,fStack_100))))
                goto LAB_00112f69;
              }
              uVar55 = (ulong)(iVar50 + 1);
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V2s");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0;
            p.x._1_1_ = 0;
            p.x._2_1_ = 0;
            p.x._3_1_ = 0;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec2<short>>
                      ((vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_> *)
                       &p);
            std::_Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                           *)&p);
            p.x._0_1_ = 'Z';
            p.x._1_1_ = 'Z';
            p.x._2_1_ = 'Z';
            p.x._3_1_ = 'Z';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            local_b8 = ZEXT816(0x80008000);
            local_d8 = ZEXT816(0x7fff7fff);
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,0.0,999.0);
                *(short *)((long)&rand_2._state + lVar52 * 2) = (short)(int)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,1000.0,1999.0);
                *(short *)((long)&rand_8._state + lVar52 * 2) = (short)(int)fVar90;
              }
              min.x = local_d8._0_2_;
              sVar78 = min.x;
              min.y = local_d8._2_2_;
              sVar81 = min.y;
              max.x = local_b8._0_2_;
              sVar79 = max.x;
              max.y = local_b8._2_2_;
              sVar82 = max.y;
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                sVar53 = *(short *)((long)&rand_2._state + lVar52 * 2);
                sVar148 = (&min.x)[lVar52];
                if (sVar53 < (&min.x)[lVar52]) {
                  sVar148 = sVar53;
                }
                (&min.x)[lVar52] = sVar148;
                sVar53 = *(short *)((long)&rand_8._state + lVar52 * 2);
                if (sVar53 < (&max.x)[lVar52]) {
                  sVar53 = (&max.x)[lVar52];
                }
                (&max.x)[lVar52] = sVar53;
              }
              local_d8._0_2_ =
                   (ushort)((short)rand_2._state < sVar78) * (short)rand_2._state |
                   (ushort)((short)rand_2._state >= sVar78) * sVar78;
              local_d8._2_2_ =
                   (ushort)(rand_2._state._2_2_ < sVar81) * rand_2._state._2_2_ |
                   (ushort)(rand_2._state._2_2_ >= sVar81) * sVar81;
              local_d8._4_2_ = 0;
              local_d8._6_2_ = (ushort)((short)local_d8._6_2_ < 1) * local_d8._6_2_;
              local_d8._8_2_ = (ushort)((short)local_d8._8_2_ < 1) * local_d8._8_2_;
              local_d8._10_2_ = (ushort)((short)local_d8._10_2_ < 1) * local_d8._10_2_;
              local_d8._12_2_ = (ushort)((short)local_d8._12_2_ < 1) * local_d8._12_2_;
              local_d8._14_2_ = (ushort)((short)local_d8._14_2_ < 1) * local_d8._14_2_;
              if ((local_d8._0_2_ != min.x) || (local_d8._2_2_ != min.y)) {
LAB_0011405e:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<short>]"
                ;
                goto LAB_0011442d;
              }
              local_b8._0_2_ =
                   (ushort)(sVar79 < (short)rand_8._state) * (short)rand_8._state |
                   (ushort)(sVar79 >= (short)rand_8._state) * sVar79;
              local_b8._2_2_ =
                   (ushort)(sVar82 < rand_8._state._2_2_) * rand_8._state._2_2_ |
                   (ushort)(sVar82 >= rand_8._state._2_2_) * sVar82;
              local_b8._4_2_ = 0;
              local_b8._6_2_ = (ushort)(-1 < (short)local_b8._6_2_) * local_b8._6_2_;
              local_b8._8_2_ = (ushort)(-1 < (short)local_b8._8_2_) * local_b8._8_2_;
              local_b8._10_2_ = (ushort)(-1 < (short)local_b8._10_2_) * local_b8._10_2_;
              local_b8._12_2_ = (ushort)(-1 < (short)local_b8._12_2_) * local_b8._12_2_;
              local_b8._14_2_ = (ushort)(-1 < (short)local_b8._14_2_) * local_b8._14_2_;
              if ((local_b8._0_2_ != max.x) || (local_b8._2_2_ != max.y)) goto LAB_0011405e;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V2i");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0;
            p.x._1_1_ = 0;
            p.x._2_1_ = 0;
            p.x._3_1_ = 0;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec2<int>>
                      ((vector<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_> *)&p);
            std::_Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                           *)&p);
            p.x._0_1_ = 'Z';
            p.x._1_1_ = 'Z';
            p.x._2_1_ = 'Z';
            p.x._3_1_ = 'Z';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            iVar84 = -0x80000000;
            iVar83 = 0x7fffffff;
            iVar88 = 0x7fffffff;
            iVar89 = -0x80000000;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,0.0,999.0);
                *(int *)((long)&rand_2._state + lVar52 * 4) = (int)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,1000.0,1999.0);
                *(int *)((long)&rand_8._state + lVar52 * 4) = (int)fVar90;
              }
              min.x = (short)iVar83;
              min.y = (short)((uint)iVar83 >> 0x10);
              max.x = (short)iVar84;
              max.y = (short)((uint)iVar84 >> 0x10);
              sStack_114 = (short)iVar89;
              sStack_112 = (short)((uint)iVar89 >> 0x10);
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                VVar60 = (&min)[lVar52];
                if ((int)VVar91 < (int)(&min)[lVar52]) {
                  VVar60 = VVar91;
                }
                (&min)[lVar52] = VVar60;
                VVar91 = *(Vec2<short> *)((long)&rand_8._state + lVar52 * 4);
                if ((int)VVar91 < (int)(&max)[lVar52]) {
                  VVar91 = (&max)[lVar52];
                }
                (&max)[lVar52] = VVar91;
              }
              if (CONCAT22(rand_2._state._2_2_,(short)rand_2._state) < iVar83) {
                iVar83 = CONCAT22(rand_2._state._2_2_,(short)rand_2._state);
              }
              if (iVar84 <= CONCAT22(rand_8._state._2_2_,(short)rand_8._state)) {
                iVar84 = CONCAT22(rand_8._state._2_2_,(short)rand_8._state);
              }
              iVar65 = iVar88;
              if (CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_) < iVar88) {
                iVar65 = CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_);
              }
              iVar85 = iVar89;
              if (iVar89 <= CONCAT22(rand_8._state._6_2_,rand_8._state._4_2_)) {
                iVar85 = CONCAT22(rand_8._state._6_2_,rand_8._state._4_2_);
              }
              if ((((iVar83 != CONCAT22(min.y,min.x)) || (iVar65 != iVar88)) ||
                  (iVar84 != CONCAT22(max.y,max.x))) || (iVar85 != iVar89)) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<int>]"
                ;
                goto LAB_0011442d;
              }
              iVar88 = iVar65;
              iVar89 = iVar85;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V2i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = '\0';
            p.x._1_1_ = '\0';
            p.x._2_1_ = '\0';
            p.x._3_1_ = '\0';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec2<long>>
                      ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_> *)&p)
            ;
            std::_Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                           *)&p);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            local_c8._0_8_ = -0x8000000000000000;
            lVar52 = 0x7fffffffffffffff;
            lVar76 = 0x7fffffffffffffff;
            lVar86 = local_c8._0_8_;
            local_c8 = auVar93;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar80 = 0; lVar80 != 2; lVar80 = lVar80 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,0.0,999.0);
                *(long *)(&max + lVar80 * 2) = (long)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,1000.0,1999.0);
                (&rand_2)[lVar80]._state = (long)fVar90;
              }
              p.x._0_1_ = (char)lVar52;
              p.x._1_1_ = (char)((ulong)lVar52 >> 8);
              p.x._2_1_ = (char)((ulong)lVar52 >> 0x10);
              p.x._3_1_ = (char)((ulong)lVar52 >> 0x18);
              p.y._0_1_ = (char)((ulong)lVar52 >> 0x20);
              p.y._1_1_ = (char)((ulong)lVar52 >> 0x28);
              p.y._2_1_ = (char)((ulong)lVar52 >> 0x30);
              p.y._3_1_ = (char)((ulong)lVar52 >> 0x38);
              p.z._0_1_ = (char)lVar76;
              p.z._1_1_ = (char)((ulong)lVar76 >> 8);
              p.z._2_1_ = (char)((ulong)lVar76 >> 0x10);
              p.z._3_1_ = (char)((ulong)lVar76 >> 0x18);
              acStack_1ac[0] = (char)((ulong)lVar76 >> 0x20);
              acStack_1ac[1] = (char)((ulong)lVar76 >> 0x28);
              acStack_1ac[2] = (char)((ulong)lVar76 >> 0x30);
              acStack_1ac[3] = (char)((ulong)lVar76 >> 0x38);
              min.x = local_c8._0_2_;
              min.y = local_c8._2_2_;
              sStack_174 = local_c8._4_2_;
              sStack_172 = local_c8._6_2_;
              for (lVar80 = 0; lVar80 != 2; lVar80 = lVar80 + 1) {
                lVar64 = *(long *)(&p.x + lVar80 * 2);
                if (*(long *)(&max + lVar80 * 2) < *(long *)(&p.x + lVar80 * 2)) {
                  lVar64 = *(long *)(&max + lVar80 * 2);
                }
                *(long *)(&p.x + lVar80 * 2) = lVar64;
                uVar56 = (&rand_2)[lVar80]._state;
                if ((long)(&rand_2)[lVar80]._state < (long)*(unsigned_long *)(&min + lVar80 * 2)) {
                  uVar56 = *(unsigned_long *)(&min + lVar80 * 2);
                }
                *(unsigned_long *)(&min + lVar80 * 2) = uVar56;
              }
              lVar64 = CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)));
              lVar77 = CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)));
              lVar80 = CONCAT26(rand_2._state._6_2_,
                                CONCAT24(rand_2._state._4_2_,
                                         CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
              if (lVar64 < lVar52) {
                lVar52 = lVar64;
              }
              lVar64 = CONCAT44(fStack_12c,CONCAT22(sStack_12e,sStack_130));
              lVar87 = local_c8._0_8_;
              if ((long)local_c8._0_8_ <= lVar80) {
                lVar87 = lVar80;
              }
              local_c8._0_8_ = lVar87;
              if (lVar77 < lVar76) {
                lVar76 = lVar77;
              }
              lVar80 = lVar86;
              if (lVar86 <= lVar64) {
                lVar80 = lVar64;
              }
              if (((lVar52 != CONCAT17(p.y._3_1_,
                                       CONCAT16(p.y._2_1_,
                                                CONCAT15(p.y._1_1_,
                                                         CONCAT14(p.y._0_1_,
                                                                  CONCAT13(p.x._3_1_,
                                                                           CONCAT12(p.x._2_1_,
                                                                                    CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))))) ||
                  (lVar76 != CONCAT17(acStack_1ac[3],
                                      CONCAT16(acStack_1ac[2],
                                               CONCAT15(acStack_1ac[1],
                                                        CONCAT14(acStack_1ac[0],
                                                                 CONCAT13(p.z._3_1_,
                                                                          CONCAT12(p.z._2_1_,
                                                                                   CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))))) ||
                 ((lVar87 != CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))) ||
                  (lVar80 != lVar86)))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<long>]"
                ;
                goto LAB_0011442d;
              }
              lVar86 = lVar80;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V2f");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = '\0';
            p.x._1_1_ = '\0';
            p.x._2_1_ = '\0';
            p.x._3_1_ = '\0';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec2<float>>
                      ((vector<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_> *)
                       &p);
            lVar52 = CONCAT17(p.y._3_1_,
                              CONCAT16(p.y._2_1_,
                                       CONCAT15(p.y._1_1_,
                                                CONCAT14(p.y._0_1_,
                                                         CONCAT13(p.x._3_1_,
                                                                  CONCAT12(p.x._2_1_,
                                                                           CONCAT11(p.x._1_1_,
                                                                                    p.x._0_1_)))))))
            ;
            uVar55 = CONCAT17(acStack_1ac[3],
                              CONCAT16(acStack_1ac[2],
                                       CONCAT15(acStack_1ac[1],
                                                CONCAT14(acStack_1ac[0],
                                                         CONCAT13(p.z._3_1_,
                                                                  CONCAT12(p.z._2_1_,
                                                                           CONCAT11(p.z._1_1_,
                                                                                    p.z._0_1_)))))))
                     - lVar52 >> 3;
            for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
              uVar67 = 0;
              while (uVar73 = (ulong)uVar67, uVar73 < uVar55) {
                uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar54 * 8);
                fVar90 = (float)((uint)uVar8 ^ (uint)DAT_00153290);
                fVar118 = (float)((uint)((ulong)uVar8 >> 0x20) ^ DAT_00153290._4_4_);
                auVar97._0_8_ = CONCAT44(fVar118,fVar90);
                auVar97._8_4_ = DAT_00153290._8_4_;
                auVar97._12_4_ = DAT_00153290._12_4_;
                auVar131._8_4_ = DAT_00153290._8_4_;
                auVar131._0_8_ = auVar97._0_8_;
                auVar131._12_4_ = DAT_00153290._12_4_;
                auVar93 = minps(auVar131,_DAT_00153210);
                iVar50 = -(uint)(auVar93._0_4_ == fVar90);
                iVar83 = -(uint)(auVar93._4_4_ == fVar118);
                auVar133._4_4_ = iVar83;
                auVar133._0_4_ = iVar50;
                auVar133._8_4_ = iVar83;
                auVar133._12_4_ = iVar83;
                auVar132._8_8_ = auVar133._8_8_;
                auVar132._4_4_ = iVar50;
                auVar132._0_4_ = iVar50;
                iVar50 = movmskpd((int)pVVar72,auVar132);
                if (iVar50 != 3) {
LAB_00113039:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<float>]"
                  ;
                  goto LAB_00113263;
                }
                fVar151 = *(float *)(lVar52 + uVar73 * 8);
                fVar61 = fVar151;
                if (fVar151 <= -3.4028235e+38) {
                  fVar61 = -3.4028235e+38;
                }
                if ((fVar61 != fVar151) || (NAN(fVar61) || NAN(fVar151))) goto LAB_00113039;
                fVar61 = *(float *)(lVar52 + 4 + uVar73 * 8);
                fVar7 = fVar61;
                if (fVar61 <= -3.4028235e+38) {
                  fVar7 = -3.4028235e+38;
                }
                if ((fVar7 != fVar61) || (NAN(fVar7) || NAN(fVar61))) goto LAB_00113039;
                auVar93 = minps(_DAT_00153210,auVar97);
                iVar50 = -(uint)(auVar93._0_4_ == fVar90);
                iVar83 = -(uint)(auVar93._4_4_ == fVar118);
                auVar172._4_4_ = iVar83;
                auVar172._0_4_ = iVar50;
                auVar172._8_4_ = iVar83;
                auVar172._12_4_ = iVar83;
                auVar171._8_8_ = auVar172._8_8_;
                auVar171._4_4_ = iVar50;
                auVar171._0_4_ = iVar50;
                uVar71 = movmskpd(3,auVar171);
                pVVar72 = (Vec3<float> *)(ulong)uVar71;
                if (uVar71 != 3) goto LAB_00113053;
                fVar90 = -3.4028235e+38;
                if (-3.4028235e+38 <= fVar151) {
                  fVar90 = fVar151;
                }
                if ((fVar90 != fVar151) || (NAN(fVar90) || NAN(fVar151))) goto LAB_00113053;
                fVar90 = -3.4028235e+38;
                if (-3.4028235e+38 <= fVar61) {
                  fVar90 = fVar61;
                }
                uVar67 = uVar67 + 1;
                if ((fVar90 != fVar61) || (NAN(fVar90) || NAN(fVar61))) {
LAB_00113053:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<float>]"
                  ;
                  goto LAB_00113282;
                }
              }
            }
            std::_Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                           *)&p);
            p.x._0_1_ = 'Z';
            p.x._1_1_ = 'Z';
            p.x._2_1_ = 'Z';
            p.x._3_1_ = 'Z';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            local_d8 = ZEXT816(0xff7fffffff7fffff);
            auVar93 = _DAT_00153210;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,0.0,999.0);
                *(float *)((long)&rand_2._state + lVar52 * 4) = fVar90;
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,1000.0,1999.0);
                *(float *)((long)&rand_8._state + lVar52 * 4) = fVar90;
              }
              min.x = auVar93._0_2_;
              min.y = auVar93._2_2_;
              max.x = local_d8._0_2_;
              max.y = local_d8._2_2_;
              sStack_114 = local_d8._4_2_;
              sStack_112 = local_d8._6_2_;
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                if ((float)(&min)[lVar52] <= (float)VVar91) {
                  VVar91 = (&min)[lVar52];
                }
                (&min)[lVar52] = VVar91;
                VVar91 = *(Vec2<short> *)((long)&rand_8._state + lVar52 * 4);
                if ((float)VVar91 <= (float)(&max)[lVar52]) {
                  VVar91 = (&max)[lVar52];
                }
                (&max)[lVar52] = VVar91;
              }
              auVar98._2_2_ = rand_2._state._2_2_;
              auVar98._0_2_ = (short)rand_2._state;
              auVar98._4_2_ = rand_2._state._4_2_;
              auVar98._6_2_ = rand_2._state._6_2_;
              auVar98._8_8_ = 0;
              auVar169 = minps(auVar98,auVar93);
              if ((((auVar169._0_4_ != (float)CONCAT22(min.y,min.x)) ||
                   (NAN(auVar169._0_4_) || NAN((float)CONCAT22(min.y,min.x)))) ||
                  (auVar169._4_4_ != auVar93._4_4_)) || (NAN(auVar169._4_4_) || NAN(auVar93._4_4_)))
              {
LAB_001140ac:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<float>]"
                ;
                goto LAB_0011442d;
              }
              auVar134._2_2_ = rand_8._state._2_2_;
              auVar134._0_2_ = (short)rand_8._state;
              auVar134._4_2_ = rand_8._state._4_2_;
              auVar134._6_2_ = rand_8._state._6_2_;
              auVar134._8_8_ = 0;
              local_d8 = maxps(auVar134,local_d8);
              iVar83 = -(uint)((float)CONCAT22(max.y,max.x) == local_d8._0_4_);
              iVar88 = -(uint)((float)(CONCAT26(sStack_112,
                                                CONCAT24(sStack_114,CONCAT22(max.y,max.x))) >> 0x20)
                              == local_d8._4_4_);
              auVar160._4_4_ = iVar88;
              auVar160._0_4_ = iVar83;
              auVar160._8_4_ = iVar88;
              auVar160._12_4_ = iVar88;
              auVar159._8_8_ = auVar160._8_8_;
              auVar159._4_4_ = iVar83;
              auVar159._0_4_ = iVar83;
              iVar83 = movmskpd(2,auVar159);
              if (iVar83 != 3) goto LAB_001140ac;
              auVar93 = auVar169;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V2d");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = '\0';
            p.x._1_1_ = '\0';
            p.x._2_1_ = '\0';
            p.x._3_1_ = '\0';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec2<double>>
                      ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_> *
                       )&p);
            lVar52 = CONCAT17(p.y._3_1_,
                              CONCAT16(p.y._2_1_,
                                       CONCAT15(p.y._1_1_,
                                                CONCAT14(p.y._0_1_,
                                                         CONCAT13(p.x._3_1_,
                                                                  CONCAT12(p.x._2_1_,
                                                                           CONCAT11(p.x._1_1_,
                                                                                    p.x._0_1_)))))))
            ;
            uVar55 = CONCAT17(acStack_1ac[3],
                              CONCAT16(acStack_1ac[2],
                                       CONCAT15(acStack_1ac[1],
                                                CONCAT14(acStack_1ac[0],
                                                         CONCAT13(p.z._3_1_,
                                                                  CONCAT12(p.z._2_1_,
                                                                           CONCAT11(p.z._1_1_,
                                                                                    p.z._0_1_)))))))
                     - lVar52 >> 4;
            for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
              pdVar68 = (double *)((ulong)uVar54 * 0x10 + lVar52);
              uVar67 = 0;
              while (uVar67 < uVar55) {
                auVar135._0_8_ = -*pdVar68;
                auVar135._8_8_ = -pdVar68[1];
                auVar161._8_8_ = auVar135._8_8_;
                auVar161._0_8_ = auVar135._0_8_;
                auVar93 = minpd(auVar161,_DAT_00153230);
                auVar162._8_8_ = -(ulong)(auVar93._8_8_ == auVar135._8_8_);
                auVar162._0_8_ = -(ulong)(auVar93._0_8_ == auVar135._0_8_);
                iVar50 = movmskpd((int)in_R8,auVar162);
                if (iVar50 != 3) {
LAB_0011306d:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<double>]"
                  ;
                  goto LAB_00113263;
                }
                lVar86 = (ulong)uVar67 * 0x10;
                dVar120 = *(double *)(lVar52 + lVar86);
                dVar119 = dVar120;
                if (dVar120 <= -1.79769313486232e+308) {
                  dVar119 = -1.79769313486232e+308;
                }
                if ((dVar119 != dVar120) || (NAN(dVar119) || NAN(dVar120))) goto LAB_0011306d;
                dVar119 = *(double *)(lVar52 + 8 + lVar86);
                dVar152 = dVar119;
                if (dVar119 <= -1.79769313486232e+308) {
                  dVar152 = -1.79769313486232e+308;
                }
                if ((dVar152 != dVar119) || (NAN(dVar152) || NAN(dVar119))) goto LAB_0011306d;
                auVar93 = minpd(_DAT_00153230,auVar135);
                auVar173._8_8_ = -(ulong)(auVar93._8_8_ == auVar135._8_8_);
                auVar173._0_8_ = -(ulong)(auVar93._0_8_ == auVar135._0_8_);
                uVar71 = movmskpd((int)lVar86,auVar173);
                in_R8 = (ulong)uVar71;
                if (uVar71 != 3) goto LAB_00113087;
                dVar152 = -1.79769313486232e+308;
                if (-1.79769313486232e+308 <= dVar120) {
                  dVar152 = dVar120;
                }
                if ((dVar152 != dVar120) || (NAN(dVar152) || NAN(dVar120))) goto LAB_00113087;
                dVar120 = -1.79769313486232e+308;
                if (-1.79769313486232e+308 <= dVar119) {
                  dVar120 = dVar119;
                }
                uVar67 = uVar67 + 1;
                if ((dVar120 != dVar119) || (NAN(dVar120) || NAN(dVar119))) {
LAB_00113087:
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<double>]"
                  ;
                  goto LAB_00113282;
                }
              }
            }
            std::_Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                           *)&p);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,0.0,999.0);
                *(double *)(&max + lVar52 * 2) = (double)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,1000.0,1999.0);
                (&rand_2)[lVar52]._state = (unsigned_long)(double)fVar90;
              }
              p.x._0_1_ = local_88[0];
              p.x._1_1_ = local_88[1];
              p.x._2_1_ = local_88[2];
              p.x._3_1_ = local_88[3];
              p.y._0_1_ = local_88[4];
              p.y._1_1_ = local_88[5];
              p.y._2_1_ = local_88[6];
              p.y._3_1_ = local_88[7];
              p.z._0_1_ = local_88[8];
              p.z._1_1_ = local_88[9];
              p.z._2_1_ = local_88[10];
              p.z._3_1_ = local_88[0xb];
              acStack_1ac[0] = local_88[0xc];
              acStack_1ac[1] = local_88[0xd];
              acStack_1ac[2] = local_88[0xe];
              acStack_1ac[3] = local_88[0xf];
              min.x = local_68._0_2_;
              min.y = local_68._2_2_;
              sStack_174 = local_68._4_2_;
              sStack_172 = local_68._6_2_;
              for (lVar52 = 0; lVar52 != 2; lVar52 = lVar52 + 1) {
                dVar120 = *(double *)(&max + lVar52 * 2);
                if (*(double *)(&p.x + lVar52 * 2) <= *(double *)(&max + lVar52 * 2)) {
                  dVar120 = *(double *)(&p.x + lVar52 * 2);
                }
                *(double *)(&p.x + lVar52 * 2) = dVar120;
                dVar120 = (double)(&rand_2)[lVar52]._state;
                if ((double)(&rand_2)[lVar52]._state <= *(double *)(&min + lVar52 * 2)) {
                  dVar120 = *(double *)(&min + lVar52 * 2);
                }
                *(double *)(&min + lVar52 * 2) = dVar120;
              }
              auVar25._2_2_ = max.y;
              auVar25._0_2_ = max.x;
              auVar25._4_2_ = sStack_114;
              auVar25._6_2_ = sStack_112;
              auVar25._8_2_ = sStack_110;
              auVar25._10_2_ = sStack_10e;
              auVar25._12_2_ = sStack_10c;
              auVar25._14_2_ = sStack_10a;
              local_88 = minpd(auVar25,local_88);
              auVar136._8_8_ =
                   -(ulong)((double)CONCAT17(acStack_1ac[3],
                                             CONCAT16(acStack_1ac[2],
                                                      CONCAT15(acStack_1ac[1],
                                                               CONCAT14(acStack_1ac[0],
                                                                        CONCAT13(p.z._3_1_,
                                                                                 CONCAT12(p.z._2_1_,
                                                                                          CONCAT11(p
                                                  .z._1_1_,p.z._0_1_))))))) == local_88._8_8_);
              auVar136._0_8_ =
                   -(ulong)((double)CONCAT17(p.y._3_1_,
                                             CONCAT16(p.y._2_1_,
                                                      CONCAT15(p.y._1_1_,
                                                               CONCAT14(p.y._0_1_,
                                                                        CONCAT13(p.x._3_1_,
                                                                                 CONCAT12(p.x._2_1_,
                                                                                          CONCAT11(p
                                                  .x._1_1_,p.x._0_1_))))))) == local_88._0_8_);
              iVar83 = movmskpd(2,auVar136);
              if (iVar83 != 3) {
LAB_001140c6:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec2<double>]"
                ;
                goto LAB_0011442d;
              }
              auVar22._2_2_ = rand_2._state._2_2_;
              auVar22._0_2_ = (short)rand_2._state;
              auVar22._4_2_ = rand_2._state._4_2_;
              auVar22._6_2_ = rand_2._state._6_2_;
              auVar22._8_2_ = sStack_130;
              auVar22._10_2_ = sStack_12e;
              auVar22._12_4_ = fStack_12c;
              auVar93 = maxpd(auVar22,local_68);
              auVar163._8_8_ = -(ulong)(local_68._8_8_ == auVar93._8_8_);
              auVar163._0_8_ =
                   -(ulong)((double)CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x)))
                           == auVar93._0_8_);
              iVar83 = movmskpd(3,auVar163);
              if (iVar83 != 3) goto LAB_001140c6;
              local_68 = auVar93;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V3s");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = 0;
            p.x._1_1_ = 0;
            p.x._2_1_ = 0;
            p.x._3_1_ = 0;
            p.y._0_1_ = 0;
            p.y._1_1_ = 0;
            p.y._2_1_ = 0;
            p.y._3_1_ = 0;
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec3<short>>
                      ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_> *)
                       &p);
            std::_Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                           *)&p);
            p.x._0_1_ = 'Z';
            p.x._1_1_ = 'Z';
            p.x._2_1_ = 'Z';
            p.x._3_1_ = 'Z';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            local_d8 = ZEXT816(0x80008000);
            local_c8 = ZEXT816(0x7fff7fff);
            sVar78 = 0x7fff;
            sVar81 = -0x8000;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,0.0,999.0);
                *(short *)((long)&rand_2._state + lVar52 * 2) = (short)(int)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&p,1000.0,1999.0);
                *(short *)((long)&rand_8._state + lVar52 * 2) = (short)(int)fVar90;
              }
              min.x = local_c8._0_2_;
              sVar79 = min.x;
              min.y = local_c8._2_2_;
              sVar82 = min.y;
              max.x = local_d8._0_2_;
              sVar53 = max.x;
              max.y = local_d8._2_2_;
              sVar148 = max.y;
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                sVar149 = *(short *)((long)&rand_2._state + lVar52 * 2);
                sVar59 = (&min.x)[lVar52];
                if (sVar149 < (&min.x)[lVar52]) {
                  sVar59 = sVar149;
                }
                (&min.x)[lVar52] = sVar59;
                sVar149 = *(short *)((long)&rand_8._state + lVar52 * 2);
                if (sVar149 < (&max.x)[lVar52]) {
                  sVar149 = (&max.x)[lVar52];
                }
                (&max.x)[lVar52] = sVar149;
              }
              local_c8._0_2_ =
                   (ushort)((short)rand_2._state < sVar79) * (short)rand_2._state |
                   (ushort)((short)rand_2._state >= sVar79) * sVar79;
              local_c8._2_2_ =
                   (ushort)(rand_2._state._2_2_ < sVar82) * rand_2._state._2_2_ |
                   (ushort)(rand_2._state._2_2_ >= sVar82) * sVar82;
              local_c8._4_2_ = 0;
              local_c8._6_2_ = (ushort)((short)local_c8._6_2_ < 1) * local_c8._6_2_;
              local_c8._8_2_ = (ushort)((short)local_c8._8_2_ < 1) * local_c8._8_2_;
              local_c8._10_2_ = (ushort)((short)local_c8._10_2_ < 1) * local_c8._10_2_;
              local_c8._12_2_ = (ushort)((short)local_c8._12_2_ < 1) * local_c8._12_2_;
              local_c8._14_2_ = (ushort)((short)local_c8._14_2_ < 1) * local_c8._14_2_;
              sVar79 = rand_2._state._4_2_;
              if (sVar78 <= rand_2._state._4_2_) {
                sVar79 = sVar78;
              }
              sVar82 = sVar81;
              if (sVar81 <= rand_8._state._4_2_) {
                sVar82 = rand_8._state._4_2_;
              }
              if (((local_c8._0_2_ != min.x) || (local_c8._2_2_ != min.y)) || (sVar79 != sVar78)) {
LAB_001143ea:
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<short>]"
                ;
                goto LAB_0011442d;
              }
              local_d8._0_2_ =
                   (ushort)(sVar53 < (short)rand_8._state) * (short)rand_8._state |
                   (ushort)(sVar53 >= (short)rand_8._state) * sVar53;
              local_d8._2_2_ =
                   (ushort)(sVar148 < rand_8._state._2_2_) * rand_8._state._2_2_ |
                   (ushort)(sVar148 >= rand_8._state._2_2_) * sVar148;
              local_d8._4_2_ = 0;
              local_d8._6_2_ = (ushort)(-1 < (short)local_d8._6_2_) * local_d8._6_2_;
              local_d8._8_2_ = (ushort)(-1 < (short)local_d8._8_2_) * local_d8._8_2_;
              local_d8._10_2_ = (ushort)(-1 < (short)local_d8._10_2_) * local_d8._10_2_;
              local_d8._12_2_ = (ushort)(-1 < (short)local_d8._12_2_) * local_d8._12_2_;
              local_d8._14_2_ = (ushort)(-1 < (short)local_d8._14_2_) * local_d8._14_2_;
              if (((local_d8._0_2_ != max.x) || (local_d8._2_2_ != max.y)) || (sVar82 != sVar81))
              goto LAB_001143ea;
              sStack_114 = sVar81;
              sVar78 = sVar79;
              sVar81 = sVar82;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V3i");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = '\0';
            p.x._1_1_ = '\0';
            p.x._2_1_ = '\0';
            p.x._3_1_ = '\0';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec3<int>>
                      ((vector<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_> *)&p);
            std::_Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                           *)&p);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            local_c8._0_4_ = 0x7fffffff;
            local_d8._0_4_ = -0x80000000;
            iVar89 = -0x80000000;
            iVar88 = 0x7fffffff;
            iVar83 = 0x7fffffff;
            iVar84 = -0x80000000;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,0.0,999.0);
                (&max)[lVar52] = (Vec2<short>)(int)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,1000.0,1999.0);
                *(int *)((long)&rand_2._state + lVar52 * 4) = (int)fVar90;
              }
              p.x._0_1_ = (char)iVar83;
              p.x._1_1_ = (char)((uint)iVar83 >> 8);
              p.x._2_1_ = (char)((uint)iVar83 >> 0x10);
              p.x._3_1_ = (char)((uint)iVar83 >> 0x18);
              p.y._0_1_ = (char)iVar88;
              p.y._1_1_ = (char)((uint)iVar88 >> 8);
              p.y._2_1_ = (char)((uint)iVar88 >> 0x10);
              p.y._3_1_ = (char)((uint)iVar88 >> 0x18);
              p.z._0_1_ = local_c8[0];
              p.z._1_1_ = local_c8[1];
              p.z._2_1_ = local_c8[2];
              p.z._3_1_ = local_c8[3];
              min.x = (short)iVar89;
              min.y = (short)((uint)iVar89 >> 0x10);
              for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                VVar91 = *(Vec2<short> *)(&p.x + lVar52);
                if ((int)(&max)[lVar52] < (int)*(Vec2<short> *)(&p.x + lVar52)) {
                  VVar91 = (&max)[lVar52];
                }
                *(Vec2<short> *)(&p.x + lVar52) = VVar91;
                VVar91 = *(Vec2<short> *)((long)&rand_2._state + lVar52 * 4);
                if ((int)VVar91 < (int)(&min)[lVar52]) {
                  VVar91 = (&min)[lVar52];
                }
                (&min)[lVar52] = VVar91;
              }
              if (CONCAT22(max.y,max.x) < iVar83) {
                iVar83 = CONCAT22(max.y,max.x);
              }
              if (CONCAT22(sStack_112,sStack_114) < iVar88) {
                iVar88 = CONCAT22(sStack_112,sStack_114);
              }
              iVar65 = local_c8._0_4_;
              if (CONCAT22(sStack_10e,sStack_110) < (int)local_c8._0_4_) {
                iVar65 = CONCAT22(sStack_10e,sStack_110);
              }
              local_c8._0_4_ = iVar65;
              if (iVar89 <= CONCAT22(rand_2._state._2_2_,(short)rand_2._state)) {
                iVar89 = CONCAT22(rand_2._state._2_2_,(short)rand_2._state);
              }
              iVar85 = iVar84;
              if (iVar84 <= CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_)) {
                iVar85 = CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_);
              }
              iVar66 = local_d8._0_4_;
              if ((int)local_d8._0_4_ <= CONCAT22(sStack_12e,sStack_130)) {
                iVar66 = CONCAT22(sStack_12e,sStack_130);
              }
              if (((iVar83 != CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))))
                  || (iVar88 != CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))
                                        ))) ||
                 ((iVar65 != CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                  || (((iVar89 != CONCAT22(min.y,min.x) || (iVar85 != iVar84)) ||
                      (iVar66 != local_d8._0_4_)))))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<int>]"
                ;
                goto LAB_0011442d;
              }
              iVar84 = iVar85;
              local_d8._0_4_ = iVar66;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V3i64");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = '\0';
            p.x._1_1_ = '\0';
            p.x._2_1_ = '\0';
            p.x._3_1_ = '\0';
            p.y._0_1_ = '\0';
            p.y._1_1_ = '\0';
            p.y._2_1_ = '\0';
            p.y._3_1_ = '\0';
            p.z._0_1_ = '\0';
            p.z._1_1_ = '\0';
            p.z._2_1_ = '\0';
            p.z._3_1_ = '\0';
            acStack_1ac[0] = '\0';
            acStack_1ac[1] = '\0';
            acStack_1ac[2] = '\0';
            acStack_1ac[3] = '\0';
            local_1a8._0_4_ = 0.0;
            local_1a8._4_4_ = 0.0;
            (anonymous_namespace)::permutations<Imath_3_2::Vec3<long>>
                      ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_> *)&p)
            ;
            std::_Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>::
            ~_Vector_base((_Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                           *)&p);
            rand_8._state._0_2_ = 0x5a5a;
            rand_8._state._2_2_ = 0x5a5a;
            rand_8._state._4_2_ = 0;
            rand_8._state._6_2_ = 0;
            lVar52 = -0x8000000000000000;
            lVar64 = 0x7fffffffffffffff;
            lVar86 = 0x7fffffffffffffff;
            lVar77 = 0x7fffffffffffffff;
            lVar76 = lVar52;
            lVar80 = lVar52;
            for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
              for (lVar87 = 0; lVar87 != 3; lVar87 = lVar87 + 1) {
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,0.0,999.0);
                *(long *)(&max + lVar87 * 2) = (long)fVar90;
                fVar90 = Imath_3_2::Rand32::nextf(&rand_8,1000.0,1999.0);
                (&rand_2)[lVar87]._state = (long)fVar90;
              }
              p.x._0_1_ = (char)lVar77;
              p.x._1_1_ = (char)((ulong)lVar77 >> 8);
              p.x._2_1_ = (char)((ulong)lVar77 >> 0x10);
              p.x._3_1_ = (char)((ulong)lVar77 >> 0x18);
              p.y._0_1_ = (char)((ulong)lVar77 >> 0x20);
              p.y._1_1_ = (char)((ulong)lVar77 >> 0x28);
              p.y._2_1_ = (char)((ulong)lVar77 >> 0x30);
              p.y._3_1_ = (char)((ulong)lVar77 >> 0x38);
              p.z._0_1_ = (char)lVar86;
              p.z._1_1_ = (char)((ulong)lVar86 >> 8);
              p.z._2_1_ = (char)((ulong)lVar86 >> 0x10);
              p.z._3_1_ = (char)((ulong)lVar86 >> 0x18);
              acStack_1ac[0] = (char)((ulong)lVar86 >> 0x20);
              acStack_1ac[1] = (char)((ulong)lVar86 >> 0x28);
              acStack_1ac[2] = (char)((ulong)lVar86 >> 0x30);
              acStack_1ac[3] = (char)((ulong)lVar86 >> 0x38);
              local_1a8._0_4_ = (float)lVar64;
              local_1a8._4_4_ = (float)((ulong)lVar64 >> 0x20);
              min.x = (short)lVar52;
              min.y = (short)((ulong)lVar52 >> 0x10);
              sStack_174 = (short)((ulong)lVar52 >> 0x20);
              sStack_172 = (short)((ulong)lVar52 >> 0x30);
              for (lVar87 = 0; lVar87 != 3; lVar87 = lVar87 + 1) {
                lVar63 = *(long *)(&p.x + lVar87 * 2);
                if (*(long *)(&max + lVar87 * 2) < *(long *)(&p.x + lVar87 * 2)) {
                  lVar63 = *(long *)(&max + lVar87 * 2);
                }
                *(long *)(&p.x + lVar87 * 2) = lVar63;
                uVar56 = (&rand_2)[lVar87]._state;
                if ((long)(&rand_2)[lVar87]._state < (long)*(unsigned_long *)(&min + lVar87 * 2)) {
                  uVar56 = *(unsigned_long *)(&min + lVar87 * 2);
                }
                *(unsigned_long *)(&min + lVar87 * 2) = uVar56;
              }
              lVar87 = CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)));
              lVar63 = CONCAT26(sStack_10a,CONCAT24(sStack_10c,CONCAT22(sStack_10e,sStack_110)));
              if (lVar87 < lVar77) {
                lVar77 = lVar87;
              }
              lVar87 = CONCAT26(rand_2._state._6_2_,
                                CONCAT24(rand_2._state._4_2_,
                                         CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
              if (lVar63 < lVar86) {
                lVar86 = lVar63;
              }
              lVar63 = CONCAT44(fStack_12c,CONCAT22(sStack_12e,sStack_130));
              if (CONCAT44(fStack_104,local_108) < lVar64) {
                lVar64 = CONCAT44(fStack_104,local_108);
              }
              if (lVar52 <= lVar87) {
                lVar52 = lVar87;
              }
              lVar87 = lVar80;
              if (lVar80 <= lVar63) {
                lVar87 = lVar63;
              }
              lVar63 = lVar76;
              if (lVar76 <= CONCAT44(fStack_124,local_128)) {
                lVar63 = CONCAT44(fStack_124,local_128);
              }
              if (((lVar77 != CONCAT17(p.y._3_1_,
                                       CONCAT16(p.y._2_1_,
                                                CONCAT15(p.y._1_1_,
                                                         CONCAT14(p.y._0_1_,
                                                                  CONCAT13(p.x._3_1_,
                                                                           CONCAT12(p.x._2_1_,
                                                                                    CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))))) ||
                  (lVar86 != CONCAT17(acStack_1ac[3],
                                      CONCAT16(acStack_1ac[2],
                                               CONCAT15(acStack_1ac[1],
                                                        CONCAT14(acStack_1ac[0],
                                                                 CONCAT13(p.z._3_1_,
                                                                          CONCAT12(p.z._2_1_,
                                                                                   CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))))) ||
                 (((lVar64 != CONCAT44(local_1a8._4_4_,(float)local_1a8) ||
                   ((lVar52 != CONCAT26(sStack_172,CONCAT24(sStack_174,CONCAT22(min.y,min.x))) ||
                    (lVar87 != lVar80)))) || (lVar63 != lVar76)))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<long>]"
                ;
                goto LAB_0011442d;
              }
              lVar76 = lVar63;
              lVar80 = lVar87;
            }
            poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
            poVar51 = std::operator<<(poVar51,"V3f");
            std::endl<char,std::char_traits<char>>(poVar51);
            p.x._0_1_ = DAT_001532e0;
            p.x._1_1_ = DAT_001532e0._1_1_;
            p.x._2_1_ = DAT_001532e0._2_1_;
            p.x._3_1_ = DAT_001532e0._3_1_;
            p.y._0_1_ = DAT_001532e0._4_1_;
            p.y._1_1_ = DAT_001532e0._5_1_;
            p.y._2_1_ = DAT_001532e0._6_1_;
            p.y._3_1_ = DAT_001532e0._7_1_;
            p.z._0_1_ = DAT_001532e0._8_1_;
            p.z._1_1_ = DAT_001532e0._9_1_;
            p.z._2_1_ = DAT_001532e0._10_1_;
            p.z._3_1_ = DAT_001532e0._11_1_;
            acStack_1ac[0] = DAT_001532e0._12_1_;
            acStack_1ac[1] = DAT_001532e0._13_1_;
            acStack_1ac[2] = DAT_001532e0._14_1_;
            acStack_1ac[3] = DAT_001532e0._15_1_;
            local_1a8._0_4_ = -3.4028235e+38;
            local_1a8._4_4_ = -3.4028235e+38;
            min.x = (short)DAT_001532e0;
            min.y = DAT_001532e0._2_2_;
            Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                      ((Box<Imath_3_2::Vec3<float>_> *)&p,(Box<Imath_3_2::Vec3<float>_> *)&min);
            auVar99._4_4_ =
                 -(uint)((float)CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))
                                        ) != 3.4028235e+38);
            auVar99._0_4_ =
                 -(uint)((float)CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                        ) != 3.4028235e+38);
            auVar99._8_4_ =
                 -(uint)((float)CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))
                                        ) != 3.4028235e+38);
            auVar99._12_4_ =
                 -(uint)((float)CONCAT13(acStack_1ac[3],
                                         CONCAT12(acStack_1ac[2],
                                                  CONCAT11(acStack_1ac[1],acStack_1ac[0]))) !=
                        -3.4028235e+38);
            iVar50 = movmskps(extraout_EAX_02,auVar99);
            if ((((iVar50 != 0) || ((float)local_1a8 != -3.4028235e+38)) || (NAN((float)local_1a8)))
               || ((local_1a8._4_4_ != -3.4028235e+38 || (NAN(local_1a8._4_4_))))) {
              pcVar58 = 
              "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<float>]"
              ;
            }
            else {
              p.x._0_1_ = '\0';
              p.x._1_1_ = '\0';
              p.x._2_1_ = '\0';
              p.x._3_1_ = '\0';
              p.y._0_1_ = '\0';
              p.y._1_1_ = '\0';
              p.y._2_1_ = '\0';
              p.y._3_1_ = '\0';
              p.z._0_1_ = '\0';
              p.z._1_1_ = '\0';
              p.z._2_1_ = '\0';
              p.z._3_1_ = '\0';
              acStack_1ac[0] = '\0';
              acStack_1ac[1] = '\0';
              acStack_1ac[2] = '\0';
              acStack_1ac[3] = '\0';
              local_1a8._0_4_ = 0.0;
              local_1a8._4_4_ = 0.0;
              (anonymous_namespace)::permutations<Imath_3_2::Vec3<float>>
                        ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *
                         )&p);
              lVar52 = CONCAT17(p.y._3_1_,
                                CONCAT16(p.y._2_1_,
                                         CONCAT15(p.y._1_1_,
                                                  CONCAT14(p.y._0_1_,
                                                           CONCAT13(p.x._3_1_,
                                                                    CONCAT12(p.x._2_1_,
                                                                             CONCAT11(p.x._1_1_,
                                                                                      p.x._0_1_)))))
                                        ));
              lVar86 = CONCAT17(acStack_1ac[3],
                                CONCAT16(acStack_1ac[2],
                                         CONCAT15(acStack_1ac[1],
                                                  CONCAT14(acStack_1ac[0],
                                                           CONCAT13(p.z._3_1_,
                                                                    CONCAT12(p.z._2_1_,
                                                                             CONCAT11(p.z._1_1_,
                                                                                      p.z._0_1_)))))
                                        ));
              for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 0xc); uVar54 = uVar54 + 1
                  ) {
                lVar76 = (ulong)uVar54 * 0xc;
                for (uVar67 = 0; (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 0xc);
                    uVar67 = uVar67 + 1) {
                  uVar55 = *(ulong *)(lVar52 + lVar76);
                  max.y = (ushort)(uVar55 >> 0x10) ^ 0x8000;
                  local_d8._0_8_ = uVar55 ^ 0x8000000080000000;
                  fVar90 = *(float *)(lVar52 + 8 + lVar76);
                  lVar86 = (ulong)uVar67 * 0xc;
                  uVar8 = *(undefined8 *)(lVar52 + lVar86);
                  fVar118 = *(float *)(lVar52 + 8 + lVar86);
                  min.x = -1;
                  min.y = 0x7f7f;
                  max.x = (short)uVar55;
                  sVar78 = max.x;
                  local_108 = (float)((ulong)uVar8 >> 0x20);
                  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                            ((Box<Imath_3_2::Vec3<float>_> *)&min,
                             (Box<Imath_3_2::Vec3<float>_> *)&max);
                  auVar100._4_4_ = -(uint)(SUB84(local_d8._0_8_,4) == 3.4028235e+38);
                  auVar100._0_4_ = -(uint)((float)min == (float)local_d8._0_8_);
                  auVar100._8_4_ = -(uint)(-fVar90 == 3.4028235e+38);
                  auVar100._12_4_ = -(uint)((float)uVar8 == -3.4028235e+38);
                  iVar50 = movmskps(extraout_EAX_03,auVar100);
                  if (((iVar50 != 0xf) || (local_108 != -3.4028235e+38)) ||
                     ((fVar118 != -3.4028235e+38 || (NAN(fVar118))))) {
                    pcVar58 = 
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<float>]"
                    ;
                    goto LAB_00113263;
                  }
                  max.y = SUB82(local_d8._0_8_,2);
                  rand_2._state._0_2_ = -1;
                  rand_2._state._2_2_ = 0x7f7f;
                  rand_2._state._4_2_ = -1;
                  rand_2._state._6_2_ = 0x7f7f;
                  max.x = sVar78;
                  Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                            ((Box<Imath_3_2::Vec3<float>_> *)&max,
                             (Box<Imath_3_2::Vec3<float>_> *)&rand_2);
                  auVar101._4_4_ = 0xffffffff;
                  auVar101._0_4_ = -(uint)((float)local_d8._0_8_ == (float)CONCAT22(max.y,max.x));
                  auVar101._8_4_ = 0xffffffff;
                  auVar101._12_4_ = 0xffffffff;
                  iVar50 = movmskps(extraout_EAX_04,auVar101);
                  if ((iVar50 != 0xf) || (NAN(fVar118))) {
                    pcVar58 = 
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<float>]"
                    ;
                    goto LAB_00113282;
                  }
                  lVar52 = CONCAT17(p.y._3_1_,
                                    CONCAT16(p.y._2_1_,
                                             CONCAT15(p.y._1_1_,
                                                      CONCAT14(p.y._0_1_,
                                                               CONCAT13(p.x._3_1_,
                                                                        CONCAT12(p.x._2_1_,
                                                                                 CONCAT11(p.x._1_1_,
                                                                                          p.x._0_1_)
                                                                                ))))));
                  lVar86 = CONCAT17(acStack_1ac[3],
                                    CONCAT16(acStack_1ac[2],
                                             CONCAT15(acStack_1ac[1],
                                                      CONCAT14(acStack_1ac[0],
                                                               CONCAT13(p.z._3_1_,
                                                                        CONCAT12(p.z._2_1_,
                                                                                 CONCAT11(p.z._1_1_,
                                                                                          p.z._0_1_)
                                                                                ))))));
                }
              }
              std::_Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
              ~_Vector_base((_Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                             *)&p);
              rand_23._state = 0x5a5a5a5a;
              p.x._0_1_ = -1;
              p.x._1_1_ = -1;
              p.x._2_1_ = '\x7f';
              p.x._3_1_ = '\x7f';
              p.y._0_1_ = -1;
              p.y._1_1_ = -1;
              p.y._2_1_ = '\x7f';
              p.y._3_1_ = '\x7f';
              p.z._0_1_ = -1;
              p.z._1_1_ = -1;
              p.z._2_1_ = '\x7f';
              p.z._3_1_ = '\x7f';
              acStack_1ac[0] = -1;
              acStack_1ac[1] = -1;
              acStack_1ac[2] = '\x7f';
              acStack_1ac[3] = -1;
              local_1a8._0_4_ = -3.4028235e+38;
              local_1a8._4_4_ = -3.4028235e+38;
              for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                for (lVar52 = 0; fVar90 = local_1a8._4_4_, lVar52 != 3; lVar52 = lVar52 + 1) {
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                  *(float *)((long)&rand_8._state + lVar52 * 4) = fVar90;
                  fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                  (&p1.x)[lVar52] = fVar90;
                }
                uVar11 = CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                max.y = (short)((uint)uVar11 >> 0x10);
                sStack_114 = (short)((uint6)uVar17 >> 0x20);
                sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >> 0x30);
                uVar18 = CONCAT11(p.z._1_1_,p.z._0_1_);
                sStack_10e = (short)(CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,uVar18)) >> 0x10);
                rand_2._state._0_2_ = CONCAT11(acStack_1ac[1],acStack_1ac[0]);
                rand_2._state._2_2_ =
                     (short)(CONCAT13(acStack_1ac[3],
                                      CONCAT12(acStack_1ac[2],
                                               CONCAT11(acStack_1ac[1],acStack_1ac[0]))) >> 0x10);
                rand_2._state._4_2_ = SUB42((float)local_1a8,0);
                rand_2._state._6_2_ = (short)((uint)(float)local_1a8 >> 0x10);
                for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                  VVar91 = *(Vec2<short> *)((long)&rand_8._state + lVar52 * 4);
                  if ((float)(&max)[lVar52] <= (float)VVar91) {
                    VVar91 = (&max)[lVar52];
                  }
                  (&max)[lVar52] = VVar91;
                  fVar118 = *(float *)((long)&rand_2._state + lVar52 * 4);
                  fVar151 = (&p1.x)[lVar52];
                  if ((&p1.x)[lVar52] <= fVar118) {
                    fVar151 = fVar118;
                  }
                  *(float *)((long)&rand_2._state + lVar52 * 4) = fVar151;
                }
                min.x = (short)rand_8._state;
                min.y = rand_8._state._2_2_;
                Imath_3_2::Box<Imath_3_2::Vec3<float>_>::extendBy
                          ((Box<Imath_3_2::Vec3<float>_> *)&p,(Box<Imath_3_2::Vec3<float>_> *)&min);
                fVar118 = (float)CONCAT13(p.x._3_1_,
                                          CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                if (((((fVar118 != (float)CONCAT22(max.y,max.x)) ||
                      (NAN(fVar118) || NAN((float)CONCAT22(max.y,max.x)))) ||
                     (fVar118 = (float)CONCAT13(p.y._3_1_,
                                                CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))),
                     fVar118 != (float)CONCAT22(sStack_112,sStack_114))) ||
                    ((((NAN(fVar118) || NAN((float)CONCAT22(sStack_112,sStack_114)) ||
                       (fVar118 = (float)CONCAT13(p.z._3_1_,
                                                  CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                       , fVar118 != (float)CONCAT22(sStack_10e,uVar18))) ||
                      ((NAN(fVar118) || NAN((float)CONCAT22(sStack_10e,uVar18)) ||
                       ((fVar118 = (float)CONCAT13(acStack_1ac[3],
                                                   CONCAT12(acStack_1ac[2],
                                                            CONCAT11(acStack_1ac[1],acStack_1ac[0]))
                                                  ),
                        fVar118 != (float)CONCAT22(rand_2._state._2_2_,(short)rand_2._state) ||
                        (NAN(fVar118) ||
                         NAN((float)CONCAT22(rand_2._state._2_2_,(short)rand_2._state)))))))) ||
                     ((float)local_1a8 != (float)CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_)))
                    )) || (((NAN((float)local_1a8) ||
                             NAN((float)CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_)) ||
                            (local_1a8._4_4_ != fVar90)) || (NAN(local_1a8._4_4_) || NAN(fVar90)))))
                {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<float>]"
                  ;
                  goto LAB_0011442d;
                }
              }
              poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
              poVar51 = std::operator<<(poVar51,"V3d");
              std::endl<char,std::char_traits<char>>(poVar51);
              p.x._0_1_ = -1;
              p.x._1_1_ = -1;
              p.x._2_1_ = -1;
              p.x._3_1_ = -1;
              p.y._0_1_ = -1;
              p.y._1_1_ = -1;
              p.y._2_1_ = -0x11;
              p.y._3_1_ = '\x7f';
              p.z._0_1_ = -1;
              p.z._1_1_ = -1;
              p.z._2_1_ = -1;
              p.z._3_1_ = -1;
              acStack_1ac[0] = -1;
              acStack_1ac[1] = -1;
              acStack_1ac[2] = -0x11;
              acStack_1ac[3] = '\x7f';
              local_1a8._0_4_ = (float)DAT_001532f0;
              local_1a8._4_4_ = DAT_001532f0._4_4_;
              uStack_1a0._0_4_ = DAT_001532f0._8_4_;
              uStack_1a0._4_4_ = DAT_001532f0._12_4_;
              local_198[0] = -NAN;
              local_198[1] = -NAN;
              local_198[2] = -NAN;
              local_198[3] = -NAN;
              min.x = -1;
              min.y = -1;
              Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                        ((Box<Imath_3_2::Vec3<double>_> *)&p,(Box<Imath_3_2::Vec3<double>_> *)&min);
              auVar137._4_4_ =
                   -(uint)((double)CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) != 1.79769313486232e+308)
              ;
              auVar137._0_4_ =
                   -(uint)((double)CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_))))))) != 1.79769313486232e+308)
              ;
              auVar137._8_4_ =
                   -(uint)((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                          1.79769313486232e+308);
              auVar137._12_4_ =
                   -(uint)((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                          -1.79769313486232e+308);
              iVar50 = movmskps(extraout_EAX_05,auVar137);
              if (((iVar50 != 0) ||
                  ((double)CONCAT44(local_198[1],local_198[0]) != -1.79769313486232e+308)) ||
                 ((NAN((double)CONCAT44(local_198[1],local_198[0])) ||
                  (((double)CONCAT44(local_198[3],local_198[2]) != -1.79769313486232e+308 ||
                   (NAN((double)CONCAT44(local_198[3],local_198[2])))))))) {
                pcVar58 = 
                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<double>]"
                ;
              }
              else {
                rand_2._state._0_2_ = 0;
                rand_2._state._2_2_ = 0;
                rand_2._state._4_2_ = 0;
                rand_2._state._6_2_ = 0;
                (anonymous_namespace)::permutations<Imath_3_2::Vec3<double>>
                          ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                            *)&rand_2);
                lVar52 = CONCAT26(rand_2._state._6_2_,
                                  CONCAT24(rand_2._state._4_2_,
                                           CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
                auVar93 = _DAT_00153240;
                for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 / 0x18); uVar54 = uVar54 + 1) {
                  lVar86 = (ulong)uVar54 * 0x18;
                  for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 / 0x18); uVar67 = uVar67 + 1) {
                    pdVar68 = (double *)(lVar52 + lVar86);
                    uVar17 = *(undefined6 *)(pdVar68 + 1);
                    local_d8._12_4_ = *(uint *)((long)pdVar68 + 0xc) ^ 0x80000000;
                    local_d8._0_8_ = -*pdVar68;
                    local_d8._8_4_ = *(undefined4 *)(pdVar68 + 1);
                    local_b8._0_8_ = -*(double *)(lVar52 + 0x10 + lVar86);
                    lVar76 = (ulong)uVar67 * 0x18;
                    pdVar1 = (double *)(lVar52 + lVar76);
                    dVar119 = *pdVar1;
                    dVar152 = pdVar1[1];
                    dVar120 = *(double *)(lVar52 + 0x10 + lVar76);
                    p.x._0_1_ = -1;
                    p.x._1_1_ = -1;
                    p.x._2_1_ = -1;
                    p.x._3_1_ = -1;
                    p.y._0_1_ = -1;
                    p.y._1_1_ = -1;
                    p.y._2_1_ = -0x11;
                    p.y._3_1_ = '\x7f';
                    p.z._0_1_ = -1;
                    p.z._1_1_ = -1;
                    p.z._2_1_ = -1;
                    p.z._3_1_ = -1;
                    acStack_1ac[0] = -1;
                    acStack_1ac[1] = -1;
                    acStack_1ac[2] = -0x11;
                    acStack_1ac[3] = '\x7f';
                    local_1a8._0_4_ = -NAN;
                    local_1a8._4_4_ = NAN;
                    uStack_1a0._0_4_ = -NAN;
                    uStack_1a0._4_4_ = -NAN;
                    local_198[0] = auVar93._0_4_;
                    local_198[1] = auVar93._4_4_;
                    local_198[2] = auVar93._8_4_;
                    local_198[3] = auVar93._12_4_;
                    min.x = (short)*(undefined4 *)pdVar68;
                    min.y = (short)((uint)*(undefined4 *)pdVar68 >> 0x10);
                    sStack_16a = (short)((uint)local_d8._12_4_ >> 0x10);
                    Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                              ((Box<Imath_3_2::Vec3<double>_> *)&p,
                               (Box<Imath_3_2::Vec3<double>_> *)&min);
                    auVar138._4_4_ =
                         -(uint)((double)CONCAT17(acStack_1ac[3],
                                                  CONCAT16(acStack_1ac[2],
                                                           CONCAT15(acStack_1ac[1],
                                                                    CONCAT14(acStack_1ac[0],
                                                                             CONCAT13(p.z._3_1_,
                                                                                      CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))))))) ==
                                local_d8._8_8_);
                    auVar138._0_4_ =
                         -(uint)((double)CONCAT17(p.y._3_1_,
                                                  CONCAT16(p.y._2_1_,
                                                           CONCAT15(p.y._1_1_,
                                                                    CONCAT14(p.y._0_1_,
                                                                             CONCAT13(p.x._3_1_,
                                                                                      CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))))))) ==
                                (double)local_d8._0_8_);
                    auVar138._8_4_ =
                         -(uint)((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) ==
                                (double)local_b8._0_8_);
                    auVar138._12_4_ =
                         -(uint)((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) == dVar119);
                    iVar50 = movmskps(extraout_EAX_06,auVar138);
                    if ((((iVar50 != 0xf) ||
                         ((double)CONCAT44(local_198[1],local_198[0]) != dVar152)) ||
                        ((double)CONCAT44(local_198[3],local_198[2]) != dVar120)) ||
                       (NAN((double)CONCAT44(local_198[3],local_198[2])) || NAN(dVar120))) {
                      pcVar58 = 
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<double>]"
                      ;
                      goto LAB_00113263;
                    }
                    min.x = (short)local_d8._0_8_;
                    min.y = SUB82(local_d8._0_8_,2);
                    sStack_174 = SUB82(local_d8._0_8_,4);
                    sStack_172 = SUB82(local_d8._0_8_,6);
                    max.x = -1;
                    max.y = -1;
                    Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                              ((Box<Imath_3_2::Vec3<double>_> *)&min,
                               (Box<Imath_3_2::Vec3<double>_> *)&max);
                    auVar102._4_4_ = -(uint)(local_d8._8_8_ == (double)CONCAT26(sStack_16a,uVar17));
                    auVar102._0_4_ =
                         -(uint)((double)local_d8._0_8_ ==
                                (double)CONCAT26(sStack_172,CONCAT24(sStack_174,min)));
                    auVar102._8_4_ = 0xffffffff;
                    auVar102._12_4_ = 0xffffffff;
                    iVar50 = movmskps(extraout_EAX_07,auVar102);
                    if ((iVar50 != 0xf) || (NAN(dVar120))) {
                      pcVar58 = 
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<double>]"
                      ;
                      goto LAB_00113282;
                    }
                    lVar52 = CONCAT26(rand_2._state._6_2_,
                                      CONCAT24(rand_2._state._4_2_,
                                               CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
                    auVar93 = _DAT_00153240;
                  }
                }
                std::
                _Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::
                ~_Vector_base((_Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                               *)&rand_2);
                rand_23._state = 0x5a5a5a5a;
                p.x._0_1_ = -1;
                p.x._1_1_ = -1;
                p.x._2_1_ = -1;
                p.x._3_1_ = -1;
                p.y._0_1_ = -1;
                p.y._1_1_ = -1;
                p.y._2_1_ = -0x11;
                p.y._3_1_ = '\x7f';
                p.z._0_1_ = -1;
                p.z._1_1_ = -1;
                p.z._2_1_ = -1;
                p.z._3_1_ = -1;
                acStack_1ac[0] = -1;
                acStack_1ac[1] = -1;
                acStack_1ac[2] = -0x11;
                acStack_1ac[3] = '\x7f';
                local_1a8._0_4_ = -NAN;
                local_1a8._4_4_ = NAN;
                uStack_1a0._0_4_ = -NAN;
                uStack_1a0._4_4_ = -NAN;
                local_198[0] = -NAN;
                local_198[1] = -NAN;
                local_198[2] = -NAN;
                local_198[3] = -NAN;
                for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                  for (lVar52 = 0; fVar48 = local_198[3], fVar7 = local_198[2],
                      fVar61 = local_198[1], fVar151 = local_198[0], fVar118 = local_1a8._4_4_,
                      fVar90 = (float)local_1a8, lVar52 != 3; lVar52 = lVar52 + 1) {
                    fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                    (&rand_8)[lVar52]._state = (unsigned_long)(double)fVar90;
                    fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                    *(double *)(&p1.x + lVar52 * 2) = (double)fVar90;
                  }
                  uVar11 = CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                  uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                  uVar19 = CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
                  uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],uVar19));
                  max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                  max.y = (short)((uint)uVar11 >> 0x10);
                  sStack_114 = (short)((uint6)uVar17 >> 0x20);
                  sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >> 0x30);
                  sStack_10c = (short)((uint6)uVar20 >> 0x20);
                  sStack_10a = (short)(CONCAT17(acStack_1ac[3],CONCAT16(acStack_1ac[2],uVar20)) >>
                                      0x30);
                  rand_2._state._0_2_ = SUB42((float)uStack_1a0,0);
                  rand_2._state._2_2_ = (short)((uint)(float)uStack_1a0 >> 0x10);
                  rand_2._state._4_2_ = SUB42(uStack_1a0._4_4_,0);
                  rand_2._state._6_2_ = (short)((uint)uStack_1a0._4_4_ >> 0x10);
                  for (lVar52 = 0; lVar52 != 3; lVar52 = lVar52 + 1) {
                    dVar120 = (double)(&rand_8)[lVar52]._state;
                    if (*(double *)(&max + lVar52 * 2) <= (double)(&rand_8)[lVar52]._state) {
                      dVar120 = *(double *)(&max + lVar52 * 2);
                    }
                    *(double *)(&max + lVar52 * 2) = dVar120;
                    dVar120 = *(double *)(&p1.x + lVar52 * 2);
                    if (*(double *)(&p1.x + lVar52 * 2) <= (double)(&rand_2)[lVar52]._state) {
                      dVar120 = (double)(&rand_2)[lVar52]._state;
                    }
                    (&rand_2)[lVar52]._state = (unsigned_long)dVar120;
                  }
                  min.x = (short)rand_8._state;
                  min.y = rand_8._state._2_2_;
                  Imath_3_2::Box<Imath_3_2::Vec3<double>_>::extendBy
                            ((Box<Imath_3_2::Vec3<double>_> *)&p,
                             (Box<Imath_3_2::Vec3<double>_> *)&min);
                  dVar120 = (double)CONCAT17(p.y._3_1_,
                                             CONCAT16(p.y._2_1_,
                                                      CONCAT15(p.y._1_1_,
                                                               CONCAT14(p.y._0_1_,
                                                                        CONCAT13(p.x._3_1_,
                                                                                 CONCAT12(p.x._2_1_,
                                                                                          CONCAT11(p
                                                  .x._1_1_,p.x._0_1_)))))));
                  if ((((dVar120 !=
                         (double)CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)))) ||
                       (NAN(dVar120) ||
                        NAN((double)CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x))))
                       )) || ((dVar120 = (double)CONCAT17(acStack_1ac[3],
                                                          CONCAT16(acStack_1ac[2],
                                                                   CONCAT15(acStack_1ac[1],
                                                                            CONCAT14(acStack_1ac[0],
                                                                                     CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                              , dVar120 != (double)CONCAT26(sStack_10a,CONCAT24(sStack_10c,uVar19))
                              || (((NAN(dVar120) ||
                                    NAN((double)CONCAT26(sStack_10a,CONCAT24(sStack_10c,uVar19))) ||
                                   ((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                                    (double)CONCAT44(fVar118,fVar90))) ||
                                  (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) ||
                                   NAN((double)CONCAT44(fVar118,fVar90)))))))) ||
                     ((((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                        (double)CONCAT26(rand_2._state._6_2_,
                                         CONCAT24(rand_2._state._4_2_,
                                                  CONCAT22(rand_2._state._2_2_,(short)rand_2._state)
                                                 )) ||
                       (NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0)) ||
                        NAN((double)CONCAT26(rand_2._state._6_2_,
                                             CONCAT24(rand_2._state._4_2_,
                                                      CONCAT22(rand_2._state._2_2_,
                                                               (short)rand_2._state)))))) ||
                      (((double)CONCAT44(local_198[1],local_198[0]) !=
                        (double)CONCAT44(fVar61,fVar151) ||
                       (((NAN((double)CONCAT44(local_198[1],local_198[0])) ||
                          NAN((double)CONCAT44(fVar61,fVar151)) ||
                         ((double)CONCAT44(local_198[3],local_198[2]) !=
                          (double)CONCAT44(fVar48,fVar7))) ||
                        (NAN((double)CONCAT44(local_198[3],local_198[2])) ||
                         NAN((double)CONCAT44(fVar48,fVar7)))))))))) {
                    pcVar58 = 
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec3<double>]"
                    ;
                    goto LAB_0011442d;
                  }
                }
                poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
                poVar51 = std::operator<<(poVar51,"V4s");
                std::endl<char,std::char_traits<char>>(poVar51);
                p.x._0_1_ = -1;
                p.x._1_1_ = '\x7f';
                p.x._2_1_ = -1;
                p.x._3_1_ = '\x7f';
                p.y._0_1_ = -1;
                p.y._1_1_ = '\x7f';
                p.y._2_1_ = -1;
                p.y._3_1_ = '\x7f';
                p.z._0_1_ = '\0';
                p.z._1_1_ = -0x80;
                p.z._2_1_ = '\0';
                p.z._3_1_ = -0x80;
                acStack_1ac[0] = '\0';
                acStack_1ac[1] = -0x80;
                acStack_1ac[2] = '\0';
                acStack_1ac[3] = -0x80;
                min.x = 0x7fff;
                min.y = 0x7fff;
                Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                          ((Box<Imath_3_2::Vec4<short>_> *)&p,(Box<Imath_3_2::Vec4<short>_> *)&min);
                auVar103[0] = -(p.x._0_1_ == -1);
                auVar103[1] = -(p.x._1_1_ == '\x7f');
                auVar103[2] = -(p.x._2_1_ == -1);
                auVar103[3] = -(p.x._3_1_ == '\x7f');
                auVar103[4] = -(p.y._0_1_ == -1);
                auVar103[5] = -(p.y._1_1_ == '\x7f');
                auVar103[6] = -(p.y._2_1_ == -1);
                auVar103[7] = -(p.y._3_1_ == '\x7f');
                auVar103[8] = -(p.z._0_1_ == '\0');
                auVar103[9] = -(p.z._1_1_ == -0x80);
                auVar103[10] = -(p.z._2_1_ == '\0');
                auVar103[0xb] = -(p.z._3_1_ == -0x80);
                auVar103[0xc] = -(acStack_1ac[0] == '\0');
                auVar103[0xd] = -(acStack_1ac[1] == -0x80);
                auVar103[0xe] = -(acStack_1ac[2] == '\0');
                auVar103[0xf] = -(acStack_1ac[3] == -0x80);
                if ((ushort)((ushort)(SUB161(auVar103 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar103 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar103 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar103 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar103 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar103 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar103 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar103 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar103 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar103 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar103 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar103 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar103 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar103 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar103 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar103[0xf] >> 7) << 0xf) == 0xffff) {
                  p.x._0_1_ = '\0';
                  p.x._1_1_ = '\0';
                  p.x._2_1_ = '\0';
                  p.x._3_1_ = '\0';
                  p.y._0_1_ = '\0';
                  p.y._1_1_ = '\0';
                  p.y._2_1_ = '\0';
                  p.y._3_1_ = '\0';
                  p.z._0_1_ = '\0';
                  p.z._1_1_ = '\0';
                  p.z._2_1_ = '\0';
                  p.z._3_1_ = '\0';
                  acStack_1ac[0] = '\0';
                  acStack_1ac[1] = '\0';
                  acStack_1ac[2] = '\0';
                  acStack_1ac[3] = '\0';
                  local_1a8._0_4_ = 0.0;
                  local_1a8._4_4_ = 0.0;
                  (anonymous_namespace)::permutations<Imath_3_2::Vec4<short>>
                            ((vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                              *)&p);
                  lVar52 = CONCAT17(p.y._3_1_,
                                    CONCAT16(p.y._2_1_,
                                             CONCAT15(p.y._1_1_,
                                                      CONCAT14(p.y._0_1_,
                                                               CONCAT13(p.x._3_1_,
                                                                        CONCAT12(p.x._2_1_,
                                                                                 CONCAT11(p.x._1_1_,
                                                                                          p.x._0_1_)
                                                                                ))))));
                  lVar86 = CONCAT17(acStack_1ac[3],
                                    CONCAT16(acStack_1ac[2],
                                             CONCAT15(acStack_1ac[1],
                                                      CONCAT14(acStack_1ac[0],
                                                               CONCAT13(p.z._3_1_,
                                                                        CONCAT12(p.z._2_1_,
                                                                                 CONCAT11(p.z._1_1_,
                                                                                          p.z._0_1_)
                                                                                ))))));
                  for (uVar54 = 0; (ulong)uVar54 < (ulong)(lVar86 - lVar52 >> 3);
                      uVar54 = uVar54 + 1) {
                    for (uVar67 = 0; (ulong)uVar67 < (ulong)(lVar86 - lVar52 >> 3);
                        uVar67 = uVar67 + 1) {
                      uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar54 * 8);
                      sVar78 = -(short)uVar8;
                      sVar81 = -(short)((ulong)uVar8 >> 0x10);
                      uVar9 = *(undefined8 *)(lVar52 + (ulong)uVar67 * 8);
                      min.x = 0x7fff;
                      min.y = 0x7fff;
                      sStack_110 = (short)uVar9;
                      sStack_10e = (short)((ulong)uVar9 >> 0x10);
                      sStack_10c = (short)((ulong)uVar9 >> 0x20);
                      sStack_10a = (short)((ulong)uVar9 >> 0x30);
                      max.x = sVar78;
                      max.y = sVar81;
                      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                                ((Box<Imath_3_2::Vec4<short>_> *)&min,
                                 (Box<Imath_3_2::Vec4<short>_> *)&max);
                      auVar104._0_2_ = -(ushort)(min.x == sVar78);
                      auVar104._2_2_ = -(ushort)(min.y == sVar81);
                      auVar104._4_2_ = -(ushort)((short)((ulong)uVar8 >> 0x20) == -0x7fff);
                      auVar104._6_2_ = -(ushort)((short)((ulong)uVar8 >> 0x30) == -0x7fff);
                      auVar104._8_2_ = -(ushort)(sStack_110 == -0x8000);
                      auVar104._10_2_ = -(ushort)(sStack_10e == -0x8000);
                      auVar104._12_2_ = -(ushort)(sStack_10c == -0x8000);
                      auVar104._14_2_ = -(ushort)(sStack_10a == -0x8000);
                      auVar93 = packsswb(auVar104,auVar104);
                      if ((byte)(SUB161(auVar93 >> 7,0) & 1 | (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                        pcVar58 = 
                        "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                        ;
                        goto LAB_00113263;
                      }
                      rand_2._state._0_2_ = 0x7fff;
                      rand_2._state._2_2_ = 0x7fff;
                      rand_2._state._4_2_ = 0x7fff;
                      rand_2._state._6_2_ = 0x7fff;
                      max.x = sVar78;
                      max.y = sVar81;
                      Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                                ((Box<Imath_3_2::Vec4<short>_> *)&max,
                                 (Box<Imath_3_2::Vec4<short>_> *)&rand_2);
                      auVar105._0_2_ = -(ushort)(sVar78 == max.x);
                      auVar105._2_2_ = -(ushort)(sVar81 == max.y);
                      auVar105._4_2_ = 0xffff;
                      auVar105._6_2_ = 0xffff;
                      auVar105._8_2_ = 0xffff;
                      auVar105._10_2_ = 0xffff;
                      auVar105._12_2_ = 0xffff;
                      auVar105._14_2_ = 0xffff;
                      auVar93 = packsswb(auVar105,auVar105);
                      if ((byte)(SUB161(auVar93 >> 7,0) & 1 | (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                 (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                        pcVar58 = 
                        "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                        ;
                        goto LAB_00113282;
                      }
                      lVar52 = CONCAT17(p.y._3_1_,
                                        CONCAT16(p.y._2_1_,
                                                 CONCAT15(p.y._1_1_,
                                                          CONCAT14(p.y._0_1_,
                                                                   CONCAT13(p.x._3_1_,
                                                                            CONCAT12(p.x._2_1_,
                                                                                     CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_)))))));
                      lVar86 = CONCAT17(acStack_1ac[3],
                                        CONCAT16(acStack_1ac[2],
                                                 CONCAT15(acStack_1ac[1],
                                                          CONCAT14(acStack_1ac[0],
                                                                   CONCAT13(p.z._3_1_,
                                                                            CONCAT12(p.z._2_1_,
                                                                                     CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_)))))));
                    }
                  }
                  std::
                  _Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>::
                  ~_Vector_base((_Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                 *)&p);
                  max.x = 0x5a5a;
                  max.y = 0x5a5a;
                  p.x._0_1_ = -1;
                  p.x._1_1_ = '\x7f';
                  p.x._2_1_ = -1;
                  p.x._3_1_ = '\x7f';
                  p.y._0_1_ = -1;
                  p.y._1_1_ = '\x7f';
                  p.y._2_1_ = -1;
                  p.y._3_1_ = '\x7f';
                  p.z._0_1_ = '\0';
                  p.z._1_1_ = -0x80;
                  p.z._2_1_ = '\0';
                  p.z._3_1_ = -0x80;
                  acStack_1ac[0] = '\0';
                  acStack_1ac[1] = -0x80;
                  acStack_1ac[2] = '\0';
                  acStack_1ac[3] = -0x80;
                  for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                    for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                      fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&max,0.0,999.0);
                      *(short *)((long)&p1.x + lVar52 * 2) = (short)(int)fVar90;
                      fVar90 = Imath_3_2::Rand32::nextf((Rand32 *)&max,1000.0,1999.0);
                      *(short *)(local_68 + lVar52 * 2 + -8) = (short)(int)fVar90;
                    }
                    uVar11 = CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                    uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                    uVar19 = CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
                    uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],uVar19));
                    rand_2._state._0_2_ = CONCAT11(p.x._1_1_,p.x._0_1_);
                    rand_2._state._2_2_ = (short)((uint)uVar11 >> 0x10);
                    rand_2._state._4_2_ = (short)((uint6)uVar17 >> 0x20);
                    rand_2._state._6_2_ =
                         (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >> 0x30);
                    rand_8._state._0_2_ = CONCAT11(p.z._1_1_,p.z._0_1_);
                    rand_8._state._2_2_ = (short)((uint)uVar19 >> 0x10);
                    rand_8._state._4_2_ = (short)((uint6)uVar20 >> 0x20);
                    rand_8._state._6_2_ =
                         (short)(CONCAT17(acStack_1ac[3],CONCAT16(acStack_1ac[2],uVar20)) >> 0x30);
                    for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                      sVar78 = *(short *)((long)&p1.x + lVar52 * 2);
                      sVar81 = *(short *)((long)&rand_2._state + lVar52 * 2);
                      if (sVar78 < sVar81) {
                        sVar81 = sVar78;
                      }
                      *(short *)((long)&rand_2._state + lVar52 * 2) = sVar81;
                      sVar78 = *(short *)((long)&rand_8._state + lVar52 * 2);
                      sVar81 = *(short *)(local_68 + lVar52 * 2 + -8);
                      if (*(short *)(local_68 + lVar52 * 2 + -8) < sVar78) {
                        sVar81 = sVar78;
                      }
                      *(short *)((long)&rand_8._state + lVar52 * 2) = sVar81;
                    }
                    min.x = SUB42(p1.x,0);
                    min.y = (short)((uint)p1.x >> 0x10);
                    Imath_3_2::Box<Imath_3_2::Vec4<short>_>::extendBy
                              ((Box<Imath_3_2::Vec4<short>_> *)&p,
                               (Box<Imath_3_2::Vec4<short>_> *)&min);
                    if (((((CONCAT11(p.x._1_1_,p.x._0_1_) != (short)rand_2._state) ||
                          (CONCAT11(p.x._3_1_,p.x._2_1_) != rand_2._state._2_2_)) ||
                         (CONCAT11(p.y._1_1_,p.y._0_1_) != rand_2._state._4_2_)) ||
                        ((CONCAT11(p.y._3_1_,p.y._2_1_) != rand_2._state._6_2_ ||
                         (CONCAT11(p.z._1_1_,p.z._0_1_) != (short)rand_8._state)))) ||
                       ((CONCAT11(p.z._3_1_,p.z._2_1_) != rand_8._state._2_2_ ||
                        ((CONCAT11(acStack_1ac[1],acStack_1ac[0]) != rand_8._state._4_2_ ||
                         (CONCAT11(acStack_1ac[3],acStack_1ac[2]) != rand_8._state._6_2_)))))) {
                      pcVar58 = 
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                      ;
                      goto LAB_0011442d;
                    }
                  }
                  poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
                  poVar51 = std::operator<<(poVar51,"V4i");
                  std::endl<char,std::char_traits<char>>(poVar51);
                  p.x._0_1_ = -1;
                  p.x._1_1_ = -1;
                  p.x._2_1_ = -1;
                  p.x._3_1_ = '\x7f';
                  p.y._0_1_ = -1;
                  p.y._1_1_ = -1;
                  p.y._2_1_ = -1;
                  p.y._3_1_ = '\x7f';
                  p.z._0_1_ = -1;
                  p.z._1_1_ = -1;
                  p.z._2_1_ = -1;
                  p.z._3_1_ = '\x7f';
                  acStack_1ac[0] = -1;
                  acStack_1ac[1] = -1;
                  acStack_1ac[2] = -1;
                  acStack_1ac[3] = '\x7f';
                  local_1a8._0_4_ = -0.0;
                  local_1a8._4_4_ = -0.0;
                  uStack_1a0._0_4_ = -0.0;
                  uStack_1a0._4_4_ = -0.0;
                  min.x = -1;
                  min.y = 0x7fff;
                  Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                            ((Box<Imath_3_2::Vec4<int>_> *)&p,(Box<Imath_3_2::Vec4<int>_> *)&min);
                  auVar106._0_4_ = -(uint)((float)local_1a8 == -0.0);
                  auVar106._4_4_ = -(uint)(local_1a8._4_4_ == -0.0);
                  auVar106._8_4_ = -(uint)((float)uStack_1a0 == -0.0);
                  auVar106._12_4_ = -(uint)(uStack_1a0._4_4_ == -0.0);
                  auVar139._0_4_ =
                       -(uint)(CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))
                              == 0x7fffffff);
                  auVar139._4_4_ =
                       -(uint)(CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))
                              == 0x7fffffff);
                  auVar139._8_4_ =
                       -(uint)(CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                              == 0x7fffffff);
                  auVar139._12_4_ =
                       -(uint)(CONCAT13(acStack_1ac[3],
                                        CONCAT12(acStack_1ac[2],
                                                 CONCAT11(acStack_1ac[1],acStack_1ac[0]))) ==
                              0x7fffffff);
                  iVar50 = movmskps(extraout_EAX_08,auVar139 & auVar106);
                  if (iVar50 == 0xf) {
                    rand_2._state._0_2_ = 0;
                    rand_2._state._2_2_ = 0;
                    rand_2._state._4_2_ = 0;
                    rand_2._state._6_2_ = 0;
                    (anonymous_namespace)::permutations<Imath_3_2::Vec4<int>>
                              ((vector<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                *)&rand_2);
                    lVar52 = CONCAT26(rand_2._state._6_2_,
                                      CONCAT24(rand_2._state._4_2_,
                                               CONCAT22(rand_2._state._2_2_,(short)rand_2._state)));
                    for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 4); uVar54 = uVar54 + 1) {
                      for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 4); uVar67 = uVar67 + 1) {
                        piVar2 = (int *)(lVar52 + (ulong)uVar54 * 0x10);
                        iVar50 = piVar2[1];
                        iVar83 = piVar2[2];
                        iVar88 = piVar2[3];
                        VVar91 = (Vec2<short>)-*piVar2;
                        puVar3 = (undefined8 *)(lVar52 + (ulong)uVar67 * 0x10);
                        uVar8 = *puVar3;
                        uVar9 = puVar3[1];
                        p.x._0_1_ = -1;
                        p.x._1_1_ = -1;
                        p.x._2_1_ = -1;
                        p.x._3_1_ = '\x7f';
                        p.y._0_1_ = -1;
                        p.y._1_1_ = -1;
                        p.y._2_1_ = -1;
                        p.y._3_1_ = '\x7f';
                        p.z._0_1_ = -1;
                        p.z._1_1_ = -1;
                        p.z._2_1_ = -1;
                        p.z._3_1_ = '\x7f';
                        acStack_1ac[0] = -1;
                        acStack_1ac[1] = -1;
                        acStack_1ac[2] = -1;
                        acStack_1ac[3] = '\x7f';
                        local_1a8._0_4_ = -0.0;
                        local_1a8._4_4_ = -0.0;
                        uStack_1a0._0_4_ = -0.0;
                        uStack_1a0._4_4_ = -0.0;
                        fStack_160 = (float)uVar9;
                        fStack_15c = (float)((ulong)uVar9 >> 0x20);
                        min = VVar91;
                        Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                                  ((Box<Imath_3_2::Vec4<int>_> *)&p,
                                   (Box<Imath_3_2::Vec4<int>_> *)&min);
                        auVar107._0_4_ = -(uint)((float)local_1a8 == (float)uVar8);
                        auVar107._4_4_ = -(uint)(local_1a8._4_4_ == (float)((ulong)uVar8 >> 0x20));
                        auVar107._8_4_ = -(uint)((float)uStack_1a0 == fStack_160);
                        auVar107._12_4_ = -(uint)(uStack_1a0._4_4_ == fStack_15c);
                        VVar60.x._1_1_ = p.x._1_1_;
                        VVar60.x._0_1_ = p.x._0_1_;
                        VVar60.y._0_1_ = p.x._2_1_;
                        VVar60.y._1_1_ = p.x._3_1_;
                        auVar140._0_4_ = -(uint)(VVar60 == VVar91);
                        auVar140._4_4_ =
                             -(uint)(CONCAT13(p.y._3_1_,
                                              CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))) ==
                                    -iVar50);
                        auVar140._8_4_ =
                             -(uint)(CONCAT13(p.z._3_1_,
                                              CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))) ==
                                    -iVar83);
                        auVar140._12_4_ =
                             -(uint)(CONCAT13(acStack_1ac[3],
                                              CONCAT12(acStack_1ac[2],
                                                       CONCAT11(acStack_1ac[1],acStack_1ac[0]))) ==
                                    -iVar88);
                        auVar93 = packssdw(auVar140,auVar107);
                        auVar93 = packsswb(auVar93,auVar93);
                        if ((byte)(SUB161(auVar93 >> 7,0) & 1 | (SUB161(auVar93 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                          pcVar58 = 
                          "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<int>]"
                          ;
                          goto LAB_00113263;
                        }
                        max.x = -1;
                        max.y = 0x7fff;
                        min = VVar91;
                        Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                                  ((Box<Imath_3_2::Vec4<int>_> *)&min,
                                   (Box<Imath_3_2::Vec4<int>_> *)&max);
                        auVar141._8_4_ = 0xffffffff;
                        auVar141._0_8_ = 0xffffffffffffffff;
                        auVar141._12_4_ = 0xffffffff;
                        auVar108._0_4_ = -(uint)(VVar91 == min);
                        auVar108._4_4_ = 0xffffffff;
                        auVar108._8_4_ = 0xffffffff;
                        auVar108._12_4_ = 0xffffffff;
                        auVar93 = packssdw(auVar108,auVar141);
                        auVar93 = packsswb(auVar93,auVar93);
                        if ((byte)(SUB161(auVar93 >> 7,0) & 1 | (SUB161(auVar93 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                          pcVar58 = 
                          "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<int>]"
                          ;
                          goto LAB_00113282;
                        }
                        lVar52 = CONCAT26(rand_2._state._6_2_,
                                          CONCAT24(rand_2._state._4_2_,
                                                   CONCAT22(rand_2._state._2_2_,(short)rand_2._state
                                                           )));
                      }
                    }
                    std::_Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                    ::~_Vector_base((_Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                     *)&rand_2);
                    rand_23._state = 0x5a5a5a5a;
                    p.x._0_1_ = -1;
                    p.x._1_1_ = -1;
                    p.x._2_1_ = -1;
                    p.x._3_1_ = '\x7f';
                    p.y._0_1_ = -1;
                    p.y._1_1_ = -1;
                    p.y._2_1_ = -1;
                    p.y._3_1_ = '\x7f';
                    p.z._0_1_ = -1;
                    p.z._1_1_ = -1;
                    p.z._2_1_ = -1;
                    p.z._3_1_ = '\x7f';
                    acStack_1ac[0] = -1;
                    acStack_1ac[1] = -1;
                    acStack_1ac[2] = -1;
                    acStack_1ac[3] = '\x7f';
                    local_1a8._0_4_ = -0.0;
                    local_1a8._4_4_ = -0.0;
                    uStack_1a0._0_4_ = -0.0;
                    uStack_1a0._4_4_ = -0.0;
                    for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                      for (lVar52 = 0; fVar118 = uStack_1a0._4_4_, fVar90 = (float)uStack_1a0,
                          lVar52 != 4; lVar52 = lVar52 + 1) {
                        fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                        *(int *)((long)&rand_8._state + lVar52 * 4) = (int)fVar90;
                        fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                        (&p1.x)[lVar52] = (float)(int)fVar90;
                      }
                      uVar11 = CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))
                      ;
                      uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                      iVar83 = CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                      ;
                      uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],iVar83));
                      max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                      max.y = (short)((uint)uVar11 >> 0x10);
                      sStack_114 = (short)((uint6)uVar17 >> 0x20);
                      sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >> 0x30);
                      sStack_10c = (short)((uint6)uVar20 >> 0x20);
                      sStack_10a = (short)(CONCAT17(acStack_1ac[3],CONCAT16(acStack_1ac[2],uVar20))
                                          >> 0x30);
                      rand_2._state._0_2_ = SUB42((float)local_1a8,0);
                      rand_2._state._2_2_ = (short)((uint)(float)local_1a8 >> 0x10);
                      rand_2._state._4_2_ = SUB42(local_1a8._4_4_,0);
                      rand_2._state._6_2_ = (short)((uint)local_1a8._4_4_ >> 0x10);
                      for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                        VVar91 = *(Vec2<short> *)((long)&rand_8._state + lVar52 * 4);
                        VVar60 = (&max)[lVar52];
                        if ((int)VVar91 < (int)(&max)[lVar52]) {
                          VVar60 = VVar91;
                        }
                        (&max)[lVar52] = VVar60;
                        fVar151 = *(float *)((long)&rand_2._state + lVar52 * 4);
                        fVar61 = (&p1.x)[lVar52];
                        if ((int)(&p1.x)[lVar52] < (int)fVar151) {
                          fVar61 = fVar151;
                        }
                        *(float *)((long)&rand_2._state + lVar52 * 4) = fVar61;
                      }
                      min.x = (short)rand_8._state;
                      min.y = rand_8._state._2_2_;
                      Imath_3_2::Box<Imath_3_2::Vec4<int>_>::extendBy
                                ((Box<Imath_3_2::Vec4<int>_> *)&p,(Box<Imath_3_2::Vec4<int>_> *)&min
                                );
                      if ((((((CONCAT13(p.x._3_1_,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))
                               != CONCAT22(max.y,max.x)) ||
                             (CONCAT13(p.y._3_1_,CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_)))
                              != CONCAT22(sStack_112,sStack_114))) ||
                            (CONCAT13(p.z._3_1_,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                             != iVar83)) ||
                           ((CONCAT13(acStack_1ac[3],
                                      CONCAT12(acStack_1ac[2],
                                               CONCAT11(acStack_1ac[1],acStack_1ac[0]))) !=
                             CONCAT22(sStack_10a,sStack_10c) ||
                            ((float)local_1a8 !=
                             (float)CONCAT22(rand_2._state._2_2_,(short)rand_2._state))))) ||
                          (local_1a8._4_4_ !=
                           (float)CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_))) ||
                         (((float)uStack_1a0 != fVar90 || (uStack_1a0._4_4_ != fVar118)))) {
                        pcVar58 = 
                        "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<int>]"
                        ;
                        goto LAB_0011442d;
                      }
                    }
                    poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type ");
                    poVar51 = std::operator<<(poVar51,"V4i64");
                    std::endl<char,std::char_traits<char>>(poVar51);
                    p.x._0_1_ = -1;
                    p.x._1_1_ = -1;
                    p.x._2_1_ = -1;
                    p.x._3_1_ = -1;
                    p.y._0_1_ = -1;
                    p.y._1_1_ = -1;
                    p.y._2_1_ = -1;
                    p.y._3_1_ = '\x7f';
                    p.z._0_1_ = -1;
                    p.z._1_1_ = -1;
                    p.z._2_1_ = -1;
                    p.z._3_1_ = -1;
                    acStack_1ac[0] = -1;
                    acStack_1ac[1] = -1;
                    acStack_1ac[2] = -1;
                    acStack_1ac[3] = '\x7f';
                    local_1a8._0_4_ = -NAN;
                    local_1a8._4_4_ = NAN;
                    uStack_1a0._0_4_ = -NAN;
                    uStack_1a0._4_4_ = NAN;
                    local_198[0] = 0.0;
                    local_198[1] = -0.0;
                    local_198[2] = 0.0;
                    local_198[3] = -0.0;
                    stack0xfffffffffffffe80 = -0.0;
                    local_188._0_8_ = 0x8000000000000000;
                    min.x = -1;
                    min.y = -1;
                    Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                              ((Box<Imath_3_2::Vec4<long>_> *)&p,(Box<Imath_3_2::Vec4<long>_> *)&min
                              );
                    if (((((CONCAT17(p.y._3_1_,
                                     CONCAT16(p.y._2_1_,
                                              CONCAT15(p.y._1_1_,
                                                       CONCAT14(p.y._0_1_,
                                                                CONCAT13(p.x._3_1_,
                                                                         CONCAT12(p.x._2_1_,
                                                                                  CONCAT11(p.x._1_1_
                                                  ,p.x._0_1_))))))) == 0x7fffffffffffffff) &&
                          (CONCAT17(acStack_1ac[3],
                                    CONCAT16(acStack_1ac[2],
                                             CONCAT15(acStack_1ac[1],
                                                      CONCAT14(acStack_1ac[0],
                                                               CONCAT13(p.z._3_1_,
                                                                        CONCAT12(p.z._2_1_,
                                                                                 CONCAT11(p.z._1_1_,
                                                                                          p.z._0_1_)
                                                                                )))))) ==
                           0x7fffffffffffffff)) &&
                         (CONCAT44(local_1a8._4_4_,(float)local_1a8) == 0x7fffffffffffffff)) &&
                        ((CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) == 0x7fffffffffffffff &&
                         (CONCAT44(local_198[1],local_198[0]) == -0x8000000000000000)))) &&
                       ((CONCAT44(local_198[3],local_198[2]) == -0x8000000000000000 &&
                        (((double)local_188._0_8_ == -0.0 && (stack0xfffffffffffffe80 == -0.0))))))
                    {
                      rand_2._state._0_2_ = 0;
                      rand_2._state._2_2_ = 0;
                      rand_2._state._4_2_ = 0;
                      rand_2._state._6_2_ = 0;
                      (anonymous_namespace)::permutations<Imath_3_2::Vec4<long>>
                                ((vector<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                  *)&rand_2);
                      lVar52 = CONCAT26(rand_2._state._6_2_,
                                        CONCAT24(rand_2._state._4_2_,
                                                 CONCAT22(rand_2._state._2_2_,(short)rand_2._state))
                                       );
                      for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 5); uVar54 = uVar54 + 1) {
                        lVar86 = (ulong)uVar54 * 0x20;
                        for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 5); uVar67 = uVar67 + 1)
                        {
                          lVar63 = -*(long *)(lVar52 + lVar86);
                          lVar76 = *(long *)(lVar52 + 8 + lVar86);
                          lVar80 = *(long *)(lVar52 + 0x10 + lVar86);
                          lVar64 = *(long *)(lVar52 + 0x18 + lVar86);
                          lVar57 = (ulong)uVar67 * 0x20;
                          lVar77 = *(long *)(lVar52 + lVar57);
                          lVar87 = *(long *)(lVar52 + 8 + lVar57);
                          dVar120 = *(double *)(lVar52 + 0x10 + lVar57);
                          dVar119 = *(double *)(lVar52 + 0x18 + lVar57);
                          p.x._0_1_ = -1;
                          p.x._1_1_ = -1;
                          p.x._2_1_ = -1;
                          p.x._3_1_ = -1;
                          p.y._0_1_ = -1;
                          p.y._1_1_ = -1;
                          p.y._2_1_ = -1;
                          p.y._3_1_ = '\x7f';
                          p.z._0_1_ = -1;
                          p.z._1_1_ = -1;
                          p.z._2_1_ = -1;
                          p.z._3_1_ = -1;
                          acStack_1ac[0] = -1;
                          acStack_1ac[1] = -1;
                          acStack_1ac[2] = -1;
                          acStack_1ac[3] = '\x7f';
                          local_1a8._0_4_ = -NAN;
                          local_1a8._4_4_ = NAN;
                          uStack_1a0._0_4_ = -NAN;
                          uStack_1a0._4_4_ = NAN;
                          local_198[0] = 0.0;
                          local_198[1] = -0.0;
                          stack0xfffffffffffffe80 = -0.0;
                          local_188._0_8_ = 0x8000000000000000;
                          min.x = (short)lVar63;
                          sVar78 = min.x;
                          min.y = (short)((ulong)lVar63 >> 0x10);
                          sVar81 = min.y;
                          sStack_174 = (short)((ulong)lVar63 >> 0x20);
                          sStack_172 = (short)((ulong)lVar63 >> 0x30);
                          local_198[2] = local_198[0];
                          local_198[3] = local_198[1];
                          Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                                    ((Box<Imath_3_2::Vec4<long>_> *)&p,
                                     (Box<Imath_3_2::Vec4<long>_> *)&min);
                          if ((((CONCAT17(p.y._3_1_,
                                          CONCAT16(p.y._2_1_,
                                                   CONCAT15(p.y._1_1_,
                                                            CONCAT14(p.y._0_1_,
                                                                     CONCAT13(p.x._3_1_,
                                                                              CONCAT12(p.x._2_1_,
                                                                                       CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_))))))) != lVar63) ||
                               (CONCAT17(acStack_1ac[3],
                                         CONCAT16(acStack_1ac[2],
                                                  CONCAT15(acStack_1ac[1],
                                                           CONCAT14(acStack_1ac[0],
                                                                    CONCAT13(p.z._3_1_,
                                                                             CONCAT12(p.z._2_1_,
                                                                                      CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))) != -lVar76)) ||
                              (CONCAT44(local_1a8._4_4_,(float)local_1a8) != -lVar80)) ||
                             (((CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) != -lVar64 ||
                               (CONCAT44(local_198[1],local_198[0]) != lVar77)) ||
                              ((CONCAT44(local_198[3],local_198[2]) != lVar87 ||
                               (((double)local_188._0_8_ != dVar120 ||
                                (stack0xfffffffffffffe80 != dVar119)))))))) {
                            pcVar58 = 
                            "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<long>]"
                            ;
                            goto LAB_00113263;
                          }
                          max.x = -1;
                          max.y = -1;
                          min.x = sVar78;
                          min.y = sVar81;
                          Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                                    ((Box<Imath_3_2::Vec4<long>_> *)&min,
                                     (Box<Imath_3_2::Vec4<long>_> *)&max);
                          if (CONCAT26(sStack_172,CONCAT24(sStack_174,min)) != lVar63) {
                            pcVar58 = 
                            "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<long>]"
                            ;
                            goto LAB_00113282;
                          }
                          lVar52 = CONCAT26(rand_2._state._6_2_,
                                            CONCAT24(rand_2._state._4_2_,
                                                     CONCAT22(rand_2._state._2_2_,
                                                              (short)rand_2._state)));
                        }
                      }
                      std::
                      _Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>::
                      ~_Vector_base((_Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                     *)&rand_2);
                      rand_23._state = 0x5a5a5a5a;
                      p.x._0_1_ = -1;
                      p.x._1_1_ = -1;
                      p.x._2_1_ = -1;
                      p.x._3_1_ = -1;
                      p.y._0_1_ = -1;
                      p.y._1_1_ = -1;
                      p.y._2_1_ = -1;
                      p.y._3_1_ = '\x7f';
                      p.z._0_1_ = -1;
                      p.z._1_1_ = -1;
                      p.z._2_1_ = -1;
                      p.z._3_1_ = -1;
                      acStack_1ac[0] = -1;
                      acStack_1ac[1] = -1;
                      acStack_1ac[2] = -1;
                      acStack_1ac[3] = '\x7f';
                      local_1a8._0_4_ = -NAN;
                      local_1a8._4_4_ = NAN;
                      uStack_1a0._0_4_ = -NAN;
                      uStack_1a0._4_4_ = NAN;
                      local_198[0] = 0.0;
                      local_198[1] = -0.0;
                      stack0xfffffffffffffe80 = -0.0;
                      local_188._0_8_ = 0x8000000000000000;
                      local_198[2] = local_198[0];
                      local_198[3] = local_198[1];
                      for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                        for (lVar52 = 0; auVar93 = _local_188, fVar48 = local_198[3],
                            fVar7 = local_198[2], fVar61 = uStack_1a0._4_4_,
                            fVar151 = (float)uStack_1a0, fVar118 = local_1a8._4_4_,
                            fVar90 = (float)local_1a8, lVar52 != 4; lVar52 = lVar52 + 1) {
                          fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                          (&rand_8)[lVar52]._state = (long)fVar90;
                          fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                          *(long *)(&p1.x + lVar52 * 2) = (long)fVar90;
                        }
                        uVar11 = CONCAT13(p.x._3_1_,
                                          CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                        uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                        uVar19 = CONCAT13(p.z._3_1_,
                                          CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
                        uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],uVar19));
                        max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                        max.y = (short)((uint)uVar11 >> 0x10);
                        sStack_114 = (short)((uint6)uVar17 >> 0x20);
                        sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >> 0x30)
                        ;
                        sStack_10c = (short)((uint6)uVar20 >> 0x20);
                        sStack_10a = (short)(CONCAT17(acStack_1ac[3],CONCAT16(acStack_1ac[2],uVar20)
                                                     ) >> 0x30);
                        rand_2._state._0_2_ = SUB42(local_198[0],0);
                        rand_2._state._2_2_ = (short)((uint)local_198[0] >> 0x10);
                        rand_2._state._4_2_ = SUB42(local_198[1],0);
                        rand_2._state._6_2_ = (short)((uint)local_198[1] >> 0x10);
                        for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                          uVar56 = *(unsigned_long *)(&max + lVar52 * 2);
                          if ((long)(&rand_8)[lVar52]._state <
                              (long)*(unsigned_long *)(&max + lVar52 * 2)) {
                            uVar56 = (&rand_8)[lVar52]._state;
                          }
                          *(unsigned_long *)(&max + lVar52 * 2) = uVar56;
                          uVar56 = *(unsigned_long *)(&p1.x + lVar52 * 2);
                          if ((long)*(unsigned_long *)(&p1.x + lVar52 * 2) <
                              (long)(&rand_2)[lVar52]._state) {
                            uVar56 = (&rand_2)[lVar52]._state;
                          }
                          (&rand_2)[lVar52]._state = uVar56;
                        }
                        min.x = (short)rand_8._state;
                        min.y = rand_8._state._2_2_;
                        Imath_3_2::Box<Imath_3_2::Vec4<long>_>::extendBy
                                  ((Box<Imath_3_2::Vec4<long>_> *)&p,
                                   (Box<Imath_3_2::Vec4<long>_> *)&min);
                        if (((((CONCAT17(p.y._3_1_,
                                         CONCAT16(p.y._2_1_,
                                                  CONCAT15(p.y._1_1_,
                                                           CONCAT14(p.y._0_1_,
                                                                    CONCAT13(p.x._3_1_,
                                                                             CONCAT12(p.x._2_1_,
                                                                                      CONCAT11(p.x.
                                                  _1_1_,p.x._0_1_))))))) !=
                                CONCAT26(sStack_112,CONCAT24(sStack_114,CONCAT22(max.y,max.x)))) ||
                              (CONCAT17(acStack_1ac[3],
                                        CONCAT16(acStack_1ac[2],
                                                 CONCAT15(acStack_1ac[1],
                                                          CONCAT14(acStack_1ac[0],
                                                                   CONCAT13(p.z._3_1_,
                                                                            CONCAT12(p.z._2_1_,
                                                                                     CONCAT11(p.z.
                                                  _1_1_,p.z._0_1_))))))) !=
                               CONCAT26(sStack_10a,CONCAT24(sStack_10c,uVar19)))) ||
                             (CONCAT44(local_1a8._4_4_,(float)local_1a8) != CONCAT44(fVar118,fVar90)
                             )) || ((CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                                     CONCAT44(fVar61,fVar151) ||
                                    (CONCAT44(local_198[1],local_198[0]) !=
                                     CONCAT26(rand_2._state._6_2_,
                                              CONCAT24(rand_2._state._4_2_,
                                                       CONCAT22(rand_2._state._2_2_,
                                                                (short)rand_2._state))))))) ||
                           ((CONCAT44(local_198[3],local_198[2]) != CONCAT44(fVar48,fVar7) ||
                            (((double)local_188._0_8_ != auVar93._0_8_ ||
                             (stack0xfffffffffffffe80 != auVar93._8_8_)))))) {
                          pcVar58 = 
                          "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<long>]"
                          ;
                          goto LAB_0011442d;
                        }
                      }
                      poVar51 = std::operator<<((ostream *)&std::cout,"    extendBy() box for type "
                                               );
                      poVar51 = std::operator<<(poVar51,"V4f");
                      std::endl<char,std::char_traits<char>>(poVar51);
                      p.x._0_1_ = -1;
                      p.x._1_1_ = -1;
                      p.x._2_1_ = '\x7f';
                      p.x._3_1_ = '\x7f';
                      p.y._0_1_ = -1;
                      p.y._1_1_ = -1;
                      p.y._2_1_ = '\x7f';
                      p.y._3_1_ = '\x7f';
                      p.z._0_1_ = -1;
                      p.z._1_1_ = -1;
                      p.z._2_1_ = '\x7f';
                      p.z._3_1_ = '\x7f';
                      acStack_1ac[0] = -1;
                      acStack_1ac[1] = -1;
                      acStack_1ac[2] = '\x7f';
                      acStack_1ac[3] = '\x7f';
                      local_1a8._0_4_ = -3.4028235e+38;
                      local_1a8._4_4_ = -3.4028235e+38;
                      uStack_1a0._0_4_ = -3.4028235e+38;
                      uStack_1a0._4_4_ = -3.4028235e+38;
                      min.x = -1;
                      min.y = 0x7f7f;
                      Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                                ((Box<Imath_3_2::Vec4<float>_> *)&p,
                                 (Box<Imath_3_2::Vec4<float>_> *)&min);
                      auVar109._4_4_ = -(uint)(local_1a8._4_4_ != -3.4028235e+38);
                      auVar109._0_4_ = -(uint)((float)local_1a8 != -3.4028235e+38);
                      auVar109._8_4_ = -(uint)((float)uStack_1a0 != -3.4028235e+38);
                      auVar109._12_4_ = -(uint)(uStack_1a0._4_4_ != -3.4028235e+38);
                      auVar142._4_4_ =
                           -(uint)((float)CONCAT13(p.y._3_1_,
                                                   CONCAT12(p.y._2_1_,CONCAT11(p.y._1_1_,p.y._0_1_))
                                                  ) != 3.4028235e+38);
                      auVar142._0_4_ =
                           -(uint)((float)CONCAT13(p.x._3_1_,
                                                   CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                                  ) != 3.4028235e+38);
                      auVar142._8_4_ =
                           -(uint)((float)CONCAT13(p.z._3_1_,
                                                   CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))
                                                  ) != 3.4028235e+38);
                      auVar142._12_4_ =
                           -(uint)((float)CONCAT13(acStack_1ac[3],
                                                   CONCAT12(acStack_1ac[2],
                                                            CONCAT11(acStack_1ac[1],acStack_1ac[0]))
                                                  ) != 3.4028235e+38);
                      auVar93 = packssdw(auVar142,auVar109);
                      if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar93 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar93 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar93 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar93 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar93 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar93 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar93 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar93 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar93 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar93 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar93[0xf]) {
                        rand_2._state._0_2_ = 0;
                        rand_2._state._2_2_ = 0;
                        rand_2._state._4_2_ = 0;
                        rand_2._state._6_2_ = 0;
                        (anonymous_namespace)::permutations<Imath_3_2::Vec4<float>>
                                  ((vector<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                    *)&rand_2);
                        lVar52 = CONCAT26(rand_2._state._6_2_,
                                          CONCAT24(rand_2._state._4_2_,
                                                   CONCAT22(rand_2._state._2_2_,(short)rand_2._state
                                                           )));
                        for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 4); uVar54 = uVar54 + 1)
                        {
                          for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 4);
                              uVar67 = uVar67 + 1) {
                            puVar69 = (ulong *)(lVar52 + (ulong)uVar54 * 0x10);
                            uVar55 = *puVar69;
                            fVar90 = *(float *)(puVar69 + 1);
                            fVar118 = *(float *)((long)puVar69 + 0xc);
                            min.y = (ushort)((uint)(int)*puVar69 >> 0x10) ^ 0x8000;
                            local_d8._0_8_ = uVar55 ^ 0x8000000080000000;
                            puVar3 = (undefined8 *)(lVar52 + (ulong)uVar67 * 0x10);
                            uVar8 = *puVar3;
                            uVar9 = puVar3[1];
                            p.x._0_1_ = -1;
                            p.x._1_1_ = -1;
                            p.x._2_1_ = '\x7f';
                            p.x._3_1_ = '\x7f';
                            p.y._0_1_ = -1;
                            p.y._1_1_ = -1;
                            p.y._2_1_ = '\x7f';
                            p.y._3_1_ = '\x7f';
                            p.z._0_1_ = -1;
                            p.z._1_1_ = -1;
                            p.z._2_1_ = '\x7f';
                            p.z._3_1_ = '\x7f';
                            acStack_1ac[0] = -1;
                            acStack_1ac[1] = -1;
                            acStack_1ac[2] = '\x7f';
                            acStack_1ac[3] = '\x7f';
                            local_1a8._0_4_ = -3.4028235e+38;
                            local_1a8._4_4_ = -3.4028235e+38;
                            uStack_1a0._0_4_ = -3.4028235e+38;
                            uStack_1a0._4_4_ = -3.4028235e+38;
                            min.x = (short)(int)*puVar69;
                            fStack_160 = (float)uVar9;
                            fStack_15c = (float)((ulong)uVar9 >> 0x20);
                            Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                                      ((Box<Imath_3_2::Vec4<float>_> *)&p,
                                       (Box<Imath_3_2::Vec4<float>_> *)&min);
                            auVar110._4_4_ =
                                 -(uint)((float)((ulong)uVar8 >> 0x20) == local_1a8._4_4_);
                            auVar110._0_4_ = -(uint)((float)uVar8 == (float)local_1a8);
                            auVar110._8_4_ = -(uint)(fStack_160 == (float)uStack_1a0);
                            auVar110._12_4_ = -(uint)(fStack_15c == uStack_1a0._4_4_);
                            auVar143._4_4_ =
                                 -(uint)((float)CONCAT13(p.y._3_1_,
                                                         CONCAT12(p.y._2_1_,
                                                                  CONCAT11(p.y._1_1_,p.y._0_1_))) ==
                                        SUB84(local_d8._0_8_,4));
                            auVar143._0_4_ =
                                 -(uint)((float)CONCAT13(p.x._3_1_,
                                                         CONCAT12(p.x._2_1_,
                                                                  CONCAT11(p.x._1_1_,p.x._0_1_))) ==
                                        (float)local_d8._0_8_);
                            auVar143._8_4_ =
                                 -(uint)((float)CONCAT13(p.z._3_1_,
                                                         CONCAT12(p.z._2_1_,
                                                                  CONCAT11(p.z._1_1_,p.z._0_1_))) ==
                                        -fVar90);
                            auVar143._12_4_ =
                                 -(uint)((float)CONCAT13(acStack_1ac[3],
                                                         CONCAT12(acStack_1ac[2],
                                                                  CONCAT11(acStack_1ac[1],
                                                                           acStack_1ac[0]))) ==
                                        -fVar118);
                            auVar93 = packssdw(auVar143,auVar110);
                            auVar93 = packsswb(auVar93,auVar93);
                            if ((byte)(SUB161(auVar93 >> 7,0) & 1 |
                                       (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                              pcVar58 = 
                              "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<float>]"
                              ;
                              goto LAB_00113263;
                            }
                            min.x = (short)uVar55;
                            min.y = SUB82(local_d8._0_8_,2);
                            max.x = -1;
                            max.y = 0x7f7f;
                            Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                                      ((Box<Imath_3_2::Vec4<float>_> *)&min,
                                       (Box<Imath_3_2::Vec4<float>_> *)&max);
                            auVar111._8_4_ = 0xffffffff;
                            auVar111._0_8_ = 0xffffffffffffffff;
                            auVar111._12_4_ = 0xffffffff;
                            auVar144._4_4_ = 0xffffffff;
                            auVar144._0_4_ = -(uint)((float)local_d8._0_8_ == (float)min);
                            auVar144._8_4_ = 0xffffffff;
                            auVar144._12_4_ = 0xffffffff;
                            auVar93 = packssdw(auVar144,auVar111);
                            auVar93 = packsswb(auVar93,auVar93);
                            if ((byte)(SUB161(auVar93 >> 7,0) & 1 |
                                       (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                              pcVar58 = 
                              "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<float>]"
                              ;
                              goto LAB_00113282;
                            }
                            lVar52 = CONCAT26(rand_2._state._6_2_,
                                              CONCAT24(rand_2._state._4_2_,
                                                       CONCAT22(rand_2._state._2_2_,
                                                                (short)rand_2._state)));
                          }
                        }
                        std::
                        _Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                        ::~_Vector_base((_Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                         *)&rand_2);
                        rand_23._state = 0x5a5a5a5a;
                        p.x._0_1_ = -1;
                        p.x._1_1_ = -1;
                        p.x._2_1_ = '\x7f';
                        p.x._3_1_ = '\x7f';
                        p.y._0_1_ = -1;
                        p.y._1_1_ = -1;
                        p.y._2_1_ = '\x7f';
                        p.y._3_1_ = '\x7f';
                        p.z._0_1_ = -1;
                        p.z._1_1_ = -1;
                        p.z._2_1_ = '\x7f';
                        p.z._3_1_ = '\x7f';
                        acStack_1ac[0] = -1;
                        acStack_1ac[1] = -1;
                        acStack_1ac[2] = '\x7f';
                        acStack_1ac[3] = '\x7f';
                        local_1a8._0_4_ = -3.4028235e+38;
                        local_1a8._4_4_ = -3.4028235e+38;
                        uStack_1a0._0_4_ = -3.4028235e+38;
                        uStack_1a0._4_4_ = -3.4028235e+38;
                        for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                          for (lVar52 = 0; fVar118 = uStack_1a0._4_4_, fVar90 = (float)uStack_1a0,
                              lVar52 != 4; lVar52 = lVar52 + 1) {
                            fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                            *(float *)((long)&rand_8._state + lVar52 * 4) = fVar90;
                            fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                            (&p1.x)[lVar52] = fVar90;
                          }
                          uVar11 = CONCAT13(p.x._3_1_,
                                            CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                          uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                          fVar151 = (float)CONCAT13(p.z._3_1_,
                                                    CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)
                                                            ));
                          uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],fVar151));
                          max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                          max.y = (short)((uint)uVar11 >> 0x10);
                          sStack_114 = (short)((uint6)uVar17 >> 0x20);
                          sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >>
                                              0x30);
                          sStack_10c = (short)((uint6)uVar20 >> 0x20);
                          sStack_10a = (short)(CONCAT17(acStack_1ac[3],
                                                        CONCAT16(acStack_1ac[2],uVar20)) >> 0x30);
                          rand_2._state._0_2_ = SUB42((float)local_1a8,0);
                          rand_2._state._2_2_ = (short)((uint)(float)local_1a8 >> 0x10);
                          rand_2._state._4_2_ = SUB42(local_1a8._4_4_,0);
                          rand_2._state._6_2_ = (short)((uint)local_1a8._4_4_ >> 0x10);
                          for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                            VVar91 = *(Vec2<short> *)((long)&rand_8._state + lVar52 * 4);
                            if ((float)(&max)[lVar52] <= (float)VVar91) {
                              VVar91 = (&max)[lVar52];
                            }
                            (&max)[lVar52] = VVar91;
                            fVar61 = *(float *)((long)&rand_2._state + lVar52 * 4);
                            fVar7 = (&p1.x)[lVar52];
                            if ((&p1.x)[lVar52] <= fVar61) {
                              fVar7 = fVar61;
                            }
                            *(float *)((long)&rand_2._state + lVar52 * 4) = fVar7;
                          }
                          min.x = (short)rand_8._state;
                          min.y = rand_8._state._2_2_;
                          Imath_3_2::Box<Imath_3_2::Vec4<float>_>::extendBy
                                    ((Box<Imath_3_2::Vec4<float>_> *)&p,
                                     (Box<Imath_3_2::Vec4<float>_> *)&min);
                          fVar61 = (float)CONCAT13(p.x._3_1_,
                                                   CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                                  );
                          if (((((((fVar61 != (float)CONCAT22(max.y,max.x)) ||
                                  (NAN(fVar61) || NAN((float)CONCAT22(max.y,max.x)))) ||
                                 (fVar61 = (float)CONCAT13(p.y._3_1_,
                                                           CONCAT12(p.y._2_1_,
                                                                    CONCAT11(p.y._1_1_,p.y._0_1_))),
                                 fVar61 != (float)CONCAT22(sStack_112,sStack_114))) ||
                                ((NAN(fVar61) || NAN((float)CONCAT22(sStack_112,sStack_114)) ||
                                 (fVar61 = (float)CONCAT13(p.z._3_1_,
                                                           CONCAT12(p.z._2_1_,
                                                                    CONCAT11(p.z._1_1_,p.z._0_1_))),
                                 fVar61 != fVar151)))) ||
                               (((NAN(fVar61) || NAN(fVar151) ||
                                 ((fVar151 = (float)CONCAT13(acStack_1ac[3],
                                                             CONCAT12(acStack_1ac[2],
                                                                      CONCAT11(acStack_1ac[1],
                                                                               acStack_1ac[0]))),
                                  fVar151 != (float)CONCAT22(sStack_10a,sStack_10c) ||
                                  (NAN(fVar151) || NAN((float)CONCAT22(sStack_10a,sStack_10c))))))
                                || ((float)local_1a8 !=
                                    (float)CONCAT22(rand_2._state._2_2_,(short)rand_2._state))))) ||
                              (((NAN((float)local_1a8) ||
                                 NAN((float)CONCAT22(rand_2._state._2_2_,(short)rand_2._state)) ||
                                (local_1a8._4_4_ !=
                                 (float)CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_))) ||
                               (NAN(local_1a8._4_4_) ||
                                NAN((float)CONCAT22(rand_2._state._6_2_,rand_2._state._4_2_)))))) ||
                             ((((float)uStack_1a0 != fVar90 ||
                               (NAN((float)uStack_1a0) || NAN(fVar90))) ||
                              ((uStack_1a0._4_4_ != fVar118 ||
                               (NAN(uStack_1a0._4_4_) || NAN(fVar118))))))) {
                            pcVar58 = 
                            "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<float>]"
                            ;
                            goto LAB_0011442d;
                          }
                        }
                        poVar51 = std::operator<<((ostream *)&std::cout,
                                                  "    extendBy() box for type ");
                        poVar51 = std::operator<<(poVar51,"V4d");
                        std::endl<char,std::char_traits<char>>(poVar51);
                        p.x._0_1_ = -1;
                        p.x._1_1_ = -1;
                        p.x._2_1_ = -1;
                        p.x._3_1_ = -1;
                        p.y._0_1_ = -1;
                        p.y._1_1_ = -1;
                        p.y._2_1_ = -0x11;
                        p.y._3_1_ = '\x7f';
                        p.z._0_1_ = -1;
                        p.z._1_1_ = -1;
                        p.z._2_1_ = -1;
                        p.z._3_1_ = -1;
                        acStack_1ac[0] = -1;
                        acStack_1ac[1] = -1;
                        acStack_1ac[2] = -0x11;
                        acStack_1ac[3] = '\x7f';
                        local_1a8._0_4_ = -NAN;
                        local_1a8._4_4_ = NAN;
                        uStack_1a0._0_4_ = -NAN;
                        uStack_1a0._4_4_ = NAN;
                        local_198[0] = -NAN;
                        local_198[1] = -NAN;
                        local_198[2] = -NAN;
                        local_198[3] = -NAN;
                        stack0xfffffffffffffe80 = -1.79769313486232e+308;
                        local_188._0_8_ = 0xffefffffffffffff;
                        min.x = -1;
                        min.y = -1;
                        Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                                  ((Box<Imath_3_2::Vec4<double>_> *)&p,
                                   (Box<Imath_3_2::Vec4<double>_> *)&min);
                        auVar112._8_8_ = -(ulong)(stack0xfffffffffffffe80 != -1.79769313486232e+308)
                        ;
                        auVar112._0_8_ = -(ulong)((double)local_188._0_8_ != -1.79769313486232e+308)
                        ;
                        auVar145._8_8_ =
                             -(ulong)((double)CONCAT44(local_198[3],local_198[2]) !=
                                     -1.79769313486232e+308);
                        auVar145._0_8_ =
                             -(ulong)((double)CONCAT44(local_198[1],local_198[0]) !=
                                     -1.79769313486232e+308);
                        auVar93 = packssdw(auVar145,auVar112);
                        auVar113._8_8_ =
                             -(ulong)((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                                     DAT_00153230._8_8_);
                        auVar113._0_8_ =
                             -(ulong)((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                                     (double)DAT_00153230);
                        auVar164._8_8_ =
                             -(ulong)((double)CONCAT17(acStack_1ac[3],
                                                       CONCAT16(acStack_1ac[2],
                                                                CONCAT15(acStack_1ac[1],
                                                                         CONCAT14(acStack_1ac[0],
                                                                                  CONCAT13(p.z._3_1_
                                                  ,CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))
                                                  ))))) != DAT_00153230._8_8_);
                        auVar164._0_8_ =
                             -(ulong)((double)CONCAT17(p.y._3_1_,
                                                       CONCAT16(p.y._2_1_,
                                                                CONCAT15(p.y._1_1_,
                                                                         CONCAT14(p.y._0_1_,
                                                                                  CONCAT13(p.x._3_1_
                                                  ,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                                  ))))) != (double)DAT_00153230);
                        auVar169 = packssdw(auVar164,auVar113);
                        auVar93 = packssdw(auVar169,auVar93);
                        if ((((((((((((((((auVar93 >> 7 & (undefined1  [16])0x1) ==
                                          (undefined1  [16])0x0 &&
                                         (auVar93 >> 0xf & (undefined1  [16])0x1) ==
                                         (undefined1  [16])0x0) &&
                                        (auVar93 >> 0x17 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0) &&
                                       (auVar93 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar93 >> 0x27 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar93 >> 0x2f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar93 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar93 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar93 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar93 >> 0x4f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar93 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar93 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar93 >> 0x67 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar93 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar93 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            -1 < auVar93[0xf]) {
                          rand_2._state._0_2_ = 0;
                          rand_2._state._2_2_ = 0;
                          rand_2._state._4_2_ = 0;
                          rand_2._state._6_2_ = 0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec4<double>>
                                    ((vector<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                      *)&rand_2);
                          lVar52 = CONCAT26(rand_2._state._6_2_,
                                            CONCAT24(rand_2._state._4_2_,
                                                     CONCAT22(rand_2._state._2_2_,
                                                              (short)rand_2._state)));
                          auVar93 = _DAT_00153240;
                          for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 5);
                              uVar54 = uVar54 + 1) {
                            lVar86 = (ulong)uVar54 * 0x20;
                            for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 5);
                                uVar67 = uVar67 + 1) {
                              pdVar68 = (double *)(lVar52 + lVar86);
                              dVar120 = *pdVar68;
                              dVar119 = pdVar68[1];
                              pdVar68 = (double *)(lVar52 + 0x10 + lVar86);
                              dVar152 = *pdVar68;
                              dVar10 = pdVar68[1];
                              dVar167 = -dVar120;
                              lVar76 = (ulong)uVar67 * 0x20;
                              pdVar68 = (double *)(lVar52 + lVar76);
                              dVar12 = *pdVar68;
                              dVar13 = pdVar68[1];
                              pdVar68 = (double *)(lVar52 + 0x10 + lVar76);
                              dVar14 = *pdVar68;
                              dVar15 = pdVar68[1];
                              p.x._0_1_ = -1;
                              p.x._1_1_ = -1;
                              p.x._2_1_ = -1;
                              p.x._3_1_ = -1;
                              p.y._0_1_ = -1;
                              p.y._1_1_ = -1;
                              p.y._2_1_ = -0x11;
                              p.y._3_1_ = '\x7f';
                              p.z._0_1_ = -1;
                              p.z._1_1_ = -1;
                              p.z._2_1_ = -1;
                              p.z._3_1_ = -1;
                              acStack_1ac[0] = -1;
                              acStack_1ac[1] = -1;
                              acStack_1ac[2] = -0x11;
                              acStack_1ac[3] = '\x7f';
                              local_1a8._0_4_ = -NAN;
                              local_1a8._4_4_ = NAN;
                              uStack_1a0._0_4_ = -NAN;
                              uStack_1a0._4_4_ = NAN;
                              local_198[0] = auVar93._0_4_;
                              local_198[1] = auVar93._4_4_;
                              local_198[2] = auVar93._8_4_;
                              local_198[3] = auVar93._12_4_;
                              min.x = SUB82(dVar120,0);
                              min.y = (short)((ulong)dVar120 >> 0x10);
                              _local_188 = auVar93;
                              Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                                        ((Box<Imath_3_2::Vec4<double>_> *)&p,
                                         (Box<Imath_3_2::Vec4<double>_> *)&min);
                              auVar114._8_8_ = -(ulong)(stack0xfffffffffffffe80 == dVar15);
                              auVar114._0_8_ = -(ulong)((double)local_188._0_8_ == dVar14);
                              auVar146._8_8_ =
                                   -(ulong)((double)CONCAT44(local_198[3],local_198[2]) == dVar13);
                              auVar146._0_8_ =
                                   -(ulong)((double)CONCAT44(local_198[1],local_198[0]) == dVar12);
                              auVar93 = packssdw(auVar146,auVar114);
                              auVar115._8_8_ =
                                   -(ulong)((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) ==
                                           -dVar10);
                              auVar115._0_8_ =
                                   -(ulong)((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) ==
                                           -dVar152);
                              auVar165._8_8_ =
                                   -(ulong)((double)CONCAT17(acStack_1ac[3],
                                                             CONCAT16(acStack_1ac[2],
                                                                      CONCAT15(acStack_1ac[1],
                                                                               CONCAT14(acStack_1ac
                                                                                        [0],CONCAT13
                                                  (p.z._3_1_,
                                                   CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_))
                                                  ))))) == -dVar119);
                              auVar165._0_8_ =
                                   -(ulong)((double)CONCAT17(p.y._3_1_,
                                                             CONCAT16(p.y._2_1_,
                                                                      CONCAT15(p.y._1_1_,
                                                                               CONCAT14(p.y._0_1_,
                                                                                        CONCAT13(p.x
                                                  ._3_1_,CONCAT12(p.x._2_1_,
                                                                  CONCAT11(p.x._1_1_,p.x._0_1_))))))
                                                  ) == dVar167);
                              auVar169 = packssdw(auVar165,auVar115);
                              auVar93 = packssdw(auVar169,auVar93);
                              auVar93 = packsswb(auVar93,auVar93);
                              if ((byte)(SUB161(auVar93 >> 7,0) & 1 |
                                         (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                         (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                         (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                         (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                         (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                         (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                        SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                                pcVar58 = 
                                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<double>]"
                                ;
LAB_00113263:
                                __assert_fail("b0.min == p0 && b0.max == p1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                              ,0x13f,pcVar58);
                              }
                              min.x = SUB82(dVar167,0);
                              min.y = (short)((ulong)dVar167 >> 0x10);
                              sStack_174 = (short)((ulong)dVar167 >> 0x20);
                              sStack_172 = (short)((ulong)dVar167 >> 0x30);
                              max.x = -1;
                              max.y = -1;
                              Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                                        ((Box<Imath_3_2::Vec4<double>_> *)&min,
                                         (Box<Imath_3_2::Vec4<double>_> *)&max);
                              auVar147._8_8_ = 0xffffffffffffffff;
                              auVar147._0_8_ = 0xffffffffffffffff;
                              auVar116._8_8_ = 0xffffffffffffffff;
                              auVar116._0_8_ = 0xffffffffffffffff;
                              auVar166._8_8_ = 0xffffffffffffffff;
                              auVar166._0_8_ = 0xffffffffffffffff;
                              auVar93 = packssdw(auVar116,auVar147);
                              auVar117._8_8_ = 0xffffffffffffffff;
                              auVar117._0_8_ =
                                   -(ulong)(dVar167 ==
                                           (double)CONCAT26(sStack_172,CONCAT24(sStack_174,min)));
                              auVar169 = packssdw(auVar117,auVar166);
                              auVar93 = packssdw(auVar169,auVar93);
                              auVar93 = packsswb(auVar93,auVar93);
                              if ((byte)(SUB161(auVar93 >> 7,0) & 1 |
                                         (SUB161(auVar93 >> 0xf,0) & 1) << 1 |
                                         (SUB161(auVar93 >> 0x17,0) & 1) << 2 |
                                         (SUB161(auVar93 >> 0x1f,0) & 1) << 3 |
                                         (SUB161(auVar93 >> 0x27,0) & 1) << 4 |
                                         (SUB161(auVar93 >> 0x2f,0) & 1) << 5 |
                                         (SUB161(auVar93 >> 0x37,0) & 1) << 6 |
                                        SUB161(auVar93 >> 0x3f,0) << 7) != 0xff) {
                                pcVar58 = 
                                "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<double>]"
                                ;
LAB_00113282:
                                __assert_fail("b1.min == p0 && b1.max == p1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                              ,0x143,pcVar58);
                              }
                              lVar52 = CONCAT26(rand_2._state._6_2_,
                                                CONCAT24(rand_2._state._4_2_,
                                                         CONCAT22(rand_2._state._2_2_,
                                                                  (short)rand_2._state)));
                              auVar93 = _DAT_00153240;
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                           *)&rand_2);
                          rand_23._state = 0x5a5a5a5a;
                          p.x._0_1_ = -1;
                          p.x._1_1_ = -1;
                          p.x._2_1_ = -1;
                          p.x._3_1_ = -1;
                          p.y._0_1_ = -1;
                          p.y._1_1_ = -1;
                          p.y._2_1_ = -0x11;
                          p.y._3_1_ = '\x7f';
                          p.z._0_1_ = -1;
                          p.z._1_1_ = -1;
                          p.z._2_1_ = -1;
                          p.z._3_1_ = -1;
                          acStack_1ac[0] = -1;
                          acStack_1ac[1] = -1;
                          acStack_1ac[2] = -0x11;
                          acStack_1ac[3] = '\x7f';
                          local_1a8._0_4_ = -NAN;
                          local_1a8._4_4_ = NAN;
                          uStack_1a0._0_4_ = -NAN;
                          uStack_1a0._4_4_ = NAN;
                          local_198[0] = -NAN;
                          local_198[1] = -NAN;
                          local_198[2] = -NAN;
                          local_198[3] = -NAN;
                          stack0xfffffffffffffe80 = -1.79769313486232e+308;
                          local_188._0_8_ = 0xffefffffffffffff;
                          for (iVar50 = 1; iVar50 != 10; iVar50 = iVar50 + 1) {
                            for (lVar52 = 0; auVar93 = _local_188, fVar48 = local_198[3],
                                fVar7 = local_198[2], fVar61 = uStack_1a0._4_4_,
                                fVar151 = (float)uStack_1a0, fVar118 = local_1a8._4_4_,
                                fVar90 = (float)local_1a8, lVar52 != 4; lVar52 = lVar52 + 1) {
                              fVar90 = Imath_3_2::Rand32::nextf(&rand_23,0.0,999.0);
                              (&rand_8)[lVar52]._state = (unsigned_long)(double)fVar90;
                              fVar90 = Imath_3_2::Rand32::nextf(&rand_23,1000.0,1999.0);
                              *(double *)(&p1.x + lVar52 * 2) = (double)fVar90;
                            }
                            uVar11 = CONCAT13(p.x._3_1_,
                                              CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)));
                            uVar17 = CONCAT15(p.y._1_1_,CONCAT14(p.y._0_1_,uVar11));
                            uVar19 = CONCAT13(p.z._3_1_,
                                              CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)));
                            uVar20 = CONCAT15(acStack_1ac[1],CONCAT14(acStack_1ac[0],uVar19));
                            max.x = CONCAT11(p.x._1_1_,p.x._0_1_);
                            max.y = (short)((uint)uVar11 >> 0x10);
                            sStack_114 = (short)((uint6)uVar17 >> 0x20);
                            sStack_112 = (short)(CONCAT17(p.y._3_1_,CONCAT16(p.y._2_1_,uVar17)) >>
                                                0x30);
                            sStack_10c = (short)((uint6)uVar20 >> 0x20);
                            sStack_10a = (short)(CONCAT17(acStack_1ac[3],
                                                          CONCAT16(acStack_1ac[2],uVar20)) >> 0x30);
                            rand_2._state._0_2_ = SUB42(local_198[0],0);
                            rand_2._state._2_2_ = (short)((uint)local_198[0] >> 0x10);
                            rand_2._state._4_2_ = SUB42(local_198[1],0);
                            rand_2._state._6_2_ = (short)((uint)local_198[1] >> 0x10);
                            for (lVar52 = 0; lVar52 != 4; lVar52 = lVar52 + 1) {
                              dVar120 = (double)(&rand_8)[lVar52]._state;
                              if (*(double *)(&max + lVar52 * 2) <= (double)(&rand_8)[lVar52]._state
                                 ) {
                                dVar120 = *(double *)(&max + lVar52 * 2);
                              }
                              *(double *)(&max + lVar52 * 2) = dVar120;
                              dVar120 = *(double *)(&p1.x + lVar52 * 2);
                              if (*(double *)(&p1.x + lVar52 * 2) <=
                                  (double)(&rand_2)[lVar52]._state) {
                                dVar120 = (double)(&rand_2)[lVar52]._state;
                              }
                              (&rand_2)[lVar52]._state = (unsigned_long)dVar120;
                            }
                            min.x = (short)rand_8._state;
                            min.y = rand_8._state._2_2_;
                            Imath_3_2::Box<Imath_3_2::Vec4<double>_>::extendBy
                                      ((Box<Imath_3_2::Vec4<double>_> *)&p,
                                       (Box<Imath_3_2::Vec4<double>_> *)&min);
                            dVar120 = (double)CONCAT17(p.y._3_1_,
                                                       CONCAT16(p.y._2_1_,
                                                                CONCAT15(p.y._1_1_,
                                                                         CONCAT14(p.y._0_1_,
                                                                                  CONCAT13(p.x._3_1_
                                                  ,CONCAT12(p.x._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_))
                                                  )))));
                            if ((((dVar120 !=
                                   (double)CONCAT26(sStack_112,
                                                    CONCAT24(sStack_114,CONCAT22(max.y,max.x)))) ||
                                 (NAN(dVar120) ||
                                  NAN((double)CONCAT26(sStack_112,
                                                       CONCAT24(sStack_114,CONCAT22(max.y,max.x)))))
                                 ) || ((dVar120 = (double)CONCAT17(acStack_1ac[3],
                                                                   CONCAT16(acStack_1ac[2],
                                                                            CONCAT15(acStack_1ac[1],
                                                                                     CONCAT14(
                                                  acStack_1ac[0],
                                                  CONCAT13(p.z._3_1_,
                                                           CONCAT12(p.z._2_1_,
                                                                    CONCAT11(p.z._1_1_,p.z._0_1_))))
                                                  ))),
                                       dVar120 !=
                                       (double)CONCAT26(sStack_10a,CONCAT24(sStack_10c,uVar19)) ||
                                       ((((NAN(dVar120) ||
                                           NAN((double)CONCAT26(sStack_10a,
                                                                CONCAT24(sStack_10c,uVar19))) ||
                                          ((double)CONCAT44(local_1a8._4_4_,(float)local_1a8) !=
                                           (double)CONCAT44(fVar118,fVar90))) ||
                                         (NAN((double)CONCAT44(local_1a8._4_4_,(float)local_1a8)) ||
                                          NAN((double)CONCAT44(fVar118,fVar90)))) ||
                                        (((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0) !=
                                          (double)CONCAT44(fVar61,fVar151) ||
                                         (NAN((double)CONCAT44(uStack_1a0._4_4_,(float)uStack_1a0))
                                          || NAN((double)CONCAT44(fVar61,fVar151)))))))))) ||
                               (((double)CONCAT44(local_198[1],local_198[0]) !=
                                 (double)CONCAT26(rand_2._state._6_2_,
                                                  CONCAT24(rand_2._state._4_2_,
                                                           CONCAT22(rand_2._state._2_2_,
                                                                    (short)rand_2._state))) ||
                                (((NAN((double)CONCAT44(local_198[1],local_198[0])) ||
                                   NAN((double)CONCAT26(rand_2._state._6_2_,
                                                        CONCAT24(rand_2._state._4_2_,
                                                                 CONCAT22(rand_2._state._2_2_,
                                                                          (short)rand_2._state))))
                                  || ((double)CONCAT44(local_198[3],local_198[2]) !=
                                      (double)CONCAT44(fVar48,fVar7))) ||
                                 (NAN((double)CONCAT44(local_198[3],local_198[2])) ||
                                  NAN((double)CONCAT44(fVar48,fVar7)))))))) {
LAB_00113f30:
                              pcVar58 = 
                              "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<double>]"
                              ;
LAB_0011442d:
                              __assert_fail("b.min == min && b.max == max",
                                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                            ,0x165,pcVar58);
                            }
                            dVar120 = auVar93._0_8_;
                            if (((double)local_188._0_8_ != dVar120) ||
                               (NAN((double)local_188._0_8_) || NAN(dVar120))) goto LAB_00113f30;
                            dVar120 = auVar93._8_8_;
                            if ((stack0xfffffffffffffe80 != dVar120) ||
                               (NAN(stack0xfffffffffffffe80) || NAN(dVar120))) goto LAB_00113f30;
                          }
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V2s");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<short>>
                                    ((vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 2;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            for (uVar67 = 0; uVar75 = (ulong)uVar67, uVar75 < uVar55;
                                uVar67 = uVar67 + 1) {
                              sVar78 = *(short *)(lVar52 + uVar73 * 4);
                              sVar81 = *(short *)(lVar52 + 2 + uVar73 * 4);
                              sVar79 = *(short *)(lVar52 + uVar75 * 4);
                              sVar82 = *(short *)(lVar52 + 2 + uVar75 * 4);
                              if ((sVar81 == -0x7fff && sVar78 == -0x7fff) &&
                                 (sVar82 == -0x8000 && sVar79 == -0x8000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<short>]"
                                ;
                                goto LAB_00113a36;
                              }
                              if ((sVar81 == -0x7fff && sVar78 == -0x7fff) &&
                                 (sVar82 == -0x8000 && sVar79 == -0x8000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<short>]"
                                ;
                                goto LAB_00113a55;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                                           *)&p);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<short>>
                                    ((vector<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 2;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            for (uVar67 = 0; uVar75 = (ulong)uVar67, uVar75 < uVar55;
                                uVar67 = uVar67 + 1) {
                              sVar78 = *(short *)(lVar52 + uVar73 * 4);
                              sVar81 = *(short *)(lVar52 + 2 + uVar73 * 4);
                              sVar79 = *(short *)(lVar52 + uVar75 * 4);
                              sVar82 = *(short *)(lVar52 + 2 + uVar75 * 4);
                              if (uVar54 == uVar67) {
                                if ((sVar79 != sVar78) || (sVar82 != sVar81)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<short>]"
                                  ;
                                  goto LAB_00113e80;
                                }
                              }
                              else {
                                if ((sVar79 == sVar78) && (sVar82 == sVar81)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<short>]"
                                  ;
                                  goto LAB_00113e9f;
                                }
                                if ((sVar79 == sVar78) && (sVar82 == sVar81)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<short>]"
                                  ;
                                  goto LAB_00113ebe;
                                }
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<short>,_std::allocator<Imath_3_2::Vec2<short>_>_>
                                           *)&p);
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V2i");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<int>>
                                    ((vector<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 3;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            for (uVar67 = 0; uVar75 = (ulong)uVar67, uVar75 < uVar55;
                                uVar67 = uVar67 + 1) {
                              iVar50 = *(int *)(lVar52 + uVar75 * 8);
                              iVar83 = *(int *)(lVar52 + 4 + uVar75 * 8);
                              uVar74 = *(uint *)(lVar52 + uVar73 * 8) ^ 0x80000001;
                              uVar71 = *(uint *)(lVar52 + 4 + uVar73 * 8) ^ 0x80000001;
                              if ((uVar74 == 0 && uVar71 == 0) &&
                                 (iVar83 == -0x80000000 && iVar50 == -0x80000000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<int>]"
                                ;
                                goto LAB_00113a36;
                              }
                              if ((uVar74 == 0 && uVar71 == 0) &&
                                 (iVar83 == -0x80000000 && iVar50 == -0x80000000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<int>]"
                                ;
                                goto LAB_00113a55;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                                           *)&p);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<int>>
                                    ((vector<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 3;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            for (uVar67 = 0; uVar75 = (ulong)uVar67, uVar75 < uVar55;
                                uVar67 = uVar67 + 1) {
                              iVar50 = *(int *)(lVar52 + uVar73 * 8);
                              iVar83 = *(int *)(lVar52 + 4 + uVar73 * 8);
                              iVar88 = *(int *)(lVar52 + uVar75 * 8);
                              iVar89 = *(int *)(lVar52 + 4 + uVar75 * 8);
                              if (uVar54 == uVar67) {
                                if ((iVar88 != iVar50) || (iVar89 != iVar83)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<int>]"
                                  ;
                                  goto LAB_00113e80;
                                }
                              }
                              else {
                                if ((iVar88 == iVar50) && (iVar89 == iVar83)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<int>]"
                                  ;
                                  goto LAB_00113e9f;
                                }
                                if ((iVar88 == iVar50) && (iVar89 == iVar83)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<int>]"
                                  ;
                                  goto LAB_00113ebe;
                                }
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<int>,_std::allocator<Imath_3_2::Vec2<int>_>_>
                                           *)&p);
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V2i64");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<long>>
                                    ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 4;
                          for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
                            puVar69 = (ulong *)((ulong)uVar54 * 0x10 + lVar52);
                            for (uVar67 = 0; uVar67 < uVar55; uVar67 = uVar67 + 1) {
                              lVar76 = (ulong)uVar67 * 0x10;
                              lVar86 = *(long *)(lVar52 + lVar76);
                              lVar76 = *(long *)(lVar52 + 8 + lVar76);
                              uVar75 = *puVar69 ^ 0x8000000000000001;
                              uVar73 = puVar69[1] ^ 0x8000000000000001;
                              if ((uVar75 == 0 && uVar73 == 0) &&
                                 (lVar76 == -0x8000000000000000 && lVar86 == -0x8000000000000000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<long>]"
                                ;
                                goto LAB_00113a36;
                              }
                              if ((uVar75 == 0 && uVar73 == 0) &&
                                 (lVar76 == -0x8000000000000000 && lVar86 == -0x8000000000000000)) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<long>]"
                                ;
                                goto LAB_00113a55;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                                           *)&p);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<long>>
                                    ((vector<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 4;
                          for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
                            plVar70 = (long *)((ulong)uVar54 * 0x10 + lVar52);
                            for (uVar67 = 0; uVar67 < uVar55; uVar67 = uVar67 + 1) {
                              lVar86 = *plVar70;
                              lVar76 = plVar70[1];
                              lVar64 = (ulong)uVar67 * 0x10;
                              lVar80 = *(long *)(lVar52 + lVar64);
                              lVar64 = *(long *)(lVar52 + 8 + lVar64);
                              if (uVar54 == uVar67) {
                                if ((lVar80 != lVar86) || (lVar64 != lVar76)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<long>]"
                                  ;
                                  goto LAB_00113e80;
                                }
                              }
                              else {
                                if ((lVar80 == lVar86) && (lVar64 == lVar76)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<long>]"
                                  ;
                                  goto LAB_00113e9f;
                                }
                                if ((lVar80 == lVar86) && (lVar64 == lVar76)) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<long>]"
                                  ;
                                  goto LAB_00113ebe;
                                }
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<long>,_std::allocator<Imath_3_2::Vec2<long>_>_>
                                           *)&p);
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V2f");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<float>>
                                    ((vector<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 3;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            for (uVar67 = 0; uVar75 = (ulong)uVar67, uVar75 < uVar55;
                                uVar67 = uVar67 + 1) {
                              fVar90 = *(float *)(lVar52 + uVar73 * 8);
                              fVar118 = *(float *)(lVar52 + 4 + uVar73 * 8);
                              fVar151 = *(float *)(lVar52 + uVar75 * 8);
                              fVar61 = *(float *)(lVar52 + 4 + uVar75 * 8);
                              if ((((fVar90 == -3.4028235e+38) && (!NAN(fVar90))) &&
                                  (fVar118 == -3.4028235e+38)) &&
                                 (((!NAN(fVar118) && (fVar151 == -3.4028235e+38)) &&
                                  ((!NAN(fVar151) && ((fVar61 == -3.4028235e+38 && (!NAN(fVar61)))))
                                  )))) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                ;
                                goto LAB_00113a36;
                              }
                              if (((((fVar90 == -3.4028235e+38) && (!NAN(fVar90))) &&
                                   (fVar118 == -3.4028235e+38)) &&
                                  ((!NAN(fVar118) && (fVar151 == -3.4028235e+38)))) &&
                                 ((!NAN(fVar151) && ((fVar61 == -3.4028235e+38 && (!NAN(fVar61))))))
                                 ) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                ;
                                goto LAB_00113a55;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                                           *)&p);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<float>>
                                    ((vector<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 3;
                          for (uVar54 = 0; uVar73 = (ulong)uVar54, uVar73 < uVar55;
                              uVar54 = uVar54 + 1) {
                            uVar67 = 0;
                            while (uVar75 = (ulong)uVar67, uVar75 < uVar55) {
                              fVar90 = *(float *)(lVar52 + uVar73 * 8);
                              fVar118 = *(float *)(lVar52 + 4 + uVar73 * 8);
                              fVar151 = *(float *)(lVar52 + uVar75 * 8);
                              fVar61 = *(float *)(lVar52 + 4 + uVar75 * 8);
                              if (uVar54 == uVar67) {
                                if ((fVar90 == fVar151) && (!NAN(fVar90) && !NAN(fVar151))) {
                                  if ((fVar118 == fVar61) && (!NAN(fVar118) && !NAN(fVar61)))
                                  goto LAB_0010bbb9;
                                }
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                ;
                                goto LAB_00113e80;
                              }
                              if ((fVar90 == fVar151) && (!NAN(fVar90) && !NAN(fVar151))) {
                                if ((fVar118 == fVar61) && (!NAN(fVar118) && !NAN(fVar61))) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                  ;
                                  goto LAB_00113e9f;
                                }
                              }
                              if ((fVar90 == fVar151) && (!NAN(fVar90) && !NAN(fVar151))) {
                                if ((fVar118 == fVar61) && (!NAN(fVar118) && !NAN(fVar61))) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                  ;
                                  goto LAB_00113ebe;
                                }
                              }
LAB_0010bbb9:
                              if ((((NAN(fVar90)) || (NAN(fVar118))) || (NAN(fVar151))) ||
                                 (uVar67 = uVar67 + 1, NAN(fVar61))) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<float>]"
                                ;
                                goto LAB_00113696;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<float>,_std::allocator<Imath_3_2::Vec2<float>_>_>
                                           *)&p);
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V2d");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<double>>
                                    ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 4;
                          for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
                            pdVar68 = (double *)((ulong)uVar54 * 0x10 + lVar52);
                            for (uVar67 = 0; uVar67 < uVar55; uVar67 = uVar67 + 1) {
                              dVar120 = *pdVar68;
                              dVar119 = pdVar68[1];
                              lVar86 = (ulong)uVar67 * 0x10;
                              dVar152 = *(double *)(lVar52 + lVar86);
                              dVar10 = *(double *)(lVar52 + 8 + lVar86);
                              if (((((dVar120 == -1.79769313486232e+308) && (!NAN(dVar120))) &&
                                   ((dVar119 == -1.79769313486232e+308 &&
                                    ((!NAN(dVar119) && (dVar152 == -1.79769313486232e+308)))))) &&
                                  (!NAN(dVar152))) &&
                                 ((dVar10 == -1.79769313486232e+308 && (!NAN(dVar10))))) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                ;
                                goto LAB_00113a36;
                              }
                              if ((((dVar120 == -1.79769313486232e+308) && (!NAN(dVar120))) &&
                                  (dVar119 == -1.79769313486232e+308)) &&
                                 (((!NAN(dVar119) && (dVar152 == -1.79769313486232e+308)) &&
                                  ((!NAN(dVar152) &&
                                   ((dVar10 == -1.79769313486232e+308 && (!NAN(dVar10))))))))) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                ;
                                goto LAB_00113a55;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                                           *)&p);
                          p.x._0_1_ = 0;
                          p.x._1_1_ = 0;
                          p.x._2_1_ = 0;
                          p.x._3_1_ = 0;
                          p.y._0_1_ = 0;
                          p.y._1_1_ = 0;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0;
                          acStack_1ac[0] = '\0';
                          acStack_1ac[1] = 0;
                          acStack_1ac[2] = 0;
                          acStack_1ac[3] = 0;
                          local_1a8._0_4_ = 0.0;
                          local_1a8._4_4_ = 0.0;
                          (anonymous_namespace)::permutations<Imath_3_2::Vec2<double>>
                                    ((vector<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                                      *)&p);
                          lVar52 = CONCAT17(p.y._3_1_,
                                            CONCAT16(p.y._2_1_,
                                                     CONCAT15(p.y._1_1_,
                                                              CONCAT14(p.y._0_1_,
                                                                       CONCAT13(p.x._3_1_,
                                                                                CONCAT12(p.x._2_1_,
                                                                                         CONCAT11(p.
                                                  x._1_1_,p.x._0_1_)))))));
                          uVar55 = CONCAT17(acStack_1ac[3],
                                            CONCAT16(acStack_1ac[2],
                                                     CONCAT15(acStack_1ac[1],
                                                              CONCAT14(acStack_1ac[0],
                                                                       CONCAT13(p.z._3_1_,
                                                                                CONCAT12(p.z._2_1_,
                                                                                         CONCAT11(p.
                                                  z._1_1_,p.z._0_1_))))))) - lVar52 >> 4;
                          for (uVar54 = 0; uVar54 < uVar55; uVar54 = uVar54 + 1) {
                            pdVar68 = (double *)((ulong)uVar54 * 0x10 + lVar52);
                            uVar67 = 0;
                            while (uVar67 < uVar55) {
                              dVar120 = *pdVar68;
                              dVar119 = pdVar68[1];
                              lVar86 = (ulong)uVar67 * 0x10;
                              dVar152 = *(double *)(lVar52 + lVar86);
                              dVar10 = *(double *)(lVar52 + 8 + lVar86);
                              if (uVar54 == uVar67) {
                                if ((dVar120 == dVar152) && (!NAN(dVar120) && !NAN(dVar152))) {
                                  if ((dVar119 == dVar10) && (!NAN(dVar119) && !NAN(dVar10)))
                                  goto LAB_0010bd97;
                                }
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                ;
                                goto LAB_00113e80;
                              }
                              if ((dVar120 == dVar152) && (!NAN(dVar120) && !NAN(dVar152))) {
                                if ((dVar119 == dVar10) && (!NAN(dVar119) && !NAN(dVar10))) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                  ;
                                  goto LAB_00113e9f;
                                }
                              }
                              if ((dVar120 == dVar152) && (!NAN(dVar120) && !NAN(dVar152))) {
                                if ((dVar119 == dVar10) && (!NAN(dVar119) && !NAN(dVar10))) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                  ;
                                  goto LAB_00113ebe;
                                }
                              }
LAB_0010bd97:
                              if ((((NAN(dVar120)) || (NAN(dVar119))) || (NAN(dVar152))) ||
                                 (uVar67 = uVar67 + 1, NAN(dVar10))) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec2<double>]"
                                ;
                                goto LAB_00113696;
                              }
                            }
                          }
                          std::
                          _Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                          ::~_Vector_base((_Vector_base<Imath_3_2::Vec2<double>,_std::allocator<Imath_3_2::Vec2<double>_>_>
                                           *)&p);
                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                    "    comparators for type ");
                          poVar51 = std::operator<<(poVar51,"V3s");
                          std::endl<char,std::char_traits<char>>(poVar51);
                          p.x._0_1_ = 0xff;
                          p.x._1_1_ = 0x7f;
                          p.x._2_1_ = 0xff;
                          p.x._3_1_ = 0x7f;
                          p.y._0_1_ = 0xff;
                          p.y._1_1_ = 0x7f;
                          p.y._2_1_ = 0;
                          p.y._3_1_ = 0x80;
                          p.z._0_1_ = 0;
                          p.z._1_1_ = 0x80;
                          p.z._2_1_ = 0;
                          p.z._3_1_ = 0x80;
                          min.x = 0x7fff;
                          min.y = 0x7fff;
                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                                             ((Box<Imath_3_2::Vec3<short>_> *)&p,
                                              (Box<Imath_3_2::Vec3<short>_> *)&min);
                          if (!bVar49) {
                            pcVar58 = 
                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                            ;
LAB_00114902:
                            __assert_fail("b0 == b1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                          ,0x179,pcVar58);
                          }
                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                                             ((Box<Imath_3_2::Vec3<short>_> *)&p,
                                              (Box<Imath_3_2::Vec3<short>_> *)&min);
                          if (bVar49) {
                            pcVar58 = 
                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                            ;
                          }
                          else {
                            p.x._0_1_ = 0;
                            p.x._1_1_ = 0;
                            p.x._2_1_ = 0;
                            p.x._3_1_ = 0;
                            p.y._0_1_ = 0;
                            p.y._1_1_ = 0;
                            p.y._2_1_ = 0;
                            p.y._3_1_ = 0;
                            p.z._0_1_ = 0;
                            p.z._1_1_ = 0;
                            p.z._2_1_ = 0;
                            p.z._3_1_ = 0;
                            acStack_1ac[0] = '\0';
                            acStack_1ac[1] = 0;
                            acStack_1ac[2] = 0;
                            acStack_1ac[3] = 0;
                            local_1a8._0_4_ = 0.0;
                            local_1a8._4_4_ = 0.0;
                            (anonymous_namespace)::permutations<Imath_3_2::Vec3<short>>
                                      ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                                        *)&p);
                            lVar52 = CONCAT17(p.y._3_1_,
                                              CONCAT16(p.y._2_1_,
                                                       CONCAT15(p.y._1_1_,
                                                                CONCAT14(p.y._0_1_,
                                                                         CONCAT13(p.x._3_1_,
                                                                                  CONCAT12(p.x._2_1_
                                                  ,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                            lVar86 = CONCAT17(acStack_1ac[3],
                                              CONCAT16(acStack_1ac[2],
                                                       CONCAT15(acStack_1ac[1],
                                                                CONCAT14(acStack_1ac[0],
                                                                         CONCAT13(p.z._3_1_,
                                                                                  CONCAT12(p.z._2_1_
                                                  ,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                            for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 6);
                                uVar54 = uVar54 + 1) {
                              for (uVar67 = 0; (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 6);
                                  uVar67 = uVar67 + 1) {
                                uVar11 = *(undefined4 *)(lVar52 + (ulong)uVar54 * 6);
                                max.x = -(short)uVar11;
                                max.y = -(short)((uint)uVar11 >> 0x10);
                                min.x = 0x7fff;
                                min.y = 0x7fff;
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                                                   ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                    (Box<Imath_3_2::Vec3<short>_> *)&max);
                                if (bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                  ;
                                  goto LAB_00113a36;
                                }
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                                                   ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                    (Box<Imath_3_2::Vec3<short>_> *)&max);
                                if (!bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                  ;
                                  goto LAB_00113a55;
                                }
                                lVar52 = CONCAT17(p.y._3_1_,
                                                  CONCAT16(p.y._2_1_,
                                                           CONCAT15(p.y._1_1_,
                                                                    CONCAT14(p.y._0_1_,
                                                                             CONCAT13(p.x._3_1_,
                                                                                      CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                lVar86 = CONCAT17(acStack_1ac[3],
                                                  CONCAT16(acStack_1ac[2],
                                                           CONCAT15(acStack_1ac[1],
                                                                    CONCAT14(acStack_1ac[0],
                                                                             CONCAT13(p.z._3_1_,
                                                                                      CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                              }
                            }
                            std::
                            _Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                            ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                                             *)&p);
                            p.x._0_1_ = 0;
                            p.x._1_1_ = 0;
                            p.x._2_1_ = 0;
                            p.x._3_1_ = 0;
                            p.y._0_1_ = 0;
                            p.y._1_1_ = 0;
                            p.y._2_1_ = 0;
                            p.y._3_1_ = 0;
                            p.z._0_1_ = 0;
                            p.z._1_1_ = 0;
                            p.z._2_1_ = 0;
                            p.z._3_1_ = 0;
                            acStack_1ac[0] = '\0';
                            acStack_1ac[1] = 0;
                            acStack_1ac[2] = 0;
                            acStack_1ac[3] = 0;
                            local_1a8._0_4_ = 0.0;
                            local_1a8._4_4_ = 0.0;
                            (anonymous_namespace)::permutations<Imath_3_2::Vec3<short>>
                                      ((vector<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                                        *)&p);
                            lVar52 = CONCAT17(p.y._3_1_,
                                              CONCAT16(p.y._2_1_,
                                                       CONCAT15(p.y._1_1_,
                                                                CONCAT14(p.y._0_1_,
                                                                         CONCAT13(p.x._3_1_,
                                                                                  CONCAT12(p.x._2_1_
                                                  ,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                            lVar86 = CONCAT17(acStack_1ac[3],
                                              CONCAT16(acStack_1ac[2],
                                                       CONCAT15(acStack_1ac[1],
                                                                CONCAT14(acStack_1ac[0],
                                                                         CONCAT13(p.z._3_1_,
                                                                                  CONCAT12(p.z._2_1_
                                                  ,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                            for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 6);
                                uVar54 = uVar54 + 1) {
                              lVar76 = (ulong)uVar54 * 6;
                              for (uVar67 = 0; (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 6);
                                  uVar67 = uVar67 + 1) {
                                uVar11 = *(undefined4 *)(lVar52 + (ulong)uVar67 * 6);
                                rand_2._state._6_2_ = (short)uVar11;
                                max.x = -rand_2._state._6_2_;
                                max.y = -(short)((uint)uVar11 >> 0x10);
                                min.x = -*(short *)(lVar52 + lVar76);
                                min.y = -*(short *)(lVar52 + 2 + lVar76);
                                rand_2._state._4_2_ = -*(short *)(lVar52 + 4 + lVar76);
                                rand_2._state._0_2_ = min.x;
                                rand_2._state._2_2_ = min.y;
                                if (uVar54 == uVar67) {
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<short>_> *)&max);
                                  if (!bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                    ;
                                    goto LAB_00113e80;
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                                                     ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<short>_> *)&max);
                                  if (bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                    ;
                                    goto LAB_00113e61;
                                  }
                                }
                                else {
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                                                     ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<short>_> *)&max);
                                  if (!bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                    ;
                                    goto LAB_00113e9f;
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<short>_> *)&max);
                                  if (bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                    ;
                                    goto LAB_00113ebe;
                                  }
                                }
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator==
                                                   ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                    (Box<Imath_3_2::Vec3<short>_> *)&rand_2);
                                if (!bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                  ;
                                  goto LAB_00113696;
                                }
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<short>_>::operator!=
                                                   ((Box<Imath_3_2::Vec3<short>_> *)&min,
                                                    (Box<Imath_3_2::Vec3<short>_> *)&rand_2);
                                if (bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<short>]"
                                  ;
                                  goto LAB_00113677;
                                }
                                lVar52 = CONCAT17(p.y._3_1_,
                                                  CONCAT16(p.y._2_1_,
                                                           CONCAT15(p.y._1_1_,
                                                                    CONCAT14(p.y._0_1_,
                                                                             CONCAT13(p.x._3_1_,
                                                                                      CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                lVar86 = CONCAT17(acStack_1ac[3],
                                                  CONCAT16(acStack_1ac[2],
                                                           CONCAT15(acStack_1ac[1],
                                                                    CONCAT14(acStack_1ac[0],
                                                                             CONCAT13(p.z._3_1_,
                                                                                      CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                              }
                            }
                            std::
                            _Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                            ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<short>,_std::allocator<Imath_3_2::Vec3<short>_>_>
                                             *)&p);
                            poVar51 = std::operator<<((ostream *)&std::cout,
                                                      "    comparators for type ");
                            poVar51 = std::operator<<(poVar51,"V3i");
                            std::endl<char,std::char_traits<char>>(poVar51);
                            p.x._0_1_ = 0xff;
                            p.x._1_1_ = 0xff;
                            p.x._2_1_ = 0xff;
                            p.x._3_1_ = 0x7f;
                            p.y._0_1_ = 0xff;
                            p.y._1_1_ = 0xff;
                            p.y._2_1_ = 0xff;
                            p.y._3_1_ = 0x7f;
                            p.z._0_1_ = 0xff;
                            p.z._1_1_ = 0xff;
                            p.z._2_1_ = 0xff;
                            p.z._3_1_ = 0x7f;
                            acStack_1ac[0] = '\0';
                            acStack_1ac[1] = 0;
                            acStack_1ac[2] = 0;
                            acStack_1ac[3] = 0x80;
                            local_1a8._0_4_ = -0.0;
                            local_1a8._4_4_ = -0.0;
                            min.x = -1;
                            min.y = 0x7fff;
                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator==
                                               ((Box<Imath_3_2::Vec3<int>_> *)&p,
                                                (Box<Imath_3_2::Vec3<int>_> *)&min);
                            if (!bVar49) {
                              pcVar58 = 
                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                              ;
                              goto LAB_00114902;
                            }
                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator!=
                                               ((Box<Imath_3_2::Vec3<int>_> *)&p,
                                                (Box<Imath_3_2::Vec3<int>_> *)&min);
                            if (bVar49) {
                              pcVar58 = 
                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                              ;
                            }
                            else {
                              p.x._0_1_ = 0;
                              p.x._1_1_ = 0;
                              p.x._2_1_ = 0;
                              p.x._3_1_ = 0;
                              p.y._0_1_ = 0;
                              p.y._1_1_ = 0;
                              p.y._2_1_ = 0;
                              p.y._3_1_ = 0;
                              p.z._0_1_ = 0;
                              p.z._1_1_ = 0;
                              p.z._2_1_ = 0;
                              p.z._3_1_ = 0;
                              acStack_1ac[0] = '\0';
                              acStack_1ac[1] = 0;
                              acStack_1ac[2] = 0;
                              acStack_1ac[3] = 0;
                              local_1a8._0_4_ = 0.0;
                              local_1a8._4_4_ = 0.0;
                              (anonymous_namespace)::permutations<Imath_3_2::Vec3<int>>
                                        ((vector<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                                          *)&p);
                              lVar52 = CONCAT17(p.y._3_1_,
                                                CONCAT16(p.y._2_1_,
                                                         CONCAT15(p.y._1_1_,
                                                                  CONCAT14(p.y._0_1_,
                                                                           CONCAT13(p.x._3_1_,
                                                                                    CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                              lVar86 = CONCAT17(acStack_1ac[3],
                                                CONCAT16(acStack_1ac[2],
                                                         CONCAT15(acStack_1ac[1],
                                                                  CONCAT14(acStack_1ac[0],
                                                                           CONCAT13(p.z._3_1_,
                                                                                    CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                              for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 0xc);
                                  uVar54 = uVar54 + 1) {
                                for (uVar67 = 0; (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 0xc);
                                    uVar67 = uVar67 + 1) {
                                  max = (Vec2<short>)
                                        -(int)*(undefined8 *)(lVar52 + (ulong)uVar54 * 0xc);
                                  min.x = -1;
                                  min.y = 0x7fff;
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<int>_> *)&max);
                                  if (bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                    ;
                                    goto LAB_00113a36;
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator!=
                                                     ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<int>_> *)&max);
                                  if (!bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                    ;
                                    goto LAB_00113a55;
                                  }
                                  lVar52 = CONCAT17(p.y._3_1_,
                                                    CONCAT16(p.y._2_1_,
                                                             CONCAT15(p.y._1_1_,
                                                                      CONCAT14(p.y._0_1_,
                                                                               CONCAT13(p.x._3_1_,
                                                                                        CONCAT12(p.x
                                                  ._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                  lVar86 = CONCAT17(acStack_1ac[3],
                                                    CONCAT16(acStack_1ac[2],
                                                             CONCAT15(acStack_1ac[1],
                                                                      CONCAT14(acStack_1ac[0],
                                                                               CONCAT13(p.z._3_1_,
                                                                                        CONCAT12(p.z
                                                  ._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                                }
                              }
                              std::
                              _Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                              ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                                               *)&p);
                              p.x._0_1_ = 0;
                              p.x._1_1_ = 0;
                              p.x._2_1_ = 0;
                              p.x._3_1_ = 0;
                              p.y._0_1_ = 0;
                              p.y._1_1_ = 0;
                              p.y._2_1_ = 0;
                              p.y._3_1_ = 0;
                              p.z._0_1_ = 0;
                              p.z._1_1_ = 0;
                              p.z._2_1_ = 0;
                              p.z._3_1_ = 0;
                              acStack_1ac[0] = '\0';
                              acStack_1ac[1] = 0;
                              acStack_1ac[2] = 0;
                              acStack_1ac[3] = 0;
                              local_1a8._0_4_ = 0.0;
                              local_1a8._4_4_ = 0.0;
                              (anonymous_namespace)::permutations<Imath_3_2::Vec3<int>>
                                        ((vector<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                                          *)&p);
                              lVar52 = CONCAT17(p.y._3_1_,
                                                CONCAT16(p.y._2_1_,
                                                         CONCAT15(p.y._1_1_,
                                                                  CONCAT14(p.y._0_1_,
                                                                           CONCAT13(p.x._3_1_,
                                                                                    CONCAT12(p.x.
                                                  _2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                              lVar86 = CONCAT17(acStack_1ac[3],
                                                CONCAT16(acStack_1ac[2],
                                                         CONCAT15(acStack_1ac[1],
                                                                  CONCAT14(acStack_1ac[0],
                                                                           CONCAT13(p.z._3_1_,
                                                                                    CONCAT12(p.z.
                                                  _2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                              for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 0xc);
                                  uVar54 = uVar54 + 1) {
                                lVar76 = (ulong)uVar54 * 0xc;
                                for (uVar67 = 0; (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 0xc);
                                    uVar67 = uVar67 + 1) {
                                  max = (Vec2<short>)-*(int *)(lVar52 + (ulong)uVar67 * 0xc);
                                  min = (Vec2<short>)-*(int *)(lVar52 + lVar76);
                                  rand_2._state._4_4_ = -*(int *)(lVar52 + 4 + lVar76);
                                  rand_2._state._0_4_ = min;
                                  if (uVar54 == uVar67) {
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator==
                                                       ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                        (Box<Imath_3_2::Vec3<int>_> *)&max);
                                    if (!bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                      ;
                                      goto LAB_00113e80;
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator!=
                                                       ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                        (Box<Imath_3_2::Vec3<int>_> *)&max);
                                    if (bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                      ;
                                      goto LAB_00113e61;
                                    }
                                  }
                                  else {
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator!=
                                                       ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                        (Box<Imath_3_2::Vec3<int>_> *)&max);
                                    if (!bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                      ;
                                      goto LAB_00113e9f;
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator==
                                                       ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                        (Box<Imath_3_2::Vec3<int>_> *)&max);
                                    if (bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                      ;
                                      goto LAB_00113ebe;
                                    }
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<int>_> *)&rand_2);
                                  if (!bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                    ;
                                    goto LAB_00113696;
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<int>_>::operator!=
                                                     ((Box<Imath_3_2::Vec3<int>_> *)&min,
                                                      (Box<Imath_3_2::Vec3<int>_> *)&rand_2);
                                  if (bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<int>]"
                                    ;
                                    goto LAB_00113677;
                                  }
                                  lVar52 = CONCAT17(p.y._3_1_,
                                                    CONCAT16(p.y._2_1_,
                                                             CONCAT15(p.y._1_1_,
                                                                      CONCAT14(p.y._0_1_,
                                                                               CONCAT13(p.x._3_1_,
                                                                                        CONCAT12(p.x
                                                  ._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                  lVar86 = CONCAT17(acStack_1ac[3],
                                                    CONCAT16(acStack_1ac[2],
                                                             CONCAT15(acStack_1ac[1],
                                                                      CONCAT14(acStack_1ac[0],
                                                                               CONCAT13(p.z._3_1_,
                                                                                        CONCAT12(p.z
                                                  ._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                                }
                              }
                              std::
                              _Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                              ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<int>,_std::allocator<Imath_3_2::Vec3<int>_>_>
                                               *)&p);
                              poVar51 = std::operator<<((ostream *)&std::cout,
                                                        "    comparators for type ");
                              poVar51 = std::operator<<(poVar51,"V3i64");
                              std::endl<char,std::char_traits<char>>(poVar51);
                              p.x._0_1_ = 0xff;
                              p.x._1_1_ = 0xff;
                              p.x._2_1_ = 0xff;
                              p.x._3_1_ = 0xff;
                              p.y._0_1_ = 0xff;
                              p.y._1_1_ = 0xff;
                              p.y._2_1_ = 0xff;
                              p.y._3_1_ = 0x7f;
                              p.z._0_1_ = 0xff;
                              p.z._1_1_ = 0xff;
                              p.z._2_1_ = 0xff;
                              p.z._3_1_ = 0xff;
                              acStack_1ac[0] = -1;
                              acStack_1ac[1] = 0xff;
                              acStack_1ac[2] = 0xff;
                              acStack_1ac[3] = 0x7f;
                              local_1a8._0_4_ = -NAN;
                              local_1a8._4_4_ = NAN;
                              uStack_1a0._0_4_ = 0.0;
                              uStack_1a0._4_4_ = -0.0;
                              min.x = -1;
                              min.y = -1;
                              local_198[0] = (float)uStack_1a0;
                              local_198[1] = uStack_1a0._4_4_;
                              local_198[2] = (float)uStack_1a0;
                              local_198[3] = uStack_1a0._4_4_;
                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                                                 ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                  (Box<Imath_3_2::Vec3<long>_> *)&min);
                              if (!bVar49) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                ;
                                goto LAB_00114902;
                              }
                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                                                 ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                  (Box<Imath_3_2::Vec3<long>_> *)&min);
                              if (bVar49) {
                                pcVar58 = 
                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                ;
                              }
                              else {
                                max.x = 0;
                                max.y = 0;
                                (anonymous_namespace)::permutations<Imath_3_2::Vec3<long>>
                                          ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                            *)&max);
                                uVar55 = (ulong)CONCAT22(max.y,max.x);
                                uVar54 = 0;
                                while( true ) {
                                  fVar151 = local_198[3];
                                  fVar90 = local_198[2];
                                  local_198[2] = 0.0;
                                  fVar118 = local_198[2];
                                  local_198[3] = -0.0;
                                  fVar61 = local_198[3];
                                  local_198[2] = fVar90;
                                  local_198[3] = fVar151;
                                  if ((ulong)((long)-uVar55 / 0x18) <= (ulong)uVar54) break;
                                  for (uVar67 = 0; (ulong)uVar67 < (ulong)((long)-uVar55 / 0x18);
                                      uVar67 = uVar67 + 1) {
                                    lVar52 = -*(long *)(uVar55 + (ulong)uVar54 * 0x18);
                                    p.x._0_1_ = 0xff;
                                    p.x._1_1_ = 0xff;
                                    p.x._2_1_ = 0xff;
                                    p.x._3_1_ = 0xff;
                                    p.y._0_1_ = 0xff;
                                    p.y._1_1_ = 0xff;
                                    p.y._2_1_ = 0xff;
                                    p.y._3_1_ = 0x7f;
                                    p.z._0_1_ = 0xff;
                                    p.z._1_1_ = 0xff;
                                    p.z._2_1_ = 0xff;
                                    p.z._3_1_ = 0xff;
                                    acStack_1ac[0] = -1;
                                    acStack_1ac[1] = 0xff;
                                    acStack_1ac[2] = 0xff;
                                    acStack_1ac[3] = 0x7f;
                                    local_1a8._0_4_ = -NAN;
                                    local_1a8._4_4_ = NAN;
                                    uStack_1a0._0_4_ = 0.0;
                                    min.x = (short)lVar52;
                                    min.y = (short)((ulong)lVar52 >> 0x10);
                                    local_198[0] = (float)uStack_1a0;
                                    uStack_1a0._4_4_ = fVar61;
                                    local_198[1] = fVar61;
                                    local_198[2] = fVar118;
                                    local_198[3] = fVar61;
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                                                       ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                        (Box<Imath_3_2::Vec3<long>_> *)&min);
                                    if (bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                      ;
LAB_00113a36:
                                      __assert_fail("!(b0 == b1)",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x18d,pcVar58);
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                                                       ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                        (Box<Imath_3_2::Vec3<long>_> *)&min);
                                    if (!bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                      ;
LAB_00113a55:
                                      __assert_fail("b0 != b1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x18e,pcVar58);
                                    }
                                    uVar55 = (ulong)CONCAT22(max.y,max.x);
                                  }
                                  uVar54 = uVar54 + 1;
                                }
                                std::
                                _Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                                 *)&max);
                                rand_2._state._0_2_ = 0;
                                rand_2._state._2_2_ = 0;
                                rand_2._state._4_2_ = 0;
                                rand_2._state._6_2_ = 0;
                                (anonymous_namespace)::permutations<Imath_3_2::Vec3<long>>
                                          ((vector<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                            *)&rand_2);
                                lVar52 = CONCAT26(rand_2._state._6_2_,
                                                  CONCAT24(rand_2._state._4_2_,
                                                           CONCAT22(rand_2._state._2_2_,
                                                                    (short)rand_2._state)));
                                for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 / 0x18);
                                    uVar54 = uVar54 + 1) {
                                  lVar86 = (ulong)uVar54 * 0x18;
                                  for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 / 0x18);
                                      uVar67 = uVar67 + 1) {
                                    lVar80 = (ulong)uVar67 * 0x18;
                                    lVar76 = *(long *)(lVar52 + lVar80);
                                    uVar8 = *(undefined8 *)(lVar52 + 8 + lVar80);
                                    uVar9 = *(undefined8 *)(lVar52 + 0x10 + lVar80);
                                    min.x = (short)-lVar76;
                                    min.y = (short)((ulong)-lVar76 >> 0x10);
                                    lVar64 = -*(long *)(lVar52 + lVar86);
                                    lVar80 = -*(long *)(lVar52 + 8 + lVar86);
                                    local_1a8 = (double)-*(long *)(lVar52 + 0x10 + lVar86);
                                    p.x._0_1_ = (char)lVar64;
                                    p.x._1_1_ = (char)((ulong)lVar64 >> 8);
                                    p.x._2_1_ = (char)((ulong)lVar64 >> 0x10);
                                    p.x._3_1_ = (char)((ulong)lVar64 >> 0x18);
                                    p.y._0_1_ = (char)((ulong)lVar64 >> 0x20);
                                    p.y._1_1_ = (char)((ulong)lVar64 >> 0x28);
                                    p.y._2_1_ = (char)((ulong)lVar64 >> 0x30);
                                    p.y._3_1_ = (char)((ulong)lVar64 >> 0x38);
                                    p.z._0_1_ = (char)lVar80;
                                    p.z._1_1_ = (char)((ulong)lVar80 >> 8);
                                    p.z._2_1_ = (char)((ulong)lVar80 >> 0x10);
                                    p.z._3_1_ = (char)((ulong)lVar80 >> 0x18);
                                    acStack_1ac[0] = (char)((ulong)lVar80 >> 0x20);
                                    acStack_1ac[1] = (char)((ulong)lVar80 >> 0x28);
                                    acStack_1ac[2] = (char)((ulong)lVar80 >> 0x30);
                                    acStack_1ac[3] = (char)((ulong)lVar80 >> 0x38);
                                    uStack_1a0._0_4_ = (float)lVar76;
                                    uStack_1a0._4_4_ = (float)((ulong)lVar76 >> 0x20);
                                    local_198[0] = (float)uVar8;
                                    local_198[1] = (float)((ulong)uVar8 >> 0x20);
                                    local_198[2] = (float)uVar9;
                                    local_198[3] = (float)((ulong)uVar9 >> 0x20);
                                    max.x = (short)lVar64;
                                    max.y = (short)((ulong)lVar64 >> 0x10);
                                    if (uVar54 == uVar67) {
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                                                         ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                          (Box<Imath_3_2::Vec3<long>_> *)&min);
                                      if (!bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                        ;
                                        goto LAB_00113e80;
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                                                         ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                          (Box<Imath_3_2::Vec3<long>_> *)&min);
                                      if (bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                        ;
                                        goto LAB_00113e61;
                                      }
                                    }
                                    else {
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                                                         ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                          (Box<Imath_3_2::Vec3<long>_> *)&min);
                                      if (!bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                        ;
                                        goto LAB_00113e9f;
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                                                         ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                          (Box<Imath_3_2::Vec3<long>_> *)&min);
                                      if (bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                        ;
                                        goto LAB_00113ebe;
                                      }
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator==
                                                       ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                        (Box<Imath_3_2::Vec3<long>_> *)&max);
                                    if (!bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                      ;
                                      goto LAB_00113696;
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<long>_>::operator!=
                                                       ((Box<Imath_3_2::Vec3<long>_> *)&p,
                                                        (Box<Imath_3_2::Vec3<long>_> *)&max);
                                    if (bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<long>]"
                                      ;
                                      goto LAB_00113677;
                                    }
                                    lVar52 = CONCAT26(rand_2._state._6_2_,
                                                      CONCAT24(rand_2._state._4_2_,
                                                               CONCAT22(rand_2._state._2_2_,
                                                                        (short)rand_2._state)));
                                  }
                                }
                                std::
                                _Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                ::~_Vector_base((_Vector_base<Imath_3_2::Vec3<long>,_std::allocator<Imath_3_2::Vec3<long>_>_>
                                                 *)&rand_2);
                                poVar51 = std::operator<<((ostream *)&std::cout,
                                                          "    comparators for type ");
                                poVar51 = std::operator<<(poVar51,"V3f");
                                std::endl<char,std::char_traits<char>>(poVar51);
                                p.x._0_1_ = 0xff;
                                p.x._1_1_ = 0xff;
                                p.x._2_1_ = 0x7f;
                                p.x._3_1_ = 0x7f;
                                p.y._0_1_ = 0xff;
                                p.y._1_1_ = 0xff;
                                p.y._2_1_ = 0x7f;
                                p.y._3_1_ = 0x7f;
                                p.z._0_1_ = 0xff;
                                p.z._1_1_ = 0xff;
                                p.z._2_1_ = 0x7f;
                                p.z._3_1_ = 0x7f;
                                acStack_1ac[0] = -1;
                                acStack_1ac[1] = 0xff;
                                acStack_1ac[2] = 0x7f;
                                acStack_1ac[3] = 0xff;
                                local_1a8._0_4_ = -3.4028235e+38;
                                local_1a8._4_4_ = -3.4028235e+38;
                                min.x = -1;
                                min.y = 0x7f7f;
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                   ((Box<Imath_3_2::Vec3<float>_> *)&p,
                                                    (Box<Imath_3_2::Vec3<float>_> *)&min);
                                if (!bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                  ;
                                  goto LAB_00114902;
                                }
                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator!=
                                                   ((Box<Imath_3_2::Vec3<float>_> *)&p,
                                                    (Box<Imath_3_2::Vec3<float>_> *)&min);
                                if (bVar49) {
                                  pcVar58 = 
                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                  ;
                                }
                                else {
                                  p.x._0_1_ = 0;
                                  p.x._1_1_ = 0;
                                  p.x._2_1_ = 0;
                                  p.x._3_1_ = 0;
                                  p.y._0_1_ = 0;
                                  p.y._1_1_ = 0;
                                  p.y._2_1_ = 0;
                                  p.y._3_1_ = 0;
                                  p.z._0_1_ = 0;
                                  p.z._1_1_ = 0;
                                  p.z._2_1_ = 0;
                                  p.z._3_1_ = 0;
                                  acStack_1ac[0] = '\0';
                                  acStack_1ac[1] = 0;
                                  acStack_1ac[2] = 0;
                                  acStack_1ac[3] = 0;
                                  local_1a8._0_4_ = 0.0;
                                  local_1a8._4_4_ = 0.0;
                                  (anonymous_namespace)::permutations<Imath_3_2::Vec3<float>>
                                            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                              *)&p);
                                  lVar52 = CONCAT17(p.y._3_1_,
                                                    CONCAT16(p.y._2_1_,
                                                             CONCAT15(p.y._1_1_,
                                                                      CONCAT14(p.y._0_1_,
                                                                               CONCAT13(p.x._3_1_,
                                                                                        CONCAT12(p.x
                                                  ._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                  lVar86 = CONCAT17(acStack_1ac[3],
                                                    CONCAT16(acStack_1ac[2],
                                                             CONCAT15(acStack_1ac[1],
                                                                      CONCAT14(acStack_1ac[0],
                                                                               CONCAT13(p.z._3_1_,
                                                                                        CONCAT12(p.z
                                                  ._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                                  auVar93 = _DAT_00153290;
                                  for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 0xc);
                                      uVar54 = uVar54 + 1) {
                                    for (uVar67 = 0;
                                        (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 0xc);
                                        uVar67 = uVar67 + 1) {
                                      uVar55 = *(ulong *)(lVar52 + (ulong)uVar54 * 0xc) ^
                                               auVar93._0_8_;
                                      min.x = -1;
                                      min.y = 0x7f7f;
                                      max.x = (short)uVar55;
                                      max.y = (short)(uVar55 >> 0x10);
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                         ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                          (Box<Imath_3_2::Vec3<float>_> *)&max);
                                      if (bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                        ;
                                        goto LAB_00113a36;
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator!=
                                                         ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                          (Box<Imath_3_2::Vec3<float>_> *)&max);
                                      if (!bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                        ;
                                        goto LAB_00113a55;
                                      }
                                      lVar52 = CONCAT17(p.y._3_1_,
                                                        CONCAT16(p.y._2_1_,
                                                                 CONCAT15(p.y._1_1_,
                                                                          CONCAT14(p.y._0_1_,
                                                                                   CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                      ;
                                      lVar86 = CONCAT17(acStack_1ac[3],
                                                        CONCAT16(acStack_1ac[2],
                                                                 CONCAT15(acStack_1ac[1],
                                                                          CONCAT14(acStack_1ac[0],
                                                                                   CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                                      ;
                                      auVar93 = _DAT_00153290;
                                    }
                                  }
                                  std::
                                  _Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                  ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                                  *)&p);
                                  p.x._0_1_ = 0;
                                  p.x._1_1_ = 0;
                                  p.x._2_1_ = 0;
                                  p.x._3_1_ = 0;
                                  p.y._0_1_ = 0;
                                  p.y._1_1_ = 0;
                                  p.y._2_1_ = 0;
                                  p.y._3_1_ = 0;
                                  p.z._0_1_ = 0;
                                  p.z._1_1_ = 0;
                                  p.z._2_1_ = 0;
                                  p.z._3_1_ = 0;
                                  acStack_1ac[0] = '\0';
                                  acStack_1ac[1] = 0;
                                  acStack_1ac[2] = 0;
                                  acStack_1ac[3] = 0;
                                  local_1a8._0_4_ = 0.0;
                                  local_1a8._4_4_ = 0.0;
                                  (anonymous_namespace)::permutations<Imath_3_2::Vec3<float>>
                                            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                              *)&p);
                                  lVar52 = CONCAT17(p.y._3_1_,
                                                    CONCAT16(p.y._2_1_,
                                                             CONCAT15(p.y._1_1_,
                                                                      CONCAT14(p.y._0_1_,
                                                                               CONCAT13(p.x._3_1_,
                                                                                        CONCAT12(p.x
                                                  ._2_1_,CONCAT11(p.x._1_1_,p.x._0_1_)))))));
                                  lVar86 = CONCAT17(acStack_1ac[3],
                                                    CONCAT16(acStack_1ac[2],
                                                             CONCAT15(acStack_1ac[1],
                                                                      CONCAT14(acStack_1ac[0],
                                                                               CONCAT13(p.z._3_1_,
                                                                                        CONCAT12(p.z
                                                  ._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))))));
                                  for (uVar54 = 0; (ulong)uVar54 < (ulong)((lVar86 - lVar52) / 0xc);
                                      uVar54 = uVar54 + 1) {
                                    for (uVar67 = 0;
                                        (ulong)uVar67 < (ulong)((lVar86 - lVar52) / 0xc);
                                        uVar67 = uVar67 + 1) {
                                      uVar55 = *(ulong *)(lVar52 + (ulong)uVar54 * 0xc);
                                      uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar67 * 0xc);
                                      max.y = (ushort)((ulong)uVar8 >> 0x10) ^ 0x8000;
                                      max.x = (short)uVar8;
                                      sStack_10c = (short)uVar55;
                                      min.y = (short)((uVar55 ^ 0x8000000080000000) >> 0x10);
                                      sStack_174 = (short)(uVar55 >> 0x20);
                                      sStack_172 = (short)((uVar55 ^ 0x8000000080000000) >> 0x30);
                                      min.x = sStack_10c;
                                      rand_2._state._0_2_ = sStack_10c;
                                      rand_2._state._4_2_ = sStack_174;
                                      rand_2._state._6_2_ = sStack_172;
                                      if (uVar54 == uVar67) {
                                        rand_2._state._2_2_ = min.y;
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                           ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                            (Box<Imath_3_2::Vec3<float>_> *)&max);
                                        if (!bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                          ;
                                          goto LAB_00113e80;
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator!=
                                                           ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                            (Box<Imath_3_2::Vec3<float>_> *)&max);
                                        if (bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                          ;
                                          goto LAB_00113e61;
                                        }
                                      }
                                      else {
                                        rand_2._state._2_2_ = min.y;
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator!=
                                                           ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                            (Box<Imath_3_2::Vec3<float>_> *)&max);
                                        if (!bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                          ;
                                          goto LAB_00113e9f;
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                           ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                            (Box<Imath_3_2::Vec3<float>_> *)&max);
                                        if (bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                          ;
                                          goto LAB_00113ebe;
                                        }
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator==
                                                         ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                          (Box<Imath_3_2::Vec3<float>_> *)&rand_2);
                                      if (!bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                        ;
                                        goto LAB_00113696;
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<float>_>::operator!=
                                                         ((Box<Imath_3_2::Vec3<float>_> *)&min,
                                                          (Box<Imath_3_2::Vec3<float>_> *)&rand_2);
                                      if (bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<float>]"
                                        ;
                                        goto LAB_00113677;
                                      }
                                      lVar52 = CONCAT17(p.y._3_1_,
                                                        CONCAT16(p.y._2_1_,
                                                                 CONCAT15(p.y._1_1_,
                                                                          CONCAT14(p.y._0_1_,
                                                                                   CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                      ;
                                      lVar86 = CONCAT17(acStack_1ac[3],
                                                        CONCAT16(acStack_1ac[2],
                                                                 CONCAT15(acStack_1ac[1],
                                                                          CONCAT14(acStack_1ac[0],
                                                                                   CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                                      ;
                                    }
                                  }
                                  std::
                                  _Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                  ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                                                  *)&p);
                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                            "    comparators for type ");
                                  poVar51 = std::operator<<(poVar51,"V3d");
                                  std::endl<char,std::char_traits<char>>(poVar51);
                                  p.x._0_1_ = DAT_00153230;
                                  p.x._1_1_ = DAT_00153230._1_1_;
                                  p.x._2_1_ = DAT_00153230._2_1_;
                                  p.x._3_1_ = DAT_00153230._3_1_;
                                  p.y._0_1_ = DAT_00153230._4_1_;
                                  p.y._1_1_ = DAT_00153230._5_1_;
                                  p.y._2_1_ = DAT_00153230._6_1_;
                                  p.y._3_1_ = DAT_00153230._7_1_;
                                  p.z._0_1_ = DAT_00153230._8_1_;
                                  p.z._1_1_ = DAT_00153230._9_1_;
                                  p.z._2_1_ = DAT_00153230._10_1_;
                                  p.z._3_1_ = DAT_00153230._11_1_;
                                  acStack_1ac[0] = DAT_00153230._12_1_;
                                  acStack_1ac[1] = DAT_00153230._13_1_;
                                  acStack_1ac[2] = DAT_00153230._14_1_;
                                  acStack_1ac[3] = DAT_00153230._15_1_;
                                  local_1a8._0_4_ = -NAN;
                                  local_1a8._4_4_ = NAN;
                                  uStack_1a0._0_4_ = -NAN;
                                  uStack_1a0._4_4_ = -NAN;
                                  local_198[0] = (float)DAT_00153240;
                                  local_198[1] = DAT_00153240._4_4_;
                                  local_198[2] = DAT_00153240._8_4_;
                                  local_198[3] = DAT_00153240._12_4_;
                                  min.x = (short)DAT_00153230;
                                  min.y = DAT_00153230._2_2_;
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::operator==
                                                     ((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                      (Box<Imath_3_2::Vec3<double>_> *)&min);
                                  if (!bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                    ;
                                    goto LAB_00114902;
                                  }
                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::operator!=
                                                     ((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                      (Box<Imath_3_2::Vec3<double>_> *)&min);
                                  if (bVar49) {
                                    pcVar58 = 
                                    "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                    ;
                                  }
                                  else {
                                    max.x = 0;
                                    max.y = 0;
                                    (anonymous_namespace)::permutations<Imath_3_2::Vec3<double>>
                                              ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                                *)&max);
                                    uVar55 = (ulong)CONCAT22(max.y,max.x);
                                    for (uVar54 = 0; (ulong)uVar54 < (ulong)((long)-uVar55 / 0x18);
                                        uVar54 = uVar54 + 1) {
                                      for (uVar67 = 0; (ulong)uVar67 < (ulong)((long)-uVar55 / 0x18)
                                          ; uVar67 = uVar67 + 1) {
                                        uVar8 = *(undefined8 *)(uVar55 + (ulong)uVar54 * 0x18);
                                        p.x._0_1_ = 0xff;
                                        p.x._1_1_ = 0xff;
                                        p.x._2_1_ = 0xff;
                                        p.x._3_1_ = 0xff;
                                        p.y._0_1_ = 0xff;
                                        p.y._1_1_ = 0xff;
                                        p.y._2_1_ = 0xef;
                                        p.y._3_1_ = 0x7f;
                                        p.z._0_1_ = 0xff;
                                        p.z._1_1_ = 0xff;
                                        p.z._2_1_ = 0xff;
                                        p.z._3_1_ = 0xff;
                                        acStack_1ac[0] = -1;
                                        acStack_1ac[1] = 0xff;
                                        acStack_1ac[2] = 0xef;
                                        acStack_1ac[3] = 0x7f;
                                        local_1a8._0_4_ = -NAN;
                                        local_1a8._4_4_ = NAN;
                                        uStack_1a0._0_4_ = -NAN;
                                        uStack_1a0._4_4_ = -NAN;
                                        local_198[0] = (float)DAT_00153240;
                                        local_198[1] = DAT_00153240._4_4_;
                                        local_198[2] = DAT_00153240._8_4_;
                                        local_198[3] = DAT_00153240._12_4_;
                                        min.x = (short)uVar8;
                                        min.y = (short)((ulong)uVar8 >> 0x10);
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                 operator==((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                            (Box<Imath_3_2::Vec3<double>_> *)&min);
                                        if (bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                          ;
                                          goto LAB_00113a36;
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                 operator!=((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                            (Box<Imath_3_2::Vec3<double>_> *)&min);
                                        if (!bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                          ;
                                          goto LAB_00113a55;
                                        }
                                        uVar55 = (ulong)CONCAT22(max.y,max.x);
                                      }
                                    }
                                    std::
                                    _Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                    ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                                  *)&max);
                                    rand_2._state._0_2_ = 0;
                                    rand_2._state._2_2_ = 0;
                                    rand_2._state._4_2_ = 0;
                                    rand_2._state._6_2_ = 0;
                                    (anonymous_namespace)::permutations<Imath_3_2::Vec3<double>>
                                              ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                                *)&rand_2);
                                    lVar52 = CONCAT26(rand_2._state._6_2_,
                                                      CONCAT24(rand_2._state._4_2_,
                                                               CONCAT22(rand_2._state._2_2_,
                                                                        (short)rand_2._state)));
                                    for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 / 0x18);
                                        uVar54 = uVar54 + 1) {
                                      lVar86 = (ulong)uVar54 * 0x18;
                                      for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 / 0x18);
                                          uVar67 = uVar67 + 1) {
                                        lVar76 = (ulong)uVar67 * 0x18;
                                        uVar8 = *(undefined8 *)(lVar52 + 0x10 + lVar76);
                                        auVar93 = *(undefined1 (*) [16])(lVar52 + lVar76);
                                        min.x = SUB162(auVar93 ^ _DAT_001533a0,0);
                                        min.y = SUB162(auVar93 ^ _DAT_001533a0,2);
                                        uVar55 = *(ulong *)(lVar52 + 0x10 + lVar86) ^
                                                 (ulong)DAT_001533a0;
                                        auVar169 = *(undefined1 (*) [16])(lVar52 + lVar86) ^
                                                   _DAT_001533a0;
                                        p.x._0_1_ = auVar169[0];
                                        p.x._1_1_ = auVar169[1];
                                        p.x._2_1_ = auVar169[2];
                                        p.x._3_1_ = auVar169[3];
                                        p.y._0_1_ = auVar169[4];
                                        p.y._1_1_ = auVar169[5];
                                        p.y._2_1_ = auVar169[6];
                                        p.y._3_1_ = auVar169[7];
                                        p.z._0_1_ = auVar169[8];
                                        p.z._1_1_ = auVar169[9];
                                        p.z._2_1_ = auVar169[10];
                                        p.z._3_1_ = auVar169[0xb];
                                        acStack_1ac[0] = auVar169[0xc];
                                        acStack_1ac[1] = auVar169[0xd];
                                        acStack_1ac[2] = auVar169[0xe];
                                        acStack_1ac[3] = auVar169[0xf];
                                        local_1a8._0_4_ = (float)uVar55;
                                        local_1a8._4_4_ = (float)(uVar55 >> 0x20);
                                        uStack_1a0._0_4_ = auVar93._0_4_;
                                        uStack_1a0._4_4_ = auVar93._4_4_;
                                        local_198[0] = auVar93._8_4_;
                                        local_198[1] = auVar93._12_4_;
                                        local_198[2] = (float)uVar8;
                                        local_198[3] = (float)((ulong)uVar8 >> 0x20);
                                        max.x = auVar169._0_2_;
                                        max.y = auVar169._2_2_;
                                        if (uVar54 == uVar67) {
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                   operator==((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                              (Box<Imath_3_2::Vec3<double>_> *)&min)
                                          ;
                                          if (!bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                            ;
                                            goto LAB_00113e80;
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                   operator!=((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                              (Box<Imath_3_2::Vec3<double>_> *)&min)
                                          ;
                                          if (bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                            ;
                                            goto LAB_00113e61;
                                          }
                                        }
                                        else {
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                   operator!=((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                              (Box<Imath_3_2::Vec3<double>_> *)&min)
                                          ;
                                          if (!bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                            ;
                                            goto LAB_00113e9f;
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                   operator==((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                              (Box<Imath_3_2::Vec3<double>_> *)&min)
                                          ;
                                          if (bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                            ;
                                            goto LAB_00113ebe;
                                          }
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                 operator==((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                            (Box<Imath_3_2::Vec3<double>_> *)&max);
                                        if (!bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                          ;
                                          goto LAB_00113696;
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec3<double>_>::
                                                 operator!=((Box<Imath_3_2::Vec3<double>_> *)&p,
                                                            (Box<Imath_3_2::Vec3<double>_> *)&max);
                                        if (bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec3<double>]"
                                          ;
                                          goto LAB_00113677;
                                        }
                                        lVar52 = CONCAT26(rand_2._state._6_2_,
                                                          CONCAT24(rand_2._state._4_2_,
                                                                   CONCAT22(rand_2._state._2_2_,
                                                                            (short)rand_2._state)));
                                      }
                                    }
                                    std::
                                    _Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                    ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>
                                                  *)&rand_2);
                                    poVar51 = std::operator<<((ostream *)&std::cout,
                                                              "    comparators for type ");
                                    poVar51 = std::operator<<(poVar51,"V4s");
                                    std::endl<char,std::char_traits<char>>(poVar51);
                                    p.x._0_1_ = 0xff;
                                    p.x._1_1_ = 0x7f;
                                    p.x._2_1_ = 0xff;
                                    p.x._3_1_ = 0x7f;
                                    p.y._0_1_ = 0xff;
                                    p.y._1_1_ = 0x7f;
                                    p.y._2_1_ = 0xff;
                                    p.y._3_1_ = 0x7f;
                                    p.z._0_1_ = 0;
                                    p.z._1_1_ = 0x80;
                                    p.z._2_1_ = 0;
                                    p.z._3_1_ = 0x80;
                                    acStack_1ac[0] = '\0';
                                    acStack_1ac[1] = 0x80;
                                    acStack_1ac[2] = 0;
                                    acStack_1ac[3] = 0x80;
                                    min.x = 0x7fff;
                                    min.y = 0x7fff;
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::operator==
                                                       ((Box<Imath_3_2::Vec4<short>_> *)&p,
                                                        (Box<Imath_3_2::Vec4<short>_> *)&min);
                                    if (!bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                      ;
                                      goto LAB_00114902;
                                    }
                                    bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::operator!=
                                                       ((Box<Imath_3_2::Vec4<short>_> *)&p,
                                                        (Box<Imath_3_2::Vec4<short>_> *)&min);
                                    if (bVar49) {
                                      pcVar58 = 
                                      "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                      ;
                                    }
                                    else {
                                      p.x._0_1_ = 0;
                                      p.x._1_1_ = 0;
                                      p.x._2_1_ = 0;
                                      p.x._3_1_ = 0;
                                      p.y._0_1_ = 0;
                                      p.y._1_1_ = 0;
                                      p.y._2_1_ = 0;
                                      p.y._3_1_ = 0;
                                      p.z._0_1_ = 0;
                                      p.z._1_1_ = 0;
                                      p.z._2_1_ = 0;
                                      p.z._3_1_ = 0;
                                      acStack_1ac[0] = '\0';
                                      acStack_1ac[1] = 0;
                                      acStack_1ac[2] = 0;
                                      acStack_1ac[3] = 0;
                                      local_1a8._0_4_ = 0.0;
                                      local_1a8._4_4_ = 0.0;
                                      (anonymous_namespace)::permutations<Imath_3_2::Vec4<short>>
                                                ((vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                                  *)&p);
                                      lVar52 = CONCAT17(p.y._3_1_,
                                                        CONCAT16(p.y._2_1_,
                                                                 CONCAT15(p.y._1_1_,
                                                                          CONCAT14(p.y._0_1_,
                                                                                   CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                      ;
                                      lVar86 = CONCAT17(acStack_1ac[3],
                                                        CONCAT16(acStack_1ac[2],
                                                                 CONCAT15(acStack_1ac[1],
                                                                          CONCAT14(acStack_1ac[0],
                                                                                   CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                                      ;
                                      for (uVar54 = 0; (ulong)uVar54 < (ulong)(lVar86 - lVar52 >> 3)
                                          ; uVar54 = uVar54 + 1) {
                                        for (uVar67 = 0;
                                            (ulong)uVar67 < (ulong)(lVar86 - lVar52 >> 3);
                                            uVar67 = uVar67 + 1) {
                                          uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar54 * 8);
                                          max.x = -(short)uVar8;
                                          max.y = -(short)((ulong)uVar8 >> 0x10);
                                          min.x = 0x7fff;
                                          min.y = 0x7fff;
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                   operator==((Box<Imath_3_2::Vec4<short>_> *)&min,
                                                              (Box<Imath_3_2::Vec4<short>_> *)&max);
                                          if (bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                            ;
                                            goto LAB_00113a36;
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                   operator!=((Box<Imath_3_2::Vec4<short>_> *)&min,
                                                              (Box<Imath_3_2::Vec4<short>_> *)&max);
                                          if (!bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                            ;
                                            goto LAB_00113a55;
                                          }
                                          lVar52 = CONCAT17(p.y._3_1_,
                                                            CONCAT16(p.y._2_1_,
                                                                     CONCAT15(p.y._1_1_,
                                                                              CONCAT14(p.y._0_1_,
                                                                                       CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                          ;
                                          lVar86 = CONCAT17(acStack_1ac[3],
                                                            CONCAT16(acStack_1ac[2],
                                                                     CONCAT15(acStack_1ac[1],
                                                                              CONCAT14(acStack_1ac
                                                                                       [0],CONCAT13(
                                                  p.z._3_1_,
                                                  CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                                                  ))));
                                        }
                                      }
                                      std::
                                      _Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                      ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                                  *)&p);
                                      p.x._0_1_ = 0;
                                      p.x._1_1_ = 0;
                                      p.x._2_1_ = 0;
                                      p.x._3_1_ = 0;
                                      p.y._0_1_ = 0;
                                      p.y._1_1_ = 0;
                                      p.y._2_1_ = 0;
                                      p.y._3_1_ = 0;
                                      p.z._0_1_ = 0;
                                      p.z._1_1_ = 0;
                                      p.z._2_1_ = 0;
                                      p.z._3_1_ = 0;
                                      acStack_1ac[0] = '\0';
                                      acStack_1ac[1] = 0;
                                      acStack_1ac[2] = 0;
                                      acStack_1ac[3] = 0;
                                      local_1a8._0_4_ = 0.0;
                                      local_1a8._4_4_ = 0.0;
                                      (anonymous_namespace)::permutations<Imath_3_2::Vec4<short>>
                                                ((vector<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                                  *)&p);
                                      lVar52 = CONCAT17(p.y._3_1_,
                                                        CONCAT16(p.y._2_1_,
                                                                 CONCAT15(p.y._1_1_,
                                                                          CONCAT14(p.y._0_1_,
                                                                                   CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                      ;
                                      lVar86 = CONCAT17(acStack_1ac[3],
                                                        CONCAT16(acStack_1ac[2],
                                                                 CONCAT15(acStack_1ac[1],
                                                                          CONCAT14(acStack_1ac[0],
                                                                                   CONCAT13(p.z.
                                                  _3_1_,CONCAT12(p.z._2_1_,
                                                                 CONCAT11(p.z._1_1_,p.z._0_1_)))))))
                                      ;
                                      for (uVar54 = 0; (ulong)uVar54 < (ulong)(lVar86 - lVar52 >> 3)
                                          ; uVar54 = uVar54 + 1) {
                                        for (uVar67 = 0;
                                            (ulong)uVar67 < (ulong)(lVar86 - lVar52 >> 3);
                                            uVar67 = uVar67 + 1) {
                                          uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar54 * 8);
                                          min.x = -(short)uVar8;
                                          min.y = -(short)((ulong)uVar8 >> 0x10);
                                          rand_2._state._4_2_ = -(short)((ulong)uVar8 >> 0x20);
                                          rand_2._state._6_2_ = -(short)((ulong)uVar8 >> 0x30);
                                          uVar8 = *(undefined8 *)(lVar52 + (ulong)uVar67 * 8);
                                          sStack_170 = (short)uVar8;
                                          sStack_16e = (short)((ulong)uVar8 >> 0x10);
                                          max.x = -sStack_170;
                                          max.y = -sStack_16e;
                                          rand_2._state._0_2_ = min.x;
                                          rand_2._state._2_2_ = min.y;
                                          if (uVar54 == uVar67) {
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                     operator==((Box<Imath_3_2::Vec4<short>_> *)&min
                                                                ,(Box<Imath_3_2::Vec4<short>_> *)
                                                                 &max);
                                            if (!bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                              ;
                                              goto LAB_00113e80;
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                     operator!=((Box<Imath_3_2::Vec4<short>_> *)&min
                                                                ,(Box<Imath_3_2::Vec4<short>_> *)
                                                                 &max);
                                            if (bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                              ;
                                              goto LAB_00113e61;
                                            }
                                          }
                                          else {
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                     operator!=((Box<Imath_3_2::Vec4<short>_> *)&min
                                                                ,(Box<Imath_3_2::Vec4<short>_> *)
                                                                 &max);
                                            if (!bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                              ;
                                              goto LAB_00113e9f;
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                     operator==((Box<Imath_3_2::Vec4<short>_> *)&min
                                                                ,(Box<Imath_3_2::Vec4<short>_> *)
                                                                 &max);
                                            if (bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                              ;
                                              goto LAB_00113ebe;
                                            }
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                   operator==((Box<Imath_3_2::Vec4<short>_> *)&min,
                                                              (Box<Imath_3_2::Vec4<short>_> *)
                                                              &rand_2);
                                          if (!bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                            ;
                                            goto LAB_00113696;
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<short>_>::
                                                   operator!=((Box<Imath_3_2::Vec4<short>_> *)&min,
                                                              (Box<Imath_3_2::Vec4<short>_> *)
                                                              &rand_2);
                                          if (bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<short>]"
                                            ;
                                            goto LAB_00113677;
                                          }
                                          lVar52 = CONCAT17(p.y._3_1_,
                                                            CONCAT16(p.y._2_1_,
                                                                     CONCAT15(p.y._1_1_,
                                                                              CONCAT14(p.y._0_1_,
                                                                                       CONCAT13(p.x.
                                                  _3_1_,CONCAT12(p.x._2_1_,
                                                                 CONCAT11(p.x._1_1_,p.x._0_1_)))))))
                                          ;
                                          lVar86 = CONCAT17(acStack_1ac[3],
                                                            CONCAT16(acStack_1ac[2],
                                                                     CONCAT15(acStack_1ac[1],
                                                                              CONCAT14(acStack_1ac
                                                                                       [0],CONCAT13(
                                                  p.z._3_1_,
                                                  CONCAT12(p.z._2_1_,CONCAT11(p.z._1_1_,p.z._0_1_)))
                                                  ))));
                                        }
                                      }
                                      std::
                                      _Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                      ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<short>,_std::allocator<Imath_3_2::Vec4<short>_>_>
                                                  *)&p);
                                      poVar51 = std::operator<<((ostream *)&std::cout,
                                                                "    comparators for type ");
                                      poVar51 = std::operator<<(poVar51,"V4i");
                                      std::endl<char,std::char_traits<char>>(poVar51);
                                      p.x._0_1_ = 0xff;
                                      p.x._1_1_ = 0xff;
                                      p.x._2_1_ = 0xff;
                                      p.x._3_1_ = 0x7f;
                                      p.y._0_1_ = 0xff;
                                      p.y._1_1_ = 0xff;
                                      p.y._2_1_ = 0xff;
                                      p.y._3_1_ = 0x7f;
                                      p.z._0_1_ = 0xff;
                                      p.z._1_1_ = 0xff;
                                      p.z._2_1_ = 0xff;
                                      p.z._3_1_ = 0x7f;
                                      acStack_1ac[0] = -1;
                                      acStack_1ac[1] = 0xff;
                                      acStack_1ac[2] = 0xff;
                                      acStack_1ac[3] = 0x7f;
                                      local_1a8._0_4_ = -0.0;
                                      local_1a8._4_4_ = -0.0;
                                      uStack_1a0._0_4_ = -0.0;
                                      uStack_1a0._4_4_ = -0.0;
                                      min.x = -1;
                                      min.y = 0x7fff;
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::operator==
                                                         ((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                          (Box<Imath_3_2::Vec4<int>_> *)&min);
                                      if (!bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                        ;
                                        goto LAB_00114902;
                                      }
                                      bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::operator!=
                                                         ((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                          (Box<Imath_3_2::Vec4<int>_> *)&min);
                                      if (bVar49) {
                                        pcVar58 = 
                                        "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                        ;
                                      }
                                      else {
                                        max.x = 0;
                                        max.y = 0;
                                        (anonymous_namespace)::permutations<Imath_3_2::Vec4<int>>
                                                  ((
                                                  vector<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                                  *)&max);
                                        uVar55 = (ulong)CONCAT22(max.y,max.x);
                                        auVar93 = _DAT_00153290;
                                        for (uVar54 = 0; (ulong)uVar54 < (ulong)((long)-uVar55 >> 4)
                                            ; uVar54 = uVar54 + 1) {
                                          for (uVar67 = 0;
                                              (ulong)uVar67 < (ulong)((long)-uVar55 >> 4);
                                              uVar67 = uVar67 + 1) {
                                            min = (Vec2<short>)
                                                  -*(int *)(uVar55 + (ulong)uVar54 * 0x10);
                                            p.x._0_1_ = DAT_001532a0;
                                            p.x._1_1_ = DAT_001532a0._1_1_;
                                            p.x._2_1_ = DAT_001532a0._2_1_;
                                            p.x._3_1_ = DAT_001532a0._3_1_;
                                            p.y._0_1_ = DAT_001532a0._4_1_;
                                            p.y._1_1_ = DAT_001532a0._5_1_;
                                            p.y._2_1_ = DAT_001532a0._6_1_;
                                            p.y._3_1_ = DAT_001532a0._7_1_;
                                            p.z._0_1_ = DAT_001532a0._8_1_;
                                            p.z._1_1_ = DAT_001532a0._9_1_;
                                            p.z._2_1_ = DAT_001532a0._10_1_;
                                            p.z._3_1_ = DAT_001532a0._11_1_;
                                            acStack_1ac[0] = DAT_001532a0._12_1_;
                                            acStack_1ac[1] = DAT_001532a0._13_1_;
                                            acStack_1ac[2] = DAT_001532a0._14_1_;
                                            acStack_1ac[3] = DAT_001532a0._15_1_;
                                            local_1a8._0_4_ = auVar93._0_4_;
                                            local_1a8._4_4_ = auVar93._4_4_;
                                            uStack_1a0._0_4_ = auVar93._8_4_;
                                            uStack_1a0._4_4_ = auVar93._12_4_;
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                     operator==((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<int>_> *)&min);
                                            if (bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                              ;
                                              goto LAB_00113a36;
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                     operator!=((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<int>_> *)&min);
                                            if (!bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                              ;
                                              goto LAB_00113a55;
                                            }
                                            uVar55 = (ulong)CONCAT22(max.y,max.x);
                                            auVar93 = _DAT_00153290;
                                          }
                                        }
                                        std::
                                        _Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                        ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                                  *)&max);
                                        rand_2._state._0_2_ = 0;
                                        rand_2._state._2_2_ = 0;
                                        rand_2._state._4_2_ = 0;
                                        rand_2._state._6_2_ = 0;
                                        (anonymous_namespace)::permutations<Imath_3_2::Vec4<int>>
                                                  ((
                                                  vector<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                                  *)&rand_2);
                                        lVar52 = CONCAT26(rand_2._state._6_2_,
                                                          CONCAT24(rand_2._state._4_2_,
                                                                   CONCAT22(rand_2._state._2_2_,
                                                                            (short)rand_2._state)));
                                        for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 4);
                                            uVar54 = uVar54 + 1) {
                                          lVar86 = (ulong)uVar54 * 0x10;
                                          for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 4);
                                              uVar67 = uVar67 + 1) {
                                            pfVar4 = (float *)(lVar52 + (ulong)uVar67 * 0x10);
                                            local_1a8._0_4_ = *pfVar4;
                                            local_1a8._4_4_ = pfVar4[1];
                                            uStack_1a0._0_4_ = pfVar4[2];
                                            uStack_1a0._4_4_ = pfVar4[3];
                                            min = (Vec2<short>)-(int)(float)local_1a8;
                                            max = (Vec2<short>)-*(int *)(lVar52 + lVar86);
                                            iVar50 = -*(int *)(lVar52 + 4 + lVar86);
                                            iVar83 = -*(int *)(lVar52 + 8 + lVar86);
                                            iVar88 = -*(int *)(lVar52 + 0xc + lVar86);
                                            p.x._0_1_ = (char)max.x;
                                            p.x._1_1_ = max.x._1_1_;
                                            p.x._2_1_ = (char)max.y;
                                            p.x._3_1_ = max.y._1_1_;
                                            p.y._0_1_ = (char)iVar50;
                                            p.y._1_1_ = (char)((uint)iVar50 >> 8);
                                            p.y._2_1_ = (char)((uint)iVar50 >> 0x10);
                                            p.y._3_1_ = (char)((uint)iVar50 >> 0x18);
                                            p.z._0_1_ = (char)iVar83;
                                            p.z._1_1_ = (char)((uint)iVar83 >> 8);
                                            p.z._2_1_ = (char)((uint)iVar83 >> 0x10);
                                            p.z._3_1_ = (char)((uint)iVar83 >> 0x18);
                                            acStack_1ac[0] = (char)iVar88;
                                            acStack_1ac[1] = (char)((uint)iVar88 >> 8);
                                            acStack_1ac[2] = (char)((uint)iVar88 >> 0x10);
                                            acStack_1ac[3] = (char)((uint)iVar88 >> 0x18);
                                            if (uVar54 == uVar67) {
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                       operator==((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<int>_> *)&min
                                                                 );
                                              if (!bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                                ;
                                                goto LAB_00113e80;
                                              }
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                       operator!=((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<int>_> *)&min
                                                                 );
                                              if (bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                                ;
                                                goto LAB_00113e61;
                                              }
                                            }
                                            else {
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                       operator!=((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<int>_> *)&min
                                                                 );
                                              if (!bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                                ;
                                                goto LAB_00113e9f;
                                              }
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                       operator==((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<int>_> *)&min
                                                                 );
                                              if (bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                                ;
                                                goto LAB_00113ebe;
                                              }
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                     operator==((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<int>_> *)&max);
                                            if (!bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                              ;
                                              goto LAB_00113696;
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<int>_>::
                                                     operator!=((Box<Imath_3_2::Vec4<int>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<int>_> *)&max);
                                            if (bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<int>]"
                                              ;
                                              goto LAB_00113677;
                                            }
                                            lVar52 = CONCAT26(rand_2._state._6_2_,
                                                              CONCAT24(rand_2._state._4_2_,
                                                                       CONCAT22(rand_2._state._2_2_,
                                                                                (short)rand_2._state
                                                                               )));
                                          }
                                        }
                                        std::
                                        _Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                        ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<int>,_std::allocator<Imath_3_2::Vec4<int>_>_>
                                                  *)&rand_2);
                                        poVar51 = std::operator<<((ostream *)&std::cout,
                                                                  "    comparators for type ");
                                        poVar51 = std::operator<<(poVar51,"V4i64");
                                        std::endl<char,std::char_traits<char>>(poVar51);
                                        p.x._0_1_ = 0xff;
                                        p.x._1_1_ = 0xff;
                                        p.x._2_1_ = 0xff;
                                        p.x._3_1_ = 0xff;
                                        p.y._0_1_ = 0xff;
                                        p.y._1_1_ = 0xff;
                                        p.y._2_1_ = 0xff;
                                        p.y._3_1_ = 0x7f;
                                        p.z._0_1_ = 0xff;
                                        p.z._1_1_ = 0xff;
                                        p.z._2_1_ = 0xff;
                                        p.z._3_1_ = 0xff;
                                        acStack_1ac[0] = -1;
                                        acStack_1ac[1] = 0xff;
                                        acStack_1ac[2] = 0xff;
                                        acStack_1ac[3] = 0x7f;
                                        local_1a8._0_4_ = -NAN;
                                        local_1a8._4_4_ = NAN;
                                        uStack_1a0._0_4_ = -NAN;
                                        uStack_1a0._4_4_ = NAN;
                                        local_198[0] = 0.0;
                                        local_198[1] = -0.0;
                                        stack0xfffffffffffffe80 = -0.0;
                                        local_188._0_8_ = 0x8000000000000000;
                                        min.x = -1;
                                        min.y = -1;
                                        local_198[2] = local_198[0];
                                        local_198[3] = local_198[1];
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::operator==
                                                           ((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                            (Box<Imath_3_2::Vec4<long>_> *)&min);
                                        if (!bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                          ;
                                          goto LAB_00114902;
                                        }
                                        bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::operator!=
                                                           ((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                            (Box<Imath_3_2::Vec4<long>_> *)&min);
                                        if (bVar49) {
                                          pcVar58 = 
                                          "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                          ;
                                        }
                                        else {
                                          max.x = 0;
                                          max.y = 0;
                                          (anonymous_namespace)::permutations<Imath_3_2::Vec4<long>>
                                                    ((
                                                  vector<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                                  *)&max);
                                          uVar55 = (ulong)CONCAT22(max.y,max.x);
                                          for (uVar54 = 0;
                                              (ulong)uVar54 < (ulong)((long)-uVar55 >> 5);
                                              uVar54 = uVar54 + 1) {
                                            for (uVar67 = 0;
                                                (ulong)uVar67 < (ulong)((long)-uVar55 >> 5);
                                                uVar67 = uVar67 + 1) {
                                              lVar52 = -*(long *)(uVar55 + (ulong)uVar54 * 0x20);
                                              p.x._0_1_ = 0xff;
                                              p.x._1_1_ = 0xff;
                                              p.x._2_1_ = 0xff;
                                              p.x._3_1_ = 0xff;
                                              p.y._0_1_ = 0xff;
                                              p.y._1_1_ = 0xff;
                                              p.y._2_1_ = 0xff;
                                              p.y._3_1_ = 0x7f;
                                              p.z._0_1_ = 0xff;
                                              p.z._1_1_ = 0xff;
                                              p.z._2_1_ = 0xff;
                                              p.z._3_1_ = 0xff;
                                              acStack_1ac[0] = -1;
                                              acStack_1ac[1] = 0xff;
                                              acStack_1ac[2] = 0xff;
                                              acStack_1ac[3] = 0x7f;
                                              local_1a8._0_4_ = -NAN;
                                              local_1a8._4_4_ = NAN;
                                              uStack_1a0._0_4_ = -NAN;
                                              uStack_1a0._4_4_ = NAN;
                                              stack0xfffffffffffffe80 = -0.0;
                                              local_188._0_8_ = 0x8000000000000000;
                                              min.x = (short)lVar52;
                                              min.y = (short)((ulong)lVar52 >> 0x10);
                                              local_198[0] = fVar118;
                                              local_198[1] = fVar61;
                                              local_198[2] = fVar118;
                                              local_198[3] = fVar61;
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                       operator==((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<long>_> *)
                                                                  &min);
                                              if (bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                ;
                                                goto LAB_00113a36;
                                              }
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                       operator!=((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<long>_> *)
                                                                  &min);
                                              if (!bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                ;
                                                goto LAB_00113a55;
                                              }
                                              uVar55 = (ulong)CONCAT22(max.y,max.x);
                                            }
                                          }
                                          std::
                                          _Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                          ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                                  *)&max);
                                          rand_2._state._0_2_ = 0;
                                          rand_2._state._2_2_ = 0;
                                          rand_2._state._4_2_ = 0;
                                          rand_2._state._6_2_ = 0;
                                          (anonymous_namespace)::permutations<Imath_3_2::Vec4<long>>
                                                    ((
                                                  vector<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                                  *)&rand_2);
                                          lVar52 = CONCAT26(rand_2._state._6_2_,
                                                            CONCAT24(rand_2._state._4_2_,
                                                                     CONCAT22(rand_2._state._2_2_,
                                                                              (short)rand_2._state))
                                                           );
                                          for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 5);
                                              uVar54 = uVar54 + 1) {
                                            lVar86 = (ulong)uVar54 * 0x20;
                                            for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 5);
                                                uVar67 = uVar67 + 1) {
                                              lVar64 = (ulong)uVar67 * 0x20;
                                              lVar76 = *(long *)(lVar52 + lVar64);
                                              uVar8 = *(undefined8 *)(lVar52 + 8 + lVar64);
                                              min.x = (short)-lVar76;
                                              min.y = (short)((ulong)-lVar76 >> 0x10);
                                              lVar80 = -*(long *)(lVar52 + lVar86);
                                              p.x._0_1_ = (char)lVar80;
                                              p.x._1_1_ = (char)((ulong)lVar80 >> 8);
                                              p.x._2_1_ = (char)((ulong)lVar80 >> 0x10);
                                              p.x._3_1_ = (char)((ulong)lVar80 >> 0x18);
                                              p.y._0_1_ = (char)((ulong)lVar80 >> 0x20);
                                              p.y._1_1_ = (char)((ulong)lVar80 >> 0x28);
                                              p.y._2_1_ = (char)((ulong)lVar80 >> 0x30);
                                              p.y._3_1_ = (char)((ulong)lVar80 >> 0x38);
                                              max.x = (short)lVar80;
                                              max.y = (short)((ulong)lVar80 >> 0x10);
                                              lVar80 = -*(long *)(lVar52 + 8 + lVar86);
                                              p.z._0_1_ = (char)lVar80;
                                              p.z._1_1_ = (char)((ulong)lVar80 >> 8);
                                              p.z._2_1_ = (char)((ulong)lVar80 >> 0x10);
                                              p.z._3_1_ = (char)((ulong)lVar80 >> 0x18);
                                              acStack_1ac[0] = (char)((ulong)lVar80 >> 0x20);
                                              acStack_1ac[1] = (char)((ulong)lVar80 >> 0x28);
                                              acStack_1ac[2] = (char)((ulong)lVar80 >> 0x30);
                                              acStack_1ac[3] = (char)((ulong)lVar80 >> 0x38);
                                              local_1a8 = (double)-*(long *)(lVar52 + 0x10 + lVar86)
                                              ;
                                              uStack_1a0 = (double)-*(long *)(lVar52 + 0x18 + lVar86
                                                                             );
                                              local_198[0] = (float)lVar76;
                                              local_198[1] = (float)((ulong)lVar76 >> 0x20);
                                              local_198[2] = (float)uVar8;
                                              local_198[3] = (float)((ulong)uVar8 >> 0x20);
                                              stack0xfffffffffffffe80 =
                                                   (double)*(undefined8 *)(lVar52 + 0x18 + lVar64);
                                              local_188._0_8_ =
                                                   *(undefined8 *)(lVar52 + 0x10 + lVar64);
                                              if (uVar54 == uVar67) {
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                         operator==((Box<Imath_3_2::Vec4<long>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<long>_>
                                                                        *)&min);
                                                if (!bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                  ;
                                                  goto LAB_00113e80;
                                                }
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                         operator!=((Box<Imath_3_2::Vec4<long>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<long>_>
                                                                        *)&min);
                                                if (bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                  ;
                                                  goto LAB_00113e61;
                                                }
                                              }
                                              else {
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                         operator!=((Box<Imath_3_2::Vec4<long>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<long>_>
                                                                        *)&min);
                                                if (!bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                  ;
                                                  goto LAB_00113e9f;
                                                }
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                         operator==((Box<Imath_3_2::Vec4<long>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<long>_>
                                                                        *)&min);
                                                if (bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                  ;
                                                  goto LAB_00113ebe;
                                                }
                                              }
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                       operator==((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<long>_> *)
                                                                  &max);
                                              if (!bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                ;
                                                goto LAB_00113696;
                                              }
                                              bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<long>_>::
                                                       operator!=((Box<Imath_3_2::Vec4<long>_> *)&p,
                                                                  (Box<Imath_3_2::Vec4<long>_> *)
                                                                  &max);
                                              if (bVar49) {
                                                pcVar58 = 
                                                "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<long>]"
                                                ;
                                                goto LAB_00113677;
                                              }
                                              lVar52 = CONCAT26(rand_2._state._6_2_,
                                                                CONCAT24(rand_2._state._4_2_,
                                                                         CONCAT22(rand_2._state.
                                                                                  _2_2_,(short)
                                                  rand_2._state)));
                                            }
                                          }
                                          std::
                                          _Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                          ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<long>,_std::allocator<Imath_3_2::Vec4<long>_>_>
                                                  *)&rand_2);
                                          poVar51 = std::operator<<((ostream *)&std::cout,
                                                                    "    comparators for type ");
                                          poVar51 = std::operator<<(poVar51,"V4f");
                                          std::endl<char,std::char_traits<char>>(poVar51);
                                          p.x._0_1_ = 0xff;
                                          p.x._1_1_ = 0xff;
                                          p.x._2_1_ = 0x7f;
                                          p.x._3_1_ = 0x7f;
                                          p.y._0_1_ = 0xff;
                                          p.y._1_1_ = 0xff;
                                          p.y._2_1_ = 0x7f;
                                          p.y._3_1_ = 0x7f;
                                          p.z._0_1_ = 0xff;
                                          p.z._1_1_ = 0xff;
                                          p.z._2_1_ = 0x7f;
                                          p.z._3_1_ = 0x7f;
                                          acStack_1ac[0] = -1;
                                          acStack_1ac[1] = 0xff;
                                          acStack_1ac[2] = 0x7f;
                                          acStack_1ac[3] = 0x7f;
                                          local_1a8._0_4_ = -3.4028235e+38;
                                          local_1a8._4_4_ = -3.4028235e+38;
                                          uStack_1a0._0_4_ = -3.4028235e+38;
                                          uStack_1a0._4_4_ = -3.4028235e+38;
                                          min.x = -1;
                                          min.y = 0x7f7f;
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                   operator==((Box<Imath_3_2::Vec4<float>_> *)&p,
                                                              (Box<Imath_3_2::Vec4<float>_> *)&min);
                                          if (!bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                            ;
                                            goto LAB_00114902;
                                          }
                                          bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                   operator!=((Box<Imath_3_2::Vec4<float>_> *)&p,
                                                              (Box<Imath_3_2::Vec4<float>_> *)&min);
                                          if (bVar49) {
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                            ;
                                          }
                                          else {
                                            max.x = 0;
                                            max.y = 0;
                                            (anonymous_namespace)::
                                            permutations<Imath_3_2::Vec4<float>>
                                                      ((
                                                  vector<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                                  *)&max);
                                            uVar55 = (ulong)CONCAT22(max.y,max.x);
                                            for (uVar54 = 0;
                                                (ulong)uVar54 < (ulong)((long)-uVar55 >> 4);
                                                uVar54 = uVar54 + 1) {
                                              for (uVar67 = 0;
                                                  (ulong)uVar67 < (ulong)((long)-uVar55 >> 4);
                                                  uVar67 = uVar67 + 1) {
                                                uVar8 = *(undefined8 *)
                                                         (uVar55 + (ulong)uVar54 * 0x10);
                                                min.y = (ushort)((ulong)uVar8 >> 0x10) ^ 0x8000;
                                                p.x._0_1_ = 0xff;
                                                p.x._1_1_ = 0xff;
                                                p.x._2_1_ = 0x7f;
                                                p.x._3_1_ = 0x7f;
                                                p.y._0_1_ = 0xff;
                                                p.y._1_1_ = 0xff;
                                                p.y._2_1_ = 0x7f;
                                                p.y._3_1_ = 0x7f;
                                                p.z._0_1_ = 0xff;
                                                p.z._1_1_ = 0xff;
                                                p.z._2_1_ = 0x7f;
                                                p.z._3_1_ = 0x7f;
                                                acStack_1ac[0] = -1;
                                                acStack_1ac[1] = 0xff;
                                                acStack_1ac[2] = 0x7f;
                                                acStack_1ac[3] = 0x7f;
                                                local_1a8._0_4_ = (float)DAT_001532b0;
                                                local_1a8._4_4_ = DAT_001532b0._4_4_;
                                                uStack_1a0._0_4_ = DAT_001532b0._8_4_;
                                                uStack_1a0._4_4_ = DAT_001532b0._12_4_;
                                                min.x = (short)uVar8;
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                         operator==((Box<Imath_3_2::Vec4<float>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<float>_>
                                                                        *)&min);
                                                if (bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113a36;
                                                }
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                         operator!=((Box<Imath_3_2::Vec4<float>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<float>_>
                                                                        *)&min);
                                                if (!bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113a55;
                                                }
                                                uVar55 = (ulong)CONCAT22(max.y,max.x);
                                              }
                                            }
                                            std::
                                            _Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                            ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                                  *)&max);
                                            rand_2._state._0_2_ = 0;
                                            rand_2._state._2_2_ = 0;
                                            rand_2._state._4_2_ = 0;
                                            rand_2._state._6_2_ = 0;
                                            (anonymous_namespace)::
                                            permutations<Imath_3_2::Vec4<float>>
                                                      ((
                                                  vector<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                                  *)&rand_2);
                                            lVar52 = CONCAT26(rand_2._state._6_2_,
                                                              CONCAT24(rand_2._state._4_2_,
                                                                       CONCAT22(rand_2._state._2_2_,
                                                                                (short)rand_2._state
                                                                               )));
                                            auVar93 = _DAT_00153290;
                                            for (uVar54 = 0; (ulong)uVar54 < (ulong)(-lVar52 >> 4);
                                                uVar54 = uVar54 + 1) {
                                              for (uVar67 = 0; (ulong)uVar67 < (ulong)(-lVar52 >> 4)
                                                  ; uVar67 = uVar67 + 1) {
                                                puVar69 = (ulong *)(lVar52 + (ulong)uVar54 * 0x10);
                                                puVar5 = (ulong *)(lVar52 + (ulong)uVar67 * 0x10);
                                                uVar55 = *puVar5;
                                                uStack_1a0 = (double)puVar5[1];
                                                uVar73 = uVar55 ^ auVar93._0_8_;
                                                min.x = (short)uVar73;
                                                min.y = (short)(uVar73 >> 0x10);
                                                uVar73 = *puVar69 ^ auVar93._0_8_;
                                                uVar75 = puVar69[1] ^ auVar93._8_8_;
                                                p.x._0_1_ = (char)uVar73;
                                                p.x._1_1_ = (char)(uVar73 >> 8);
                                                p.x._2_1_ = (char)(uVar73 >> 0x10);
                                                p.x._3_1_ = (char)(uVar73 >> 0x18);
                                                p.y._0_1_ = (char)(uVar73 >> 0x20);
                                                p.y._1_1_ = (char)(uVar73 >> 0x28);
                                                p.y._2_1_ = (char)(uVar73 >> 0x30);
                                                p.y._3_1_ = (char)(uVar73 >> 0x38);
                                                p.z._0_1_ = (char)uVar75;
                                                p.z._1_1_ = (char)(uVar75 >> 8);
                                                p.z._2_1_ = (char)(uVar75 >> 0x10);
                                                p.z._3_1_ = (char)(uVar75 >> 0x18);
                                                acStack_1ac[0] = (char)(uVar75 >> 0x20);
                                                acStack_1ac[1] = (char)(uVar75 >> 0x28);
                                                acStack_1ac[2] = (char)(uVar75 >> 0x30);
                                                acStack_1ac[3] = (char)(uVar75 >> 0x38);
                                                local_1a8._0_4_ = (float)uVar55;
                                                local_1a8._4_4_ = (float)(uVar55 >> 0x20);
                                                max.x = (short)uVar73;
                                                max.y = (short)(uVar73 >> 0x10);
                                                if (uVar54 == uVar67) {
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                           operator==((Box<Imath_3_2::Vec4<float>_>
                                                                       *)&p,(
                                                  Box<Imath_3_2::Vec4<float>_> *)&min);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113e80;
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                           operator!=((Box<Imath_3_2::Vec4<float>_>
                                                                       *)&p,(
                                                  Box<Imath_3_2::Vec4<float>_> *)&min);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113e61;
                                                  }
                                                }
                                                else {
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                           operator!=((Box<Imath_3_2::Vec4<float>_>
                                                                       *)&p,(
                                                  Box<Imath_3_2::Vec4<float>_> *)&min);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113e9f;
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                           operator==((Box<Imath_3_2::Vec4<float>_>
                                                                       *)&p,(
                                                  Box<Imath_3_2::Vec4<float>_> *)&min);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113ebe;
                                                  }
                                                }
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                         operator==((Box<Imath_3_2::Vec4<float>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<float>_>
                                                                        *)&max);
                                                if (!bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113696;
                                                }
                                                bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<float>_>::
                                                         operator!=((Box<Imath_3_2::Vec4<float>_> *)
                                                                    &p,(Box<Imath_3_2::Vec4<float>_>
                                                                        *)&max);
                                                if (bVar49) {
                                                  pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<float>]"
                                                  ;
                                                  goto LAB_00113677;
                                                }
                                                lVar52 = CONCAT26(rand_2._state._6_2_,
                                                                  CONCAT24(rand_2._state._4_2_,
                                                                           CONCAT22(rand_2._state.
                                                                                    _2_2_,(short)
                                                  rand_2._state)));
                                                auVar93 = _DAT_00153290;
                                              }
                                            }
                                            std::
                                            _Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                            ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<float>,_std::allocator<Imath_3_2::Vec4<float>_>_>
                                                  *)&rand_2);
                                            poVar51 = std::operator<<((ostream *)&std::cout,
                                                                      "    comparators for type ");
                                            poVar51 = std::operator<<(poVar51,"V4d");
                                            std::endl<char,std::char_traits<char>>(poVar51);
                                            p.x._0_1_ = 0xff;
                                            p.x._1_1_ = 0xff;
                                            p.x._2_1_ = 0xff;
                                            p.x._3_1_ = 0xff;
                                            p.y._0_1_ = 0xff;
                                            p.y._1_1_ = 0xff;
                                            p.y._2_1_ = 0xef;
                                            p.y._3_1_ = 0x7f;
                                            p.z._0_1_ = 0xff;
                                            p.z._1_1_ = 0xff;
                                            p.z._2_1_ = 0xff;
                                            p.z._3_1_ = 0xff;
                                            acStack_1ac[0] = -1;
                                            acStack_1ac[1] = 0xff;
                                            acStack_1ac[2] = 0xef;
                                            acStack_1ac[3] = 0x7f;
                                            local_1a8._0_4_ = -NAN;
                                            local_1a8._4_4_ = NAN;
                                            uStack_1a0._0_4_ = -NAN;
                                            uStack_1a0._4_4_ = NAN;
                                            local_198[0] = -NAN;
                                            local_198[1] = -NAN;
                                            local_198[2] = -NAN;
                                            local_198[3] = -NAN;
                                            local_188._8_4_ = 0xffffffff;
                                            local_188._0_8_ = 0xffefffffffffffff;
                                            uStack_17c = 0xffefffff;
                                            min.x = -1;
                                            min.y = -1;
                                            sStack_174 = -1;
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::
                                                     operator==((Box<Imath_3_2::Vec4<double>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<double>_> *)
                                                                &min);
                                            if (!bVar49) {
                                              pcVar58 = 
                                              "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                              ;
                                              goto LAB_00114902;
                                            }
                                            bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>::
                                                     operator!=((Box<Imath_3_2::Vec4<double>_> *)&p,
                                                                (Box<Imath_3_2::Vec4<double>_> *)
                                                                &min);
                                            if (!bVar49) {
                                              max.x = 0;
                                              max.y = 0;
                                              (anonymous_namespace)::
                                              permutations<Imath_3_2::Vec4<double>>
                                                        ((
                                                  vector<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  *)&max);
                                              uVar55 = (ulong)CONCAT22(max.y,max.x);
                                              uVar54 = 0;
                                              do {
                                                if ((ulong)((long)-uVar55 >> 5) <= (ulong)uVar54) {
                                                  std::
                                                  _Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  *)&max);
                                                  rand_2._state._0_2_ = 0;
                                                  rand_2._state._2_2_ = 0;
                                                  rand_2._state._4_2_ = 0;
                                                  rand_2._state._6_2_ = 0;
                                                  (anonymous_namespace)::
                                                  permutations<Imath_3_2::Vec4<double>>
                                                            ((
                                                  vector<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  *)&rand_2);
                                                  lVar52 = CONCAT26(rand_2._state._6_2_,
                                                                    CONCAT24(rand_2._state._4_2_,
                                                                             CONCAT22(rand_2._state.
                                                                                      _2_2_,(short)
                                                  rand_2._state)));
                                                  uVar54 = 0;
                                                  do {
                                                    if ((ulong)(-lVar52 >> 5) <= (ulong)uVar54) {
                                                      std::
                                                  _Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  ::~_Vector_base((
                                                  _Vector_base<Imath_3_2::Vec4<double>,_std::allocator<Imath_3_2::Vec4<double>_>_>
                                                  *)&rand_2);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V2s");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V2i");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V2i64");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V2f");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V2d");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  poVar51 = std::operator<<((ostream *)&std::cout,
                                                                            "    size() for type ");
                                                  poVar51 = std::operator<<(poVar51,"V3s");
                                                  std::endl<char,std::char_traits<char>>(poVar51);
                                                  p.x._0_1_ = 0xff;
                                                  p.x._1_1_ = 0x7f;
                                                  p.x._2_1_ = 0xff;
                                                  p.x._3_1_ = 0x7f;
                                                  p.y._0_1_ = 0xff;
                                                  p.y._1_1_ = 0x7f;
                                                  p.y._2_1_ = 0;
                                                  p.y._3_1_ = 0x80;
                                                  p.z._0_1_ = 0;
                                                  p.z._1_1_ = 0x80;
                                                  p.z._2_1_ = 0;
                                                  p.z._3_1_ = 0x80;
                                                  Imath_3_2::Box<Imath_3_2::Vec3<short>_>::size
                                                            ((Box<Imath_3_2::Vec3<short>_> *)&min);
                                                  if (((min.x == 0) && (min.y == 0)) &&
                                                     (sStack_174 == 0)) {
                                                    p.x._0_1_ = 0xff;
                                                    p.x._1_1_ = 0xff;
                                                    p.x._2_1_ = 0xff;
                                                    p.x._3_1_ = 0xff;
                                                    p.y._0_1_ = 0xff;
                                                    p.y._1_1_ = 0xff;
                                                    p.y._2_1_ = 1;
                                                    p.y._3_1_ = 0;
                                                    p.z._0_1_ = 1;
                                                    p.z._1_1_ = 0;
                                                    p.z._2_1_ = 1;
                                                    p.z._3_1_ = 0;
                                                    Imath_3_2::Box<Imath_3_2::Vec3<short>_>::size
                                                              ((Box<Imath_3_2::Vec3<short>_> *)&min)
                                                    ;
                                                    __assert_fail("b0.size () == T (2)",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x27a,
                                                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<short>]"
                                                  );
                                                  }
                                                  __assert_fail("b.size () == T (0)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x268,
                                                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec3<short>]"
                                                  );
                                                  }
                                                  lVar86 = (ulong)uVar54 * 0x20;
                                                  for (uVar67 = 0;
                                                      (ulong)uVar67 < (ulong)(-lVar52 >> 5);
                                                      uVar67 = uVar67 + 1) {
                                                    lVar76 = (ulong)uVar67 * 0x20;
                                                    auVar93 = *(undefined1 (*) [16])
                                                               (lVar52 + lVar76);
                                                    _local_188 = *(undefined1 (*) [16])
                                                                  (lVar52 + 0x10 + lVar76);
                                                    auVar169 = auVar93 ^ _DAT_001533a0;
                                                    min.x = auVar169._0_2_;
                                                    min.y = auVar169._2_2_;
                                                    sStack_174 = auVar169._4_2_;
                                                    auVar169 = *(undefined1 (*) [16])
                                                                (lVar52 + lVar86) ^ _DAT_001533a0;
                                                    auVar96 = *(undefined1 (*) [16])
                                                               (lVar52 + 0x10 + lVar86) ^
                                                              _DAT_001533a0;
                                                    p.x._0_1_ = auVar169[0];
                                                    p.x._1_1_ = auVar169[1];
                                                    p.x._2_1_ = auVar169[2];
                                                    p.x._3_1_ = auVar169[3];
                                                    p.y._0_1_ = auVar169[4];
                                                    p.y._1_1_ = auVar169[5];
                                                    p.y._2_1_ = auVar169[6];
                                                    p.y._3_1_ = auVar169[7];
                                                    p.z._0_1_ = auVar169[8];
                                                    p.z._1_1_ = auVar169[9];
                                                    p.z._2_1_ = auVar169[10];
                                                    p.z._3_1_ = auVar169[0xb];
                                                    acStack_1ac[0] = auVar169[0xc];
                                                    acStack_1ac[1] = auVar169[0xd];
                                                    acStack_1ac[2] = auVar169[0xe];
                                                    acStack_1ac[3] = auVar169[0xf];
                                                    local_1a8._0_4_ = auVar96._0_4_;
                                                    local_1a8._4_4_ = auVar96._4_4_;
                                                    uStack_1a0._0_4_ = auVar96._8_4_;
                                                    uStack_1a0._4_4_ = auVar96._12_4_;
                                                    local_198[0] = auVar93._0_4_;
                                                    local_198[1] = auVar93._4_4_;
                                                    local_198[2] = auVar93._8_4_;
                                                    local_198[3] = auVar93._12_4_;
                                                    max.x = auVar169._0_2_;
                                                    max.y = auVar169._2_2_;
                                                    if (uVar54 == uVar67) {
                                                      bVar49 = Imath_3_2::
                                                               Box<Imath_3_2::Vec4<double>_>::
                                                               operator==((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113e80:
                                                  __assert_fail("b0 == b1",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1aa,pcVar58);
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator!=((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113e61:
                                                  __assert_fail("!(b0 != b1)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1ab,pcVar58);
                                                  }
                                                  }
                                                  else {
                                                    bVar49 = Imath_3_2::
                                                             Box<Imath_3_2::Vec4<double>_>::
                                                             operator!=((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113e9f:
                                                  __assert_fail("b0 != b1",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1af,pcVar58);
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator==((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113ebe:
                                                  __assert_fail("!(b0 == b1)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1b0,pcVar58);
                                                  }
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator==((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&max);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113696:
                                                  __assert_fail("b0 == b2",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1b2,pcVar58);
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator!=((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&max);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
LAB_00113677:
                                                  __assert_fail("!(b0 != b2)",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                                  ,0x1b3,pcVar58);
                                                  }
                                                  lVar52 = CONCAT26(rand_2._state._6_2_,
                                                                    CONCAT24(rand_2._state._4_2_,
                                                                             CONCAT22(rand_2._state.
                                                                                      _2_2_,(short)
                                                  rand_2._state)));
                                                  }
                                                  uVar54 = uVar54 + 1;
                                                  } while( true );
                                                }
                                                for (uVar67 = 0;
                                                    (ulong)uVar67 < (ulong)((long)-uVar55 >> 5);
                                                    uVar67 = uVar67 + 1) {
                                                  puVar6 = (undefined4 *)
                                                           (uVar55 + (ulong)uVar54 * 0x20);
                                                  uVar11 = *puVar6;
                                                  p.x._0_1_ = 0xff;
                                                  p.x._1_1_ = 0xff;
                                                  p.x._2_1_ = 0xff;
                                                  p.x._3_1_ = 0xff;
                                                  p.y._0_1_ = 0xff;
                                                  p.y._1_1_ = 0xff;
                                                  p.y._2_1_ = 0xef;
                                                  p.y._3_1_ = 0x7f;
                                                  p.z._0_1_ = 0xff;
                                                  p.z._1_1_ = 0xff;
                                                  p.z._2_1_ = 0xff;
                                                  p.z._3_1_ = 0xff;
                                                  acStack_1ac[0] = -1;
                                                  acStack_1ac[1] = 0xff;
                                                  acStack_1ac[2] = 0xef;
                                                  acStack_1ac[3] = 0x7f;
                                                  local_1a8._0_4_ = -NAN;
                                                  local_1a8._4_4_ = NAN;
                                                  uStack_1a0._0_4_ = -NAN;
                                                  uStack_1a0._4_4_ = NAN;
                                                  local_198[0] = (float)DAT_00153240;
                                                  local_198[1] = DAT_00153240._4_4_;
                                                  local_198[2] = DAT_00153240._8_4_;
                                                  local_198[3] = DAT_00153240._12_4_;
                                                  _local_188 = _DAT_00153240;
                                                  min.x = (short)uVar11;
                                                  min.y = (short)((uint)uVar11 >> 0x10);
                                                  sStack_174 = (short)puVar6[1];
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator==((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
                                                  goto LAB_00113a36;
                                                  }
                                                  bVar49 = Imath_3_2::Box<Imath_3_2::Vec4<double>_>
                                                           ::operator!=((
                                                  Box<Imath_3_2::Vec4<double>_> *)&p,
                                                  (Box<Imath_3_2::Vec4<double>_> *)&min);
                                                  if (!bVar49) {
                                                    pcVar58 = 
                                                  "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                                  ;
                                                  goto LAB_00113a55;
                                                  }
                                                  uVar55 = (ulong)CONCAT22(max.y,max.x);
                                                }
                                                uVar54 = uVar54 + 1;
                                              } while( true );
                                            }
                                            pcVar58 = 
                                            "void (anonymous namespace)::testComparators(const char *) [T = Imath_3_2::Vec4<double>]"
                                            ;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          __assert_fail("!(b0 != b1)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                                        ,0x17a,pcVar58);
                        }
                        pcVar58 = 
                        "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<double>]"
                        ;
                      }
                      else {
                        pcVar58 = 
                        "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<float>]"
                        ;
                      }
                    }
                    else {
                      pcVar58 = 
                      "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<long>]"
                      ;
                    }
                  }
                  else {
                    pcVar58 = 
                    "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<int>]"
                    ;
                  }
                }
                else {
                  pcVar58 = 
                  "void (anonymous namespace)::testExtendByBox(const char *) [T = Imath_3_2::Vec4<short>]"
                  ;
                }
              }
            }
            __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                          ,300,pcVar58);
          }
          pcVar58 = 
          "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec4<double>]"
          ;
        }
        else {
          pcVar58 = 
          "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec4<float>]";
        }
      }
    }
    __assertion = "b.min == p0 && b.max == p1";
    uVar54 = 0x74;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                ,uVar54,pcVar58);
}

Assistant:

void
testBox ()
{
    cout << "Testing box methods" << endl;

    //
    // Constructors
    //
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testConstructors<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testConstructors<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testConstructors<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // makeEmpty()
    //
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMakeEmpty<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // makeInfinite()
    //
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMakeInfinite<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // extendBy() (point)
    //
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testExtendByPoint<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // extendBy() box
    //
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testExtendByBox<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // == and !==
    //
    testComparators<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testComparators<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testComparators<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testComparators<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // size()
    //
    testSize<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testSize<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testSize<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testSize<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testSize<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testSize<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testSize<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testSize<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testSize<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testSize<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testSize<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testSize<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testSize<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // center()
    //
    testCenter<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testCenter<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testCenter<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testCenter<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // isEmpty()
    //
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testIsEmpty<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // isInfinite()
    //
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testIsInfinite<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // hasVolume()
    //
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testHasVolume<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    //
    // majorAxis()
    //
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2s> ("V2s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2i> ("V2i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2i64> ("V2i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2f> ("V2f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V2d> ("V2d");

    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3s> ("V3s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3i> ("V3i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3i64> ("V3i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3f> ("V3f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V3d> ("V3d");

    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4s> ("V4s");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4i> ("V4i");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4i64> ("V4i64");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4f> ("V4f");
    testMajorAxis<IMATH_INTERNAL_NAMESPACE::V4d> ("V4d");

    cout << "ok\n" << endl;
}